

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall
Spaghetti<UFPC>::PerformLabelingMem
          (Spaghetti<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Mat1b *pMVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer piVar12;
  pointer piVar13;
  Spaghetti<UFPC> *pSVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  undefined4 uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  pointer puVar29;
  long *plVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  ulong uVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  double dVar56;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  ulong local_410;
  ulong local_400;
  long local_3f8;
  ulong local_3f0;
  pointer local_3e8;
  long *local_3e0;
  long local_3d8;
  pointer local_3d0;
  long local_3c8;
  long *local_3c0;
  long local_3b0;
  long *local_3a8;
  ulong local_3a0;
  pointer local_398;
  ulong local_390;
  long local_388;
  long local_380;
  pointer local_378;
  int local_370;
  long *local_368;
  pointer local_360;
  long local_358;
  ulong *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  undefined1 local_330 [104];
  Mat local_2c8 [16];
  pointer local_2b8;
  long *local_280;
  Spaghetti<UFPC> *local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  long local_208;
  pointer local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  ulong *local_138;
  int local_11c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar5 = *(int *)&pMVar7->field_0x8;
  uVar34 = (ulong)iVar5;
  iVar6 = *(int *)&pMVar7->field_0xc;
  lVar53 = (long)iVar6;
  local_118 = accesses;
  UFPC::MemAlloc(((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) * ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1)
                 + 1);
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_330,&local_110,0);
  piVar12 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar29 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar51 = lVar53 - 2;
  local_370 = (int)uVar51;
  local_268 = this;
  if (iVar5 != 1) {
    uVar18 = 0;
    if (2 < iVar6) {
      local_200 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      uVar22 = 0;
      do {
        lVar26 = (long)(int)uVar22;
        piVar1 = (int *)(local_170 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1e8._24_8_ + lVar26) != '\0') goto LAB_00143e65;
        uVar28 = *local_138;
        piVar1 = (int *)(uVar28 + local_170 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_1e8._80_8_;
        if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_00143e65;
LAB_00143b00:
        iVar49 = (int)uVar22;
        uVar46 = (ulong)iVar49;
        piVar1 = (int *)(local_170 + 4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if ((*(char *)(local_1e8._24_8_ + 1 + uVar46) != '\0') ||
           (piVar1 = (int *)(uVar28 + local_170 + 4 + uVar46 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar46 + 1 + lVar42 + local_1e8._24_8_) != '\0')) {
          uVar18 = UFPC::length_;
          lVar26 = (long)(int)UFPC::length_;
          piVar12[lVar26] = piVar12[lVar26] + 1;
          puVar29[lVar26] = uVar18;
          uVar18 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
LAB_00143b79:
          do {
            local_2b8[uVar46] = local_2b8[uVar46] + 1;
            *(uint *)(local_330._24_8_ + uVar46 * 4) = uVar18;
LAB_00143b85:
            lVar26 = (long)(int)uVar22;
            uVar18 = (int)uVar22 + 2;
            uVar22 = (ulong)uVar18;
            if (local_370 <= (int)uVar18) {
              piVar1 = (int *)(local_170 + 8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(local_1e8._24_8_ + 2 + lVar26);
              if (local_370 < (int)uVar18) {
                if ((cVar3 == '\0') &&
                   (piVar1 = (int *)(local_170 + *local_138 + 8 + lVar26 * 4), *piVar1 = *piVar1 + 1
                   , *(char *)(lVar26 + 2 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) == '\0'))
                {
                  local_2b8[lVar26 + 2] = local_2b8[lVar26 + 2] + 1;
                  *(undefined4 *)(local_330._24_8_ + 8 + lVar26 * 4) = 0;
                }
                else {
                  local_2b8[lVar26] = local_2b8[lVar26] + 1;
                  uVar23 = *(undefined4 *)(local_330._24_8_ + lVar26 * 4);
                  local_2b8[lVar26 + 2] = local_2b8[lVar26 + 2] + 1;
                  *(undefined4 *)(local_330._24_8_ + 8 + lVar26 * 4) = uVar23;
                }
              }
              else {
                if (cVar3 == '\0') {
                  uVar22 = *local_138;
                  piVar1 = (int *)(uVar22 + local_170 + 8 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_1e8._80_8_;
                  if (*(char *)(lVar26 + 2 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0015251b;
                }
LAB_00144375:
                lVar26 = (long)(int)uVar18;
                piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                local_2b8[lVar26 + -2] = local_2b8[lVar26 + -2] + 1;
                uVar23 = *(undefined4 *)(local_330._24_8_ + -8 + lVar26 * 4);
                local_2b8[lVar26] = local_2b8[lVar26] + 1;
                *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
              }
              goto LAB_001443dd;
            }
            piVar1 = (int *)(local_170 + 8 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + 2 + lVar26) == '\0') {
              uVar28 = *local_138;
              piVar1 = (int *)(uVar28 + local_170 + 8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_1e8._80_8_;
              if (*(char *)(lVar26 + 2 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_00143b00;
            }
LAB_00143bcb:
            uVar46 = (ulong)(int)uVar22;
            piVar1 = (int *)(local_170 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(local_1e8._24_8_ + 1 + uVar46);
            local_2b8[uVar46 - 2] = local_2b8[uVar46 - 2] + 1;
            uVar18 = *(uint *)(local_330._24_8_ + -8 + uVar46 * 4);
            if (cVar3 == '\0') {
              local_2b8[uVar46] = local_2b8[uVar46] + 1;
              *(uint *)(local_330._24_8_ + uVar46 * 4) = uVar18;
              do {
                piVar13 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                puVar11 = UFPC::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar49 = (int)uVar22;
                uVar18 = iVar49 + 2;
                if (local_370 <= (int)uVar18) {
LAB_0014407b:
                  lVar26 = (long)(int)uVar18;
                  piVar1 = (int *)(local_170 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (local_370 < (int)uVar18) {
                    uVar22 = *local_138;
                    lVar42 = *(long *)local_1e8._80_8_;
                    if ((*(char *)(local_1e8._24_8_ + lVar26) == '\0') &&
                       (piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4), *piVar1 = *piVar1 + 1,
                       *(char *)(lVar26 + local_1e8._24_8_ + lVar42) == '\0')) {
                      local_2b8[lVar26] = local_2b8[lVar26] + 1;
                      goto LAB_00152217;
                    }
                  }
                  else {
                    if (*(char *)(local_1e8._24_8_ + lVar26) != '\0') {
                      piVar1 = (int *)(*local_138 + local_170 + 4 + (long)iVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)iVar49 + 1 + local_1e8._24_8_ + *(long *)local_1e8._80_8_)
                          == '\0') goto LAB_0014439a;
                      goto LAB_00144375;
                    }
                    uVar22 = *local_138;
                    piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_1e8._80_8_;
                    if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0015251b;
                    piVar1 = (int *)(local_170 + 0xc + (long)iVar49 * 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  lVar43 = (long)iVar49;
                  piVar1 = (int *)(local_170 + uVar22 + 4 + lVar43 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::length_;
                  if (*(char *)(lVar43 + 1 + local_1e8._24_8_ + lVar42) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    local_2b8[lVar26] = local_2b8[lVar26] + 1;
                    goto LAB_0014430f;
                  }
                  local_2b8[lVar43] = local_2b8[lVar43] + 1;
                  uVar23 = *(undefined4 *)(local_330._24_8_ + lVar43 * 4);
                  local_2b8[lVar26] = local_2b8[lVar26] + 1;
                  *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
                  goto LAB_001443dd;
                }
                lVar36 = (long)iVar49;
                lVar26 = lVar36 + 2;
                lVar43 = local_170 + 8 + lVar36 * 4;
                lVar45 = local_1e8._24_8_ + 2 + lVar36;
                lVar48 = local_330._24_8_ + lVar36 * 4;
                lVar41 = lVar36 << 0x20;
                lVar40 = 0;
                while (piVar1 = (int *)(lVar43 + lVar40 * 4), *piVar1 = *piVar1 + 1,
                      *(char *)(lVar45 + lVar40) == '\0') {
                  uVar28 = *local_138;
                  lVar32 = uVar28 + local_170 + lVar36 * 4;
                  piVar1 = (int *)(lVar32 + 8 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_1e8._80_8_;
                  lVar31 = lVar42 + local_1e8._24_8_ + lVar36;
                  if (*(char *)(lVar40 + 2 + lVar31) == '\0') {
                    uVar22 = (ulong)(uint)((int)lVar26 + (int)lVar40);
                    goto LAB_00143b00;
                  }
                  piVar1 = (int *)(lVar43 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar45 + 1 + lVar40) != '\0') {
                    piVar1 = (int *)(uVar28 + local_170 + (lVar41 + 0x100000000 >> 0x1e));
                    *piVar1 = *piVar1 + 1;
                    uVar18 = UFPC::length_;
                    uVar46 = lVar26 + lVar40;
                    if (*(char *)(lVar42 + local_1e8._24_8_ + (lVar41 + 0x100000000 >> 0x20)) ==
                        '\0') {
                      lVar26 = (long)(int)UFPC::length_;
                      piVar12[lVar26] = piVar12[lVar26] + 1;
                      puVar29[lVar26] = uVar18;
                      uVar22 = uVar46 & 0xffffffff;
                      uVar18 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                    }
                    else {
                      piVar1 = (int *)((long)local_2b8 + (lVar41 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      uVar22 = uVar46 & 0xffffffff;
                      uVar18 = *(uint *)(local_330._24_8_ + (lVar41 >> 0x1e));
                    }
                    goto LAB_00143b79;
                  }
                  piVar1 = (int *)(lVar32 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::length_;
                  if (*(char *)(lVar40 + 1 + lVar31) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    piVar13[lVar42] = piVar13[lVar42] + 1;
                    puVar11[lVar42] = uVar18;
                    uVar18 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                  }
                  else {
                    local_2b8[lVar36 + lVar40] = local_2b8[lVar36 + lVar40] + 1;
                    uVar18 = *(uint *)(lVar48 + lVar40 * 4);
                  }
                  local_2b8[lVar36 + lVar40 + 2] = local_2b8[lVar36 + lVar40 + 2] + 1;
                  *(uint *)(lVar48 + 8 + lVar40 * 4) = uVar18;
                  lVar41 = lVar41 + 0x200000000;
                  lVar42 = lVar26 + lVar40;
                  lVar40 = lVar40 + 2;
                  if ((long)(uVar51 & 0xffffffff) <= lVar42 + 2) {
                    uVar18 = iVar49 + (int)lVar40 + 2;
                    iVar49 = iVar49 + (int)lVar40;
                    goto LAB_0014407b;
                  }
                }
                piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + *local_138 + local_170);
                *piVar1 = *piVar1 + 1;
                uVar22 = lVar26 + lVar40 & 0xffffffff;
                if (*(char *)((lVar41 + 0x100000000 >> 0x20) +
                             *(long *)local_1e8._80_8_ + local_1e8._24_8_) != '\0')
                goto LAB_00143bcb;
LAB_00143e65:
                lVar26 = (long)(int)uVar22;
                piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                uVar18 = UFPC::length_;
                cVar3 = *(char *)(local_1e8._24_8_ + 1 + lVar26);
                lVar42 = (long)(int)UFPC::length_;
                piVar12[lVar42] = piVar12[lVar42] + 1;
                puVar29[lVar42] = uVar18;
                uVar18 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                local_2b8[lVar26] = local_2b8[lVar26] + 1;
                *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
                if (cVar3 != '\0') goto LAB_00143b85;
              } while( true );
            }
          } while( true );
        }
        local_2b8[iVar49] = local_2b8[iVar49] + 1;
        *(undefined4 *)(local_330._24_8_ + (long)iVar49 * 4) = 0;
        uVar18 = iVar49 + 2;
        uVar22 = (ulong)uVar18;
      } while ((int)uVar18 < local_370);
    }
    lVar26 = (long)(int)uVar18;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (local_370 < (int)uVar18) {
      if ((*(char *)(local_1e8._24_8_ + lVar26) == '\0') &&
         (piVar1 = (int *)(local_170 + *local_138 + lVar26 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar26 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) == '\0')) {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_00152217:
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      }
      else {
        uVar18 = UFPC::length_;
        lVar42 = (long)(int)UFPC::length_;
        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar18;
        uVar18 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_0014430f:
        *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      }
      goto LAB_001443dd;
    }
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      uVar22 = *local_138;
      piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_1e8._80_8_;
      if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_0014439a;
LAB_0015251b:
      lVar26 = (long)(int)uVar18;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      if ((*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') &&
         (piVar1 = (int *)(local_170 + uVar22 + 4 + lVar26 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar26 + 1 + local_1e8._24_8_ + lVar42) == '\0')) {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
        goto LAB_001443dd;
      }
    }
    else {
LAB_0014439a:
      lVar26 = (long)(int)uVar18;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
    }
    uVar18 = UFPC::length_;
    lVar42 = (long)(int)UFPC::length_;
    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar42] =
         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar42] + 1;
    UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar42] = uVar18;
    uVar18 = UFPC::length_;
    UFPC::length_ = UFPC::length_ + 1;
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
LAB_001443dd:
    local_11c = iVar5 - (((uint)(uVar34 >> 0x1f) & 1) + iVar5 & 0xfffffffe);
    uVar18 = iVar5 - local_11c;
    if (2 < (int)uVar18) {
      uVar22 = 2;
      lVar26 = 1;
      local_200 = (pointer)0x3;
      local_3c8 = 0;
      local_3e0 = (long *)local_330._24_8_;
      local_3d0 = local_2b8;
      do {
        local_348 = *local_138;
        piVar1 = (int *)(local_170 + local_348 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_340 = *(long *)local_1e8._80_8_;
        cVar3 = *(char *)(local_1e8._24_8_ + local_340 * uVar22);
        if (2 < iVar6) {
          local_368 = (long *)local_1e8._80_8_;
          local_350 = local_138;
          local_3f0 = 0;
          local_3d8 = local_1e8._24_8_;
          local_388 = local_170;
          local_260 = local_1e8._24_8_;
          local_1f8 = local_170;
          local_400 = 0;
          lVar42 = local_170;
          local_3f8 = local_170;
          uVar46 = local_348;
          lVar43 = local_1e8._24_8_;
          local_338 = local_340;
          local_3b0 = local_1e8._24_8_;
          uVar28 = local_348;
          local_3a0 = local_348;
          local_3e8 = (pointer)local_348;
          local_398 = (pointer)local_340;
          local_390 = local_348;
          local_378 = (pointer)local_340;
          local_360 = (pointer)local_340;
          local_220 = local_340;
          local_210 = local_348;
          local_1f0 = local_340;
          if (cVar3 == '\0') goto LAB_00144a5f;
LAB_00144562:
          lVar43 = uVar22 - 1;
          uVar46 = (ulong)(int)local_3f0;
          piVar1 = (int *)(local_348 * lVar43 + lVar42 + 4 + uVar46 * 4);
          *piVar1 = *piVar1 + 1;
          local_400 = local_3f0;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(uVar46 + 1 + local_340 * lVar43 + local_3b0) == '\0') {
            uVar28 = *local_350;
            piVar1 = (int *)(uVar28 * uVar22 + lVar42 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            local_338 = *local_368;
            local_3d8 = local_3b0;
            local_378 = (pointer)local_338;
            local_3f8 = lVar42;
            local_3a0 = uVar28;
            local_360 = (pointer)local_338;
            local_348 = uVar28;
            local_340 = local_338;
            lVar45 = lVar42;
            uVar27 = uVar28;
            lVar48 = local_3b0;
            if (*(char *)(uVar46 + 1 + local_338 * uVar22 + local_3b0) != '\0') goto LAB_00144cd0;
            local_390 = *local_350;
            uVar20 = (ulong)(int)local_3f0;
            piVar1 = (int *)(local_390 * lVar43 + lVar42 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::length_;
            local_398 = (pointer)*local_368;
            local_3a8 = (long *)local_330._80_8_;
            if (*(char *)(uVar20 + lVar43 * (long)local_398 + local_3b0) == '\0') {
              lVar43 = (long)(int)UFPC::length_;
              UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar43] =
                   UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar43] + 1;
              UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
              uVar16 = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              uVar27 = *local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              local_358 = *(long *)local_330._80_8_;
              *(uint *)(local_358 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
              local_388 = lVar42;
              local_3d0 = local_2b8;
              uVar20 = local_3f0;
              local_208 = local_358;
              local_3e8 = (pointer)local_390;
              local_3c0 = local_280;
              local_3a0 = local_390;
              local_380 = uVar27;
              local_378 = local_398;
              local_360 = local_398;
              local_348 = local_390;
              local_340 = (long)local_398;
              local_338 = (long)local_398;
              local_260 = local_3b0;
              local_258 = uVar27;
              local_250 = uVar27;
              local_248 = lVar42;
              local_240 = local_358;
              local_238 = local_390;
              local_230 = local_358;
              local_228 = local_3b0;
              local_220 = (long)local_398;
              local_218 = local_390;
              local_210 = local_390;
              local_1f8 = lVar42;
              local_1f0 = (long)local_398;
              goto LAB_0014631d;
            }
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + uVar20 * 4);
            local_3d0 = local_2b8;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_380 = uVar27;
            local_358 = lVar42;
            local_258 = uVar27;
            local_250 = uVar27;
            local_240 = lVar42;
            local_230 = lVar42;
            goto LAB_001481ac;
          }
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar46 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
LAB_0014cf62:
          *(uint *)(lVar43 * uVar22 + (long)local_3e0 + uVar46 * 4) = uVar16;
          local_3f0._0_4_ = (int)local_400;
          local_390._0_4_ = (int)local_3f0 + 2;
          local_3d0 = local_2b8;
          local_3f8 = local_170;
          local_3b0 = local_1e8._24_8_;
          local_3e0 = (long *)local_330._24_8_;
          if ((int)(uint)local_390 < local_370) {
            local_350 = local_138;
            local_348 = *local_138;
            local_220 = local_170 + local_348 * uVar22;
            local_368 = (long *)local_1e8._80_8_;
            local_338 = *(long *)local_1e8._80_8_;
            local_210 = uVar22 | 1;
            local_1f0 = uVar22 - 1;
            lVar38 = (long)(int)local_3f0;
            lVar37 = local_348 * local_1f0;
            lVar33 = local_338 * local_1f0;
            lVar50 = lVar38 << 0x20;
            lVar45 = local_348 * uVar22 + lVar38 * 4;
            local_1f8 = local_1e8._24_8_ + local_338 * uVar22;
            lVar35 = local_338 * uVar22 + lVar38;
            lVar55 = local_338 * (long)local_200 + lVar38;
            lVar48 = local_348 * (long)local_200 + lVar38 * 4;
            lVar40 = local_348 * lVar26 + lVar38 * 4;
            lVar44 = local_338 * lVar26 + lVar38;
            lVar47 = local_330._24_8_ + lVar38 * 4 + 8;
            lVar31 = lVar38 * 4 + 8;
            lVar42 = uVar22 - 2;
            lVar43 = lVar38 + 2;
            lVar36 = local_170 + lVar37;
            local_260 = local_1e8._24_8_ + lVar33;
            lVar41 = local_170 + 0xc + lVar45;
            lVar32 = local_1e8._24_8_ + 3 + lVar35;
            lVar54 = 0;
            do {
              piVar1 = (int *)(lVar41 + -4 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              lVar39 = lVar50 >> 0x1e;
              local_378 = (pointer)local_338;
              local_388 = local_170;
              plVar30 = (long *)local_330._24_8_;
              local_340 = local_338;
              local_3e8 = (pointer)local_348;
              local_360 = (pointer)local_338;
              local_208 = lVar33;
              local_398 = (pointer)local_338;
              if (*(char *)(lVar32 + -1 + lVar54) == '\0') {
                piVar1 = (int *)(lVar48 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                local_400 = lVar43 + lVar54;
                local_3a0 = local_348;
                uVar28 = local_348;
                if (*(char *)(lVar54 + 2 + lVar55 + local_1e8._24_8_) == '\0') {
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  puVar29 = (pointer)local_348;
                  lVar45 = local_170;
                  lVar48 = local_338;
                  lVar40 = local_1e8._24_8_;
                  local_238 = local_348;
                  local_220 = local_338;
                  local_210 = local_348;
                  goto LAB_00144bfb;
                }
                lVar42 = local_348 * local_210 + local_170;
                lVar41 = local_210 * local_338 + local_1e8._24_8_;
                lVar45 = lVar50 + 0x300000000 >> 0x20;
                piVar1 = (int *)(local_220 + (lVar50 + 0x300000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar48 = lVar50 + 0x100000000 >> 0x20;
                if (*(char *)(local_1f8 + lVar45) == '\0') {
                  piVar1 = (int *)(lVar42 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = local_348;
                  if (*(char *)(lVar41 + lVar48) != '\0') {
                    local_3c0 = local_280;
                    uVar27 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    local_3a8 = (long *)local_330._80_8_;
                    local_358 = *(long *)local_330._80_8_;
                    lVar42 = local_358 * uVar22 + local_330._24_8_;
                    uVar23 = *(undefined4 *)(lVar39 + lVar42);
                    piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8
                                    );
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                    local_228 = local_1e8._24_8_;
                    local_248 = local_170;
                    local_3d8 = local_1e8._24_8_;
                    local_338 = local_338;
                    lVar42 = local_358;
                    local_380 = uVar27;
                    local_258 = uVar27;
                    local_250 = uVar27;
                    local_240 = local_358;
                    local_230 = local_358;
                    local_220 = local_338;
                    local_218 = local_348;
                    local_210 = local_348;
                    goto LAB_001469b8;
                  }
                  piVar1 = (int *)(local_220 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = UFPC::length_;
                  if (*(char *)(local_1f8 + lVar48) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar16;
                    uVar16 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    local_3c0 = local_280;
                    uVar27 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8
                                    );
                    *piVar1 = *piVar1 + 1;
                    local_3a8 = (long *)local_330._80_8_;
                    local_358 = *(long *)local_330._80_8_;
                    *(uint *)(local_358 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4) =
                         uVar16;
                    local_228 = local_1e8._24_8_;
                    local_248 = local_170;
                    local_3d8 = local_1e8._24_8_;
                    local_338 = local_338;
                    lVar42 = local_358;
                    local_380 = uVar27;
                    local_258 = uVar27;
                    local_250 = uVar27;
                    local_240 = local_358;
                    local_230 = local_358;
                    local_220 = local_338;
                    local_218 = local_348;
                    local_210 = local_348;
                    goto LAB_001469b8;
                  }
                  local_3c0 = local_280;
                  uVar27 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  local_358 = *(long *)local_330._80_8_;
                  lVar42 = local_358 * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar39 + lVar42);
                  piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  local_338 = local_338;
                  lVar42 = local_358;
                  local_380 = uVar27;
                  local_258 = uVar27;
                  local_250 = uVar27;
                  local_240 = local_358;
                  local_230 = local_358;
                  local_220 = local_338;
                  local_218 = local_348;
                  local_210 = local_348;
                  goto LAB_001469b8;
                }
                piVar1 = (int *)(local_220 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_1f8 + lVar48) != '\0') goto LAB_0014d76d;
                piVar1 = (int *)(lVar42 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar41 + lVar48) == '\0') {
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  lVar42 = local_170;
                  local_238 = local_348;
                  goto LAB_00144c30;
                }
                piVar1 = (int *)(lVar36 + lVar45 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar45 + local_260) != '\0') goto LAB_0014d795;
                piVar1 = (int *)(lVar36 + (lVar50 + 0x400000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_260 + (lVar50 + 0x400000000 >> 0x20)) != '\0')
                goto LAB_0014b588;
                piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                local_3c0 = local_280;
                local_380 = *local_280;
                if (*(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * local_3c8 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                    lVar54 * 4);
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = local_400 & 0xffffffff;
                  uVar20 = local_400;
                  goto LAB_00144dc0;
                }
                piVar1 = (int *)((long)local_2b8 + lVar39 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                local_230 = *(long *)local_330._80_8_;
                lVar42 = local_230 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar39 + lVar42);
                piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8)
                ;
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
LAB_0014e768:
                local_400 = lVar43 + lVar54;
                local_248 = local_170;
                local_3a8 = (long *)local_330._80_8_;
                local_3c0 = local_280;
                lVar43 = local_1e8._24_8_;
                lVar36 = local_338;
                lVar42 = local_230;
                lVar45 = local_1e8._24_8_;
                local_3a0 = local_348;
                local_258 = local_380;
                local_238 = local_348;
                goto LAB_00148abd;
              }
              piVar1 = (int *)(lVar41 + -8 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              iVar49 = (int)lVar43;
              if ((*(char *)(lVar32 + -2 + lVar54) != '\0') ||
                 (piVar1 = (int *)(local_170 + lVar48 + 4 + lVar54 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(local_1e8._24_8_ + lVar55 + 1 + lVar54) != '\0')) {
                local_400 = (ulong)(uint)(iVar49 + (int)lVar54);
                goto LAB_0014b4b9;
              }
              piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar44 + 3 + lVar54) == '\0') {
                piVar1 = (int *)(lVar45 + local_170 + 0xc + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                uVar20 = lVar43 + lVar54;
                local_3d8 = local_1e8._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                local_3c0 = local_280;
                if (*(char *)(lVar54 + 3 + lVar35 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)(lVar36 + (lVar50 + 0x400000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  cVar3 = *(char *)(local_260 + (lVar50 + 0x400000000 >> 0x20));
                  piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar4 = *(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_);
                  if (cVar3 != '\0') {
                    local_400 = uVar20;
                    if (cVar4 != '\0') goto LAB_00144d23;
                    lVar42 = lVar50 + 0x300000000 >> 0x20;
                    goto LAB_0014e2d2;
                  }
                  local_380 = *local_280;
                  if (cVar4 != '\0') {
                    piVar1 = (int *)((long)local_2b8 +
                                    lVar54 * 4 + lVar38 * 4 + local_380 * local_3c8 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_330._80_8_;
                    uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                      lVar54 * 4);
                    piVar1 = (int *)((long)local_2b8 +
                                    lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar46 = uVar20 & 0xffffffff;
                    goto LAB_00144dc0;
                  }
                  piVar1 = (int *)((long)local_2b8 + lVar39 + local_380 * lVar42);
                  *piVar1 = *piVar1 + 1;
                  local_230 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar39 + lVar42 * local_230 + local_330._24_8_);
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (local_230 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                  goto LAB_0014e768;
                }
                piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                uVar27 = *local_280;
                local_250 = uVar27;
                local_380 = uVar27;
                local_258 = uVar27;
                if (*(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + uVar27 * local_3c8 + 8);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                    lVar54 * 4);
                  piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_400 = uVar20 & 0xffffffff;
                  local_358 = lVar42;
                  local_240 = lVar42;
                  local_230 = lVar42;
                  goto LAB_001481ac;
                }
                piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * lVar42);
                *piVar1 = *piVar1 + 1;
                local_358 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)(lVar39 + lVar42 * local_358 + local_330._24_8_);
                piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4)
                     = uVar23;
                local_390 = local_348;
                local_208 = local_358;
                local_3f8 = local_170;
                local_3e8 = (pointer)local_348;
                local_3b0 = local_3d8;
                local_3a0 = local_348;
                local_260 = local_3d8;
                local_248 = local_170;
                local_240 = local_358;
                local_238 = local_348;
                local_230 = local_358;
                local_228 = local_3d8;
                local_220 = local_338;
                local_218 = local_348;
                local_210 = local_348;
                local_1f8 = local_170;
                local_1f0 = local_338;
                goto LAB_0014631d;
              }
              piVar1 = (int *)(local_170 + lVar40 + 8 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar44 + 2 + lVar54) == '\0') goto LAB_0014d8f5;
              lVar39 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + local_3c8 * lVar39 + lVar31);
              *piVar1 = *piVar1 + 1;
              lVar8 = *(long *)local_330._80_8_;
              uVar23 = *(undefined4 *)(local_3c8 * lVar8 + lVar47 + lVar54 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar39 * uVar22 + lVar31);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar22 + lVar47 + lVar54 * 4) = uVar23;
              lVar50 = lVar50 + 0x200000000;
              lVar39 = lVar43 + lVar54;
              lVar54 = lVar54 + 2;
              if ((long)uVar51 <= lVar39 + 2) {
                local_3f0._0_4_ = (int)local_3f0 + (int)lVar54;
                local_390._0_4_ = iVar49 + (int)lVar54;
                break;
              }
            } while( true );
          }
          local_348 = *local_138;
          lVar42 = local_348 * uVar22 + local_170;
          local_400 = (ulong)(int)(uint)local_390;
          piVar1 = (int *)(lVar42 + local_400 * 4);
          *piVar1 = *piVar1 + 1;
          local_340 = *(long *)local_1e8._80_8_;
          lVar43 = local_340 * uVar22 + local_1e8._24_8_;
          if (local_370 < (int)(uint)local_390) {
            if (*(char *)(local_400 + lVar43) == '\0') {
              lVar48 = local_348 * (uVar22 | 1);
              piVar1 = (int *)(local_170 + lVar48 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              lVar45 = local_340 * (uVar22 | 1);
              if (*(char *)(local_400 + local_1e8._24_8_ + lVar45) == '\0') {
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)
                 (*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0;
              }
              else {
LAB_0014d606:
                lVar40 = (long)(int)local_3f0;
                piVar1 = (int *)(local_170 + lVar48 + 4 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 1 + local_1e8._24_8_ + lVar45) == '\0') {
                  piVar1 = (int *)(lVar42 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = UFPC::length_;
                  if (*(char *)(lVar40 + 1 + lVar43) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar16;
                    uVar16 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    piVar1 = (int *)((long)local_2b8 +
                                    (long)(int)(uint)local_390 * 4 + *local_280 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ +
                             (long)(int)(uint)local_390 * 4) = uVar16;
                  }
                  else {
                    lVar43 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar43 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                    uVar23 = *(undefined4 *)(lVar42 + lVar40 * 4);
                    local_400 = (ulong)(int)(uint)local_390;
                    piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                    *piVar1 = *piVar1 + 1;
LAB_0014767f:
                    *(undefined4 *)(lVar42 + local_400 * 4) = uVar23;
                  }
                }
                else {
                  lVar42 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar42 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar43 + lVar40 * 4);
                  piVar1 = (int *)((long)local_2b8 +
                                  (long)(int)(uint)local_390 * 4 + lVar42 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar43 + (long)(int)(uint)local_390 * 4) = uVar23;
                }
              }
            }
            else {
              lVar45 = (long)(int)local_3f0;
              piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              if ((*(char *)(lVar43 + 1 + lVar45) == '\0') &&
                 (piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar45 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(lVar45 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')) {
                lVar43 = local_348 * (uVar22 - 1);
                lVar42 = local_340 * (uVar22 - 1);
LAB_0014de48:
                piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                lVar43 = uVar22 - 2;
                lVar45 = *local_280;
                if (*(char *)(local_400 + local_1e8._24_8_ + lVar42) == '\0') {
                  piVar1 = (int *)((long)local_2b8 + (long)(int)local_3f0 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)
                            (lVar43 * lVar42 + local_330._24_8_ + (long)(int)local_3f0 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
                }
                else {
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar43 * lVar42 + local_330._24_8_ + local_400 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
                }
              }
              else {
                lVar43 = *local_280;
                piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar42 + lVar45 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
LAB_0014d2f8:
                *(undefined4 *)(lVar42 + local_400 * 4) = uVar23;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
            }
            goto LAB_0014db40;
          }
          if (*(char *)(local_400 + lVar43) == '\0') {
            lVar48 = local_348 * (uVar22 | 1);
            piVar1 = (int *)(local_170 + lVar48 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = (uVar22 | 1) * local_340;
            if (*(char *)(local_400 + local_1e8._24_8_ + lVar45) == '\0') goto LAB_0014da68;
            lVar40 = (long)(int)local_3f0;
            piVar1 = (int *)(lVar42 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + 3 + lVar40) == '\0') goto LAB_0014d606;
            piVar1 = (int *)(lVar42 + 4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + 1 + lVar40) != '\0') goto LAB_0014d348;
            piVar1 = (int *)(local_170 + lVar48 + 4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + lVar45 + 1 + lVar40) == '\0') goto LAB_00144488;
            lVar43 = local_348 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * local_340;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar42) == '\0') {
              piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar42 + local_400) == '\0') {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + lVar40 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
              }
              goto LAB_0014db40;
            }
          }
          else {
            lVar45 = (long)(int)local_3f0;
            piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            if ((*(char *)(lVar43 + 1 + lVar45) == '\0') &&
               (piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar45 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)(lVar45 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')) {
              lVar43 = local_348 * (uVar22 - 1);
              piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = (uVar22 - 1) * local_340;
              if (*(char *)(lVar45 + 3 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0014de48;
              piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar42 + local_400) == '\0') {
LAB_0014e791:
                lVar42 = uVar22 - 2;
                piVar1 = (int *)(local_348 * lVar42 + local_3f8 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_400 + local_340 * lVar42 + local_3b0) != '\0') {
                  lVar43 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * lVar42);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar42 * lVar45 + local_330._24_8_ + local_400 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = lVar45 * uVar22 + local_330._24_8_;
                  goto LAB_0014d2f8;
                }
                lVar43 = *local_280;
                piVar1 = (int *)((long)local_2b8 +
                                (long)(int)(uint)local_390 * 4 + lVar43 * lVar42 + -8);
                *piVar1 = *piVar1 + 1;
                lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
                uVar16 = *(uint *)(lVar45 + -8 + (long)(int)(uint)local_390 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * lVar42);
                *piVar1 = *piVar1 + 1;
                uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar45 + local_400 * 4));
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) =
                     uVar16;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
              }
              goto LAB_0014db40;
            }
LAB_0014d348:
            lVar45 = (long)(int)(uint)local_390;
            lVar43 = local_348 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar43 + 4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * local_340;
            if (*(char *)(lVar45 + 1 + local_1e8._24_8_ + lVar42) == '\0') {
              lVar42 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
              uVar23 = *(undefined4 *)(lVar43 + -8 + lVar45 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
              goto LAB_0014db40;
            }
          }
LAB_0014d377:
          lVar45 = (long)(int)(uint)local_390;
          piVar1 = (int *)(lVar43 + local_170 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = uVar22 - 2;
          if (*(char *)(lVar45 + lVar42 + local_1e8._24_8_) == '\0') {
            piVar1 = (int *)(local_170 + local_348 * lVar43 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar45 + local_1e8._24_8_ + local_340 * lVar43);
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * lVar48 + local_330._24_8_ + lVar45 * 4);
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_330._24_8_ + lVar48 * uVar22 + -8 + lVar45 * 4);
LAB_00147345:
              uVar16 = UFPC::MemMerge(uVar16,uVar17);
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16
              ;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
LAB_0014d4dd:
              *(uint *)(lVar48 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
            }
          }
          else {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)(lVar43 * lVar48 + local_330._24_8_ + lVar45 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar48 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar23;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          goto LAB_0014db40;
        }
        if (iVar6 == 2) {
          local_390._0_4_ = 0;
          if (cVar3 == '\0') {
            local_400 = 0;
LAB_00144683:
            local_390._0_4_ = (uint)local_400;
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
LAB_0014da68:
              lVar45 = (long)(int)(uint)local_390;
              local_348 = *local_138;
              piVar1 = (int *)(local_348 * uVar22 + local_170 + 4 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              local_340 = *(long *)local_1e8._80_8_;
              if (*(char *)(lVar45 + 1 + local_340 * uVar22 + local_1e8._24_8_) != '\0')
              goto LAB_00144488;
              lVar45 = lVar45 + 1;
LAB_0014dabb:
              piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = (long)(int)(uint)local_390;
              if (*(char *)(lVar45 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4)
                     = 0;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
                goto LAB_0014db40;
              }
            }
            else {
              piVar1 = (int *)(local_348 * uVar22 + local_170 + 4 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + 1 + local_340 * uVar22 + local_1e8._24_8_) != '\0')
              goto LAB_00144488;
            }
LAB_0014dae1:
            uVar16 = UFPC::length_;
            lVar43 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar43] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
            uVar16 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          else {
LAB_00144488:
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + 4 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_400 = (ulong)(uint)local_390;
            if (*(char *)(lVar42 + 1 + (uVar22 - 1) * local_340 + local_1e8._24_8_) == '\0')
            goto LAB_001445f7;
LAB_0014461a:
            lVar43 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar45 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar45 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar23;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
        }
        else {
          local_400 = 0;
          if (cVar3 != '\0') {
LAB_001445f7:
            lVar42 = (long)(int)local_400;
            piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + local_340 * (uVar22 - 1) + local_1e8._24_8_) == '\0')
            goto LAB_0014dae1;
            goto LAB_0014461a;
          }
          lVar42 = 0;
LAB_001446e2:
          piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::length_;
          local_3d0 = local_2b8;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(lVar42 + local_340 * (uVar22 | 1) + local_1e8._24_8_) == '\0') {
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = 0;
          }
          else {
            lVar43 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar43] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
            uVar16 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
          }
        }
LAB_0014db40:
        uVar22 = uVar22 + 2;
        lVar26 = lVar26 + 2;
        local_3c8 = local_3c8 + 2;
        local_200 = (pointer)((long)local_200 + 2);
      } while (uVar22 < uVar18);
    }
    this = local_268;
    if (local_11c == 1) {
      lVar26 = uVar34 - 1;
      uVar18 = 0;
      iVar49 = (int)lVar26;
      if (2 < iVar6) {
        lVar42 = (long)(iVar5 + -2);
        lVar43 = (long)(iVar5 + -3);
        local_200 = (pointer)(uVar51 & 0xffffffff);
        local_3f0 = *(ulong *)local_1e8._80_8_;
        uVar16 = 0xfffffffe;
        uVar51 = 0;
        local_380 = local_1e8._24_8_;
        do {
          local_3c0 = (long *)*local_138;
          lVar45 = (long)local_3c0 * lVar26 + local_170;
          uVar18 = (uint)uVar51;
          local_410 = (ulong)(int)uVar18;
          piVar1 = (int *)(lVar45 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3f0 * lVar26 + local_380;
          plVar30 = (long *)local_170;
          local_3b0 = local_170;
          local_368 = (long *)local_380;
          local_350 = (ulong *)local_380;
          local_3a8 = (long *)local_170;
          if (*(char *)(local_410 + lVar48) == '\0') goto LAB_0014ee63;
          lVar41 = (long)(int)uVar16;
          lVar40 = (long)local_3c0 * lVar42;
          piVar1 = (int *)(lVar40 + local_170 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = local_3f0 * lVar42;
          if (*(char *)(lVar41 + 3 + local_380 + lVar36) != '\0') {
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d8 = *(long *)local_330._80_8_;
            uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            local_3e8 = local_2b8;
            local_380 = local_330._24_8_;
            this = local_268;
            local_3a0 = local_330._24_8_;
            goto LAB_00151234;
          }
          piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
LAB_0014efca:
            uVar18 = (uint)uVar51;
            local_410 = (ulong)(int)uVar18;
            piVar1 = (int *)(lVar40 + (long)plVar30 + 8 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(local_410 + 2 + lVar36 + local_380);
            piVar1 = (int *)(lVar40 + (long)plVar30 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::length_;
            cVar4 = *(char *)(local_410 + lVar36 + local_380);
            this = local_268;
            puVar29 = local_2b8;
            local_388 = local_330._24_8_;
            local_220 = (long)plVar30;
            if (cVar3 != '\0') {
              if (cVar4 != '\0') goto LAB_0014f036;
              local_3e0 = local_280;
              local_400 = *local_280;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43 + 8);
              *piVar1 = *piVar1 + 1;
              local_3d0 = (pointer)local_330._80_8_;
              local_3d8 = *(long *)local_330._80_8_;
              uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + local_410 * 4);
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3f8 = local_330._24_8_;
              local_3a0 = local_330._24_8_;
              local_3e8 = local_2b8;
              local_398 = local_2b8;
              uVar22 = local_410;
              local_378 = local_2b8;
              lVar45 = local_330._24_8_;
              goto LAB_0015025c;
            }
            if (cVar4 == '\0') {
              lVar45 = (long)(int)UFPC::length_;
              UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar45] =
                   UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar45] + 1;
              UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar16;
              uVar16 = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              local_3e0 = local_280;
              local_400 = *local_280;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3d0 = (pointer)local_330._80_8_;
              local_3d8 = *(long *)local_330._80_8_;
              local_3f8 = local_330._24_8_;
              local_398 = local_2b8;
              local_3e8 = local_2b8;
              local_3a0 = local_330._24_8_;
              goto LAB_0014fcd5;
            }
            local_3e0 = local_280;
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d0 = (pointer)local_330._80_8_;
            local_3d8 = *(long *)local_330._80_8_;
            local_3f8 = local_330._24_8_;
            local_398 = local_2b8;
            local_3a0 = local_330._24_8_;
            local_360 = local_2b8;
            local_260 = local_330._24_8_;
            local_378 = local_2b8;
            lVar45 = local_330._24_8_;
LAB_0014f16a:
            lVar48 = local_3d8 * lVar43;
            uVar23 = *(undefined4 *)(lVar45 + lVar48 + local_410 * 4);
            lVar45 = local_400 * lVar26;
            piVar1 = (int *)((long)puVar29 + local_410 * 4 + lVar45);
            *piVar1 = *piVar1 + 1;
            lVar36 = local_3d8 * lVar26 + local_388;
            *(undefined4 *)(lVar36 + local_410 * 4) = uVar23;
            lVar40 = (long)(int)uVar18;
            uVar51 = lVar40 + 2;
            uVar18 = (uint)uVar51;
            if ((int)uVar18 < local_370) {
              lVar41 = (long)local_3c0 * lVar26 + (long)local_3a8;
              piVar1 = (int *)(lVar41 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar32 = local_3f0 * lVar26 + (long)local_368;
              if (*(char *)(lVar40 + 2 + lVar32) == '\0') {
                local_3b0 = (long)local_3a8;
                uVar51 = uVar51 & 0xffffffff;
                plVar30 = local_3a8;
                local_380 = (long)local_368;
                goto LAB_0014ff96;
              }
              lVar31 = (long)local_3c0 * lVar42 + (long)local_3a8;
              piVar1 = (int *)(lVar31 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar33 = local_3f0 * lVar42 + (long)local_368;
              local_410 = uVar51;
              if (*(char *)(lVar40 + 3 + lVar33) != '\0') {
                piVar1 = (int *)((long)local_3a8 + (long)local_3c0 * lVar43 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 2 + (long)local_368 + local_3f0 * lVar43) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 8 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar36 + lVar40 * 4);
                  goto LAB_0014fdb7;
                }
                uVar51 = uVar51 & 0xffffffff;
LAB_00150b50:
                local_410 = (ulong)(int)uVar51;
                piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + local_410 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((local_410 - 1) +
                             *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_) == '\0') {
                  lVar45 = *local_280;
                  local_410 = (ulong)(int)uVar51;
                  piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43 + -8);
                  *piVar1 = *piVar1 + 1;
                  lVar48 = *(long *)local_330._80_8_ * lVar43 + local_330._24_8_;
                  uVar18 = *(uint *)(lVar48 + -8 + local_410 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar48 + local_410 * 4);
                  goto LAB_00151a97;
                }
                local_400 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
                *piVar1 = *piVar1 + 1;
                local_3d0 = (pointer)local_330._80_8_;
                local_3e8 = local_2b8;
                local_3a0 = local_330._24_8_;
                goto LAB_00151824;
              }
              piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar32 + 3 + lVar40) != '\0') {
                piVar1 = (int *)(lVar31 + 0x10 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar33 + 4 + lVar40) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(lVar36 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar36 + 8 + lVar40 * 4) = uVar23;
                  local_3a0 = local_260;
                  goto LAB_00150838;
                }
                lVar32 = (long)local_3a8 + (long)local_3c0 * lVar43;
                piVar1 = (int *)(lVar32 + 0xc + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = local_3f0 * lVar43;
                if (*(char *)(lVar40 + 3 + (long)local_368 + lVar41) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 0x10 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  goto LAB_0014ff25;
                }
                piVar1 = (int *)(lVar32 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_368 + lVar41 + 2 + lVar40) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 0x10 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  local_388 = local_330._24_8_;
                  uVar22 = uVar51;
                  local_378 = local_2b8;
                  puVar29 = local_2b8;
                  lVar45 = local_330._24_8_;
                  uVar51 = uVar51 & 0xffffffff;
                  local_3f8 = local_330._24_8_;
                  local_3e8 = local_2b8;
                  local_3e0 = local_280;
                  local_3d0 = (pointer)local_330._80_8_;
                  local_3a0 = local_330._24_8_;
                  local_398 = local_2b8;
                  goto LAB_0015025c;
                }
                uVar51 = uVar51 & 0xffffffff;
                lVar45 = local_260;
                local_3e8 = puVar29;
                local_380 = local_388;
LAB_00150d50:
                iVar24 = (int)uVar51;
                uVar22 = (ulong)iVar24;
                piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + uVar22 * 4);
                *piVar1 = *piVar1 + 1;
                lVar48 = (long)(iVar24 + 2);
                if (*(char *)((uVar22 - 1) + lVar41 + (long)local_368) != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + *local_3e0 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_380 + *(long *)local_3d0 * lVar43 + lVar48 * 4);
                  local_400 = *local_3e0;
                  piVar1 = (int *)((long)local_378 + uVar22 * 4 + local_400 * lVar26);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_3d0;
                  local_388 = lVar45;
                  puVar29 = local_378;
                  local_3e8 = local_360;
                  goto LAB_0015025c;
                }
                lVar40 = *local_3e0;
                piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar40 * lVar43);
                *piVar1 = *piVar1 + 1;
                lVar36 = *(long *)local_3d0;
                uVar18 = *(uint *)(lVar36 * lVar43 + lVar45 + lVar48 * 4);
                uVar22 = (ulong)iVar24;
                piVar1 = (int *)((long)local_378 + uVar22 * 4 + lVar40 * lVar26 + -8);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(uint *)(lVar36 * lVar26 + lVar45 + -8 + uVar22 * 4);
LAB_0014f448:
                uVar18 = UFPC::MemMerge(uVar18,uVar16);
                local_400 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
                *piVar1 = *piVar1 + 1;
                local_3d8 = *(long *)local_330._80_8_;
                do {
                  local_3f8 = local_330._24_8_;
                  local_3a0 = local_330._24_8_;
                  local_3e8 = local_2b8;
                  local_398 = local_2b8;
                  local_388 = local_330._24_8_;
                  local_378 = local_2b8;
                  puVar29 = local_2b8;
                  lVar45 = local_330._24_8_;
                  local_3e0 = local_280;
                  local_3d0 = (pointer)local_330._80_8_;
LAB_0015025c:
                  *(uint *)(local_3d8 * lVar26 + local_388 + uVar22 * 4) = uVar18;
                  local_3b0._0_4_ = (int)uVar51;
                  uVar18 = (int)local_3b0 + 2;
                  if (local_370 <= (int)uVar18) {
LAB_001521ce:
                    if (local_370 < (int)uVar18) {
                      local_3f0 = *(ulong *)local_1e8._80_8_;
                      local_3a0 = lVar45;
                      local_368 = (long *)local_1e8._24_8_;
                      goto LAB_00152938;
                    }
                    uVar51 = *local_138;
                    lVar41 = uVar51 * lVar26 + local_170;
                    lVar48 = (long)(int)uVar18;
                    piVar1 = (int *)(lVar41 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar45 = *(long *)local_1e8._80_8_;
                    lVar36 = lVar45 * lVar26 + local_1e8._24_8_;
                    lVar40 = (long)(int)local_3b0;
                    if (*(char *)(lVar48 + lVar36) == '\0') {
                      piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar36 + 3 + lVar40) == '\0') {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_388 + local_3d8 * lVar26 + lVar48 * 4) = 0;
                      }
                      else {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar43);
                        *piVar1 = *piVar1 + 1;
                        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_388 + lVar48 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_3d8 * lVar26 + local_388 + lVar48 * 4) = uVar23;
                      }
                    }
                    else {
                      piVar1 = (int *)(local_170 + uVar51 * lVar42 + 0xc + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar45 * lVar42) == '\0') {
                        piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        local_388 = local_388 + local_3d8 * lVar26;
                        uVar23 = *(undefined4 *)(local_388 + lVar40 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_388 + lVar48 * 4) = uVar23;
                      }
                      else {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar43);
                        *piVar1 = *piVar1 + 1;
                        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_388 + lVar48 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_3d8 * lVar26 + local_388 + lVar48 * 4) = uVar23;
                      }
                    }
                    goto LAB_0015316e;
                  }
                  lVar40 = (long)(int)local_3b0;
                  lVar41 = lVar40 << 0x20;
                  lVar48 = lVar40 * 4;
                  lVar36 = 0;
                  local_360 = local_3e8;
                  local_3e8 = puVar29;
                  local_380 = local_388;
                  local_260 = lVar45;
                  while( true ) {
                    local_3c0 = (long *)*local_138;
                    lVar31 = (long)local_3c0 * lVar26 + local_170;
                    lVar45 = lVar31 + lVar48;
                    piVar1 = (int *)(lVar45 + 8 + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    local_3f0 = *(ulong *)local_1e8._80_8_;
                    lVar33 = local_3f0 * lVar26 + local_1e8._24_8_;
                    lVar32 = lVar33 + lVar40;
                    local_3a8 = (long *)local_170;
                    this = local_268;
                    if (*(char *)(lVar36 + 2 + lVar32) == '\0') break;
                    lVar31 = (long)local_3c0 * lVar42 + local_170 + lVar48;
                    piVar1 = (int *)(lVar31 + 0xc + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar33 = local_3f0 * lVar42 + local_1e8._24_8_ + lVar40;
                    iVar52 = (int)lVar36;
                    iVar24 = (int)(lVar40 + 2);
                    if (*(char *)(lVar36 + 3 + lVar33) != '\0') {
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + lVar40 * 4 + 8 +
                                        lVar36 * 4);
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar51 = (ulong)(uint)(iVar24 + iVar52);
                      local_410 = lVar40 + lVar36 + 2;
                      local_380 = local_380;
                      local_3a0 = local_388;
                      goto LAB_00151234;
                    }
                    piVar1 = (int *)(lVar45 + 0xc + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar45 = lVar41 >> 0x1e;
                    if (*(char *)(lVar36 + 3 + lVar32) == '\0') {
                      piVar1 = (int *)((long)puVar29 + lVar45 + local_400 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      local_388 = local_388 + local_3d8 * lVar26;
                      uVar23 = *(undefined4 *)(lVar45 + local_388);
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(local_388 + lVar40 * 4 + 8 + lVar36 * 4) = uVar23;
                      local_350 = (ulong *)local_1e8._24_8_;
                      uVar16 = iVar24 + iVar52;
                      goto LAB_00151da3;
                    }
                    piVar1 = (int *)(lVar31 + 0x10 + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar36 + 4 + lVar33) == '\0') goto LAB_001506c8;
                    piVar1 = (int *)(local_170 + lVar48 + (long)local_3c0 * lVar43 + 0xc +
                                    lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar36 + 3 + local_1e8._24_8_ + lVar40 + local_3f0 * lVar43);
                    piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar48 + local_400 * lVar43 + 0x10
                                    );
                    *piVar1 = *piVar1 + 1;
                    lVar32 = local_3d8 * lVar26 + local_388;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + lVar48 + 0x10 + lVar36 * 4);
                    lVar45 = lVar48 + local_400 * lVar26;
                    if (cVar3 == '\0') {
                      piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar45);
                      *piVar1 = *piVar1 + 1;
                      uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar32 + lVar48 + lVar36 * 4));
                      local_3e0 = local_280;
                      local_400 = *local_280;
                      piVar1 = (int *)((long)local_2b8 +
                                      lVar36 * 4 + lVar48 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      local_3d0 = (pointer)local_330._80_8_;
                      local_3d8 = *(long *)local_330._80_8_;
                      lVar32 = local_3d8 * lVar26 + local_330._24_8_;
                      local_3a0 = local_330._24_8_;
                      local_360 = local_2b8;
                      local_260 = local_330._24_8_;
                      local_378 = local_2b8;
                      local_380 = local_330._24_8_;
                      local_3e8 = local_2b8;
                      local_3f8 = local_330._24_8_;
                      local_388 = local_330._24_8_;
                      local_398 = local_2b8;
                      puVar29 = local_2b8;
                    }
                    else {
                      piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar45 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    *(uint *)(lVar32 + lVar48 + 8 + lVar36 * 4) = uVar18;
                    lVar41 = lVar41 + 0x200000000;
                    lVar45 = lVar40 + lVar36;
                    lVar36 = lVar36 + 2;
                    if ((long)local_200 <= lVar45 + 4) {
                      uVar18 = (int)local_3b0 + (int)lVar36 + 2;
                      local_3b0._0_4_ = (int)local_3b0 + (int)lVar36;
                      this = local_268;
                      lVar45 = local_260;
                      goto LAB_001521ce;
                    }
                  }
                  local_368 = (long *)local_1e8._24_8_;
                  uVar51 = lVar40 + 2 + lVar36;
                  uVar18 = (uint)uVar51;
                  piVar1 = (int *)(lVar31 + (lVar41 + 0x300000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  lVar45 = lVar41 + 0x300000000 >> 0x20;
                  local_410 = lVar40 + 2 + lVar36;
                  if (*(char *)(lVar33 + lVar45) == '\0') {
                    local_400 = *local_3e0;
                    piVar1 = (int *)((long)local_360 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3e8 = local_360;
                    local_380 = local_1e8._24_8_;
                    plVar30 = (long *)local_170;
                    local_3b0 = local_170;
                    goto LAB_0014f73a;
                  }
                  lVar48 = (long)local_3c0 * lVar42 + local_170;
                  piVar1 = (int *)(lVar48 + lVar45 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar32 = local_3f0 * lVar42 + local_1e8._24_8_;
                  if (*(char *)(lVar45 + lVar32) != '\0') {
                    piVar1 = (int *)((long)puVar29 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3b0 = local_170;
                    uVar51 = uVar51 & 0xffffffff;
                    goto LAB_0015002e;
                  }
                  piVar1 = (int *)(lVar48 + (lVar41 + 0x400000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar32 + (lVar41 + 0x400000000 >> 0x20)) == '\0') {
                    piVar1 = (int *)((long)puVar29 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3b0 = local_170;
                    lVar45 = local_388;
                    puVar29 = local_3e8;
                    local_388 = local_380;
                    goto LAB_0014f16a;
                  }
                  uVar51 = uVar51 & 0xffffffff;
LAB_0014f036:
                  uVar22 = (ulong)(int)uVar51;
                  piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + uVar22 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar22 + 1 + local_3f0 * lVar43 + (long)local_368) == '\0')
                  goto LAB_0014f401;
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
                  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
                  *piVar1 = *piVar1 + 1;
                } while( true );
              }
              lVar45 = *local_3e0;
              piVar1 = (int *)((long)local_378 + lVar40 * 4 + lVar45 * lVar26);
              *piVar1 = *piVar1 + 1;
              lVar48 = local_260 + *(long *)local_3d0 * lVar26;
              uVar23 = *(undefined4 *)(lVar48 + lVar40 * 4);
              piVar1 = (int *)((long)local_378 + lVar40 * 4 + lVar45 * lVar26 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar48 + 8 + lVar40 * 4) = uVar23;
LAB_0014f9cc:
              uVar16 = (uint)local_410;
              goto LAB_00151da3;
            }
            local_3a0 = local_260;
            if (local_370 < (int)uVar18) {
LAB_00152938:
              lVar42 = (long)(int)uVar18;
              piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + local_3f0 * lVar26 + (long)local_368) == '\0') {
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + *local_3e0 * lVar26);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_3a0 + lVar26 * *(long *)local_3d0 + lVar42 * 4) = 0;
              }
              else {
                lVar43 = *local_3e0;
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + lVar43 * lVar26 + -8);
                *piVar1 = *piVar1 + 1;
                lVar45 = local_3a0 + lVar26 * *(long *)local_3d0;
                uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + lVar43 * lVar26);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
              }
            }
            else {
              piVar1 = (int *)((long)local_3c0 * lVar26 + local_3b0 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              local_3e8 = local_378;
              local_3f8 = local_260;
              if (*(char *)(lVar40 + 2 + local_3f0 * lVar26 + (long)local_368) == '\0') {
LAB_0015256e:
                lVar45 = (long)(int)uVar18;
                piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar45 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar45 + 1 + local_3f0 * lVar26 + (long)local_368) == '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + *local_3e0 * lVar26);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_3f8 + lVar26 * *(long *)local_3d0 + lVar45 * 4) = 0;
                }
                else {
                  piVar1 = (int *)(lVar42 * *local_138 + local_170 + 4 + lVar45 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::length_;
                  if (*(char *)(lVar45 + 1 + (long)local_368 + local_3f0 * lVar42) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + *local_3e0 * lVar26);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_3f8 + lVar26 * *(long *)local_3d0 + lVar45 * 4) = uVar18;
                  }
                  else {
                    lVar42 = *local_3e0;
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + lVar42 * lVar43);
                    *piVar1 = *piVar1 + 1;
                    lVar48 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar43 * lVar48 + local_3f8 + lVar45 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + lVar42 * lVar26);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar48 * lVar26 + local_3f8 + lVar45 * 4) = uVar23;
                  }
                }
              }
              else {
                piVar1 = (int *)((long)local_3c0 * lVar42 + local_3b0 + 0xc + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 3 + lVar42 * local_3f0 + (long)local_368) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(lVar36 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar36 + 8 + lVar40 * 4) = uVar23;
                }
                else {
                  piVar1 = (int *)(local_3b0 + (long)local_3c0 * lVar43 + 8 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar40 + 2 + (long)local_368 + local_3f0 * lVar43) == '\0') {
                    piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_388 + lVar48 + 8 + lVar40 * 4);
                    piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                    piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + 8 + lVar40 * 4
                             ) = uVar18;
                  }
                  else {
                    lVar36 = local_3f0 * lVar43;
LAB_001522ff:
                    lVar48 = (long)(int)uVar18;
                    piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar48 + -1 + lVar36 + (long)local_368) == '\0') {
                      lVar42 = *local_3e0;
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43 + -8);
                      *piVar1 = *piVar1 + 1;
                      local_3f8 = local_3f8 + lVar43 * *(long *)local_3d0;
                      uVar18 = *(uint *)(local_3f8 + -8 + lVar48 * 4);
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(uint *)(local_3f8 + lVar48 * 4);
LAB_0015312f:
                      uVar18 = UFPC::MemMerge(uVar18,uVar16);
                      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + *local_280 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar26 * *(long *)local_330._80_8_ + local_330._24_8_;
LAB_00153165:
                      *(uint *)(lVar42 + lVar48 * 4) = uVar18;
                    }
                    else {
                      lVar42 = *local_3e0;
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
                      *piVar1 = *piVar1 + 1;
                      lVar45 = *(long *)local_3d0;
                      uVar23 = *(undefined4 *)(lVar43 * lVar45 + local_3f8 + lVar48 * 4);
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar45 * lVar26 + local_3f8 + lVar48 * 4) = uVar23;
                    }
                  }
                }
              }
            }
            goto LAB_0015316e;
          }
          piVar1 = (int *)(lVar40 + local_170 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = UFPC::length_;
          uVar16 = uVar18;
          if (*(char *)(local_380 + lVar36 + local_410) == '\0') {
            lVar45 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar45] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar45] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar17;
            uVar18 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + *local_280 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * lVar26 + local_330._24_8_ + local_410 * 4) =
                 uVar18;
          }
          else {
            lVar45 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)(lVar48 * lVar43 + local_330._24_8_ + local_410 * 4);
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar48 * lVar26 + local_330._24_8_ + local_410 * 4) = uVar23;
          }
LAB_00151da3:
          uVar18 = uVar16 + 2;
          uVar51 = (ulong)uVar18;
          local_380 = (long)local_350;
        } while ((int)uVar18 < local_370);
      }
      local_3c0 = (long *)*local_138;
      lVar26 = (long)iVar49;
      lVar42 = (long)(int)uVar18;
      piVar1 = (int *)((long)local_3c0 * lVar26 + local_170 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      local_368 = (long *)local_1e8._24_8_;
      cVar3 = *(char *)(lVar42 + local_3f0 * lVar26 + local_1e8._24_8_);
      this = local_268;
      local_3a8 = (long *)local_170;
      if (local_370 < (int)uVar18) {
        if (cVar3 == '\0') {
LAB_00152747:
          piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + lVar42 * 4) = 0;
          goto LAB_0015316e;
        }
        lVar45 = (long)local_3c0 * (uVar34 - 2);
        lVar43 = local_3f0 * (uVar34 - 2);
LAB_001526cf:
        piVar1 = (int *)(lVar45 + (long)local_3a8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar18 = UFPC::length_;
        if (*(char *)(lVar42 + lVar43 + (long)local_368) == '\0') {
          lVar26 = (long)(int)UFPC::length_;
          UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar26] =
               UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar26] + 1;
          UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar26] = uVar18;
          uVar18 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
          piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * (long)iVar49);
          *piVar1 = *piVar1 + 1;
          *(uint *)((long)iVar49 * *(long *)local_330._80_8_ + local_330._24_8_ + lVar42 * 4) =
               uVar18;
          goto LAB_0015316e;
        }
        lVar43 = uVar34 - 3;
        lVar26 = *local_280;
      }
      else {
        if (cVar3 == '\0') {
LAB_0015265f:
          lVar42 = (long)(int)uVar18;
          piVar1 = (int *)((long)local_3c0 * lVar26 + (long)local_3a8 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 1 + local_3f0 * lVar26 + (long)local_368) == '\0')
          goto LAB_00152747;
          lVar26 = lVar42 + 1;
        }
        else {
          lVar26 = (long)(int)(uVar18 + 1);
        }
        lVar45 = (long)local_3c0 * (uVar34 - 2);
        piVar1 = (int *)(lVar45 + (long)local_3a8 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        lVar43 = local_3f0 * (uVar34 - 2);
        lVar42 = (long)(int)uVar18;
        if (*(char *)(lVar26 + (long)local_368 + lVar43) == '\0') goto LAB_001526cf;
        lVar26 = *local_280;
        lVar43 = (long)(iVar5 + -3);
      }
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar26 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar45 = *(long *)local_330._80_8_;
      uVar23 = *(undefined4 *)(lVar43 * lVar45 + local_330._24_8_ + lVar42 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar26 * iVar49);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar45 * iVar49 + local_330._24_8_ + lVar42 * 4) = uVar23;
    }
    goto LAB_0015316e;
  }
  if (2 < iVar6) {
    iVar24 = -2;
    iVar49 = 0;
LAB_0014386d:
    lVar26 = (long)iVar49;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') goto LAB_001438bd;
    piVar1 = (int *)(local_170 + 0xc + (long)iVar24 * 4);
    *piVar1 = *piVar1 + 1;
    uVar18 = UFPC::length_;
    cVar3 = *(char *)(local_1e8._24_8_ + 3 + (long)iVar24);
    lVar42 = (long)(int)UFPC::length_;
    piVar12[lVar42] = piVar12[lVar42] + 1;
    puVar29[lVar42] = uVar18;
    uVar18 = UFPC::length_;
    UFPC::length_ = UFPC::length_ + 1;
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
    iVar24 = iVar49;
    if (cVar3 == '\0') goto LAB_001439fb;
    while (iVar49 = iVar24 + 2, iVar49 < local_370) {
      lVar40 = (long)iVar24;
      lVar26 = lVar40 + 2;
      lVar42 = local_170 + 0xc + lVar40 * 4;
      lVar48 = local_1e8._24_8_ + 3 + lVar40;
      lVar43 = local_330._24_8_ + lVar40 * 4;
      lVar36 = lVar40 << 0x20;
      lVar45 = 0;
      while (piVar1 = (int *)(lVar42 + -4 + lVar45 * 4), *piVar1 = *piVar1 + 1,
            *(char *)(lVar48 + -1 + lVar45) != '\0') {
        piVar1 = (int *)(lVar42 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_2b8 + (lVar36 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          lVar26 = lVar26 + lVar45;
          uVar23 = *(undefined4 *)(local_330._24_8_ + (lVar36 >> 0x1e));
          iVar49 = (int)lVar26;
          goto LAB_001439ed;
        }
        local_2b8[lVar40 + lVar45] = local_2b8[lVar40 + lVar45] + 1;
        uVar23 = *(undefined4 *)(lVar43 + lVar45 * 4);
        local_2b8[lVar40 + lVar45 + 2] = local_2b8[lVar40 + lVar45 + 2] + 1;
        *(undefined4 *)(lVar43 + 8 + lVar45 * 4) = uVar23;
        lVar36 = lVar36 + 0x200000000;
        lVar41 = lVar45 + 2;
        lVar45 = lVar45 + 2;
        if ((long)(uVar51 & 0xffffffff) <= lVar41 + lVar26) {
          iVar49 = iVar24 + (int)lVar45 + 2;
          iVar24 = iVar24 + (int)lVar45;
          goto LAB_0014400d;
        }
      }
      iVar49 = (int)lVar26 + (int)lVar45;
LAB_001438bd:
      lVar26 = (long)iVar49;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar18 = UFPC::length_;
      if (*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') goto LAB_00143996;
      lVar42 = (long)(int)UFPC::length_;
      piVar12[lVar42] = piVar12[lVar42] + 1;
      puVar29[lVar42] = uVar18;
      uVar18 = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      iVar24 = iVar49;
    }
LAB_0014400d:
    lVar26 = (long)iVar49;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (iVar49 <= local_370) {
      if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') goto LAB_001441be;
      lVar42 = (long)iVar24;
      piVar1 = (int *)(local_170 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_2b8[lVar42] = local_2b8[lVar42] + 1;
      uVar23 = *(undefined4 *)(local_330._24_8_ + lVar42 * 4);
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
      goto LAB_0015316e;
    }
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      goto LAB_00144271;
    }
    local_2b8[iVar24] = local_2b8[iVar24] + 1;
    uVar23 = *(undefined4 *)(local_330._24_8_ + (long)iVar24 * 4);
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
    goto LAB_0015316e;
  }
  iVar49 = 0;
  lVar42 = 1;
  goto LAB_00143faa;
LAB_0014631d:
  lVar43 = (long)(int)uVar20;
  local_400 = lVar43 + 2;
  if (local_370 <= (int)local_400) {
    piVar1 = (int *)(local_390 * uVar22 + local_1f8 + 8 + lVar43 * 4);
    *piVar1 = *piVar1 + 1;
    cVar3 = *(char *)(lVar43 + 2 + local_1f0 * uVar22 + local_260);
    if (local_370 < (int)local_400) {
      if (cVar3 == '\0') {
        uVar28 = local_400 & 0xffffffff;
LAB_0014be7e:
        lVar48 = local_348 * (uVar22 | 1);
        piVar1 = (int *)(local_3f8 + lVar48 + local_400 * 4);
        *piVar1 = *piVar1 + 1;
        lVar40 = (uVar22 | 1) * local_340;
        local_390._0_4_ = (uint)uVar28;
        if (*(char *)(local_400 + local_3b0 + lVar40) == '\0') {
          piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0
          ;
          local_3e0 = (long *)local_330._24_8_;
          local_3d0 = local_2b8;
          goto LAB_0014db40;
        }
LAB_0014bf2f:
        lVar42 = (long)(int)(uint)local_390;
        piVar1 = (int *)(lVar48 + local_3f8 + -4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + -1 + lVar40 + local_3b0) == '\0') goto LAB_0014dae1;
        lVar43 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
        local_3e0 = (long *)local_330._24_8_;
        local_3d0 = local_2b8;
        goto LAB_0014db40;
      }
      piVar1 = (int *)(local_1f8 + local_390 * (uVar22 | 1) + 4 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar43 + 1 + local_260 + local_1f0 * (uVar22 | 1)) == '\0') {
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_001445f7;
      }
      lVar42 = (long)local_3e8 * (uVar22 - 1);
      lVar43 = (long)local_398 * (uVar22 - 1);
      uVar28 = local_400;
LAB_001472f7:
      lVar45 = (long)(int)uVar28;
      piVar1 = (int *)(lVar42 + local_388 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + lVar43 + local_3d8) == '\0') {
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + -8 + lVar45 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + lVar45 * 4) = uVar23;
        local_3e0 = local_3e0;
        goto LAB_0014db40;
      }
    }
    else {
      local_3f0 = uVar27;
      if (cVar3 == '\0') {
LAB_001470b8:
        uVar28 = local_400 & 0xffffffff;
        local_390._0_4_ = (uint)local_400;
        uVar46 = uVar22 | 1;
        lVar43 = (long)local_3e8 * uVar46;
        piVar1 = (int *)(local_388 + lVar43 + local_400 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (long)local_398 * uVar46;
        if (*(char *)(local_400 + local_3d8 + lVar42) == '\0') {
LAB_0014c399:
          local_390._0_4_ = (uint)uVar28;
          goto LAB_0014da68;
        }
        piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 4 + (long)(int)(uint)local_390 * 4);
        *piVar1 = *piVar1 + 1;
        uVar27 = local_3f0;
        if (*(char *)((long)(int)(uint)local_390 + 1 + (long)local_398 * uVar22 + local_3d8) == '\0'
           ) {
          lVar48 = local_348 * uVar46;
          lVar40 = local_340 * uVar46;
          goto LAB_0014bf2f;
        }
      }
      else {
        lVar43 = (long)local_3e8 * (uVar22 | 1);
        lVar42 = (uVar22 | 1) * (long)local_398;
        uVar28 = local_400 & 0xffffffff;
      }
      local_390._0_4_ = (uint)uVar28;
      piVar1 = (int *)(lVar43 + local_388 + -4 + (long)(int)(uint)local_390 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)(int)(uint)local_390 + -1 + lVar42 + local_3d8) == '\0') {
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_00144488;
      }
LAB_00147152:
      lVar45 = (long)(int)uVar28;
      lVar42 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_388 + lVar42 + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      lVar43 = (long)local_398 * (uVar22 - 1);
      if (*(char *)(lVar45 + 1 + local_3d8 + lVar43) == '\0') goto LAB_001472f7;
    }
    piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + lVar45 * 4);
    piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
    goto LAB_00147345;
  }
  lVar48 = local_390 * uVar22 + local_1f8;
  piVar1 = (int *)(lVar48 + 8 + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  lVar40 = local_1f0 * uVar22 + local_260;
  lVar45 = local_358;
  if (*(char *)(lVar43 + 2 + lVar40) == '\0') goto LAB_001466ac;
  piVar1 = (int *)(local_390 * (uVar22 | 1) + local_1f8 + 4 + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = local_3f8;
  local_3b0 = local_3b0;
  local_3f0 = local_400;
  if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_1f0 + local_260) == '\0') goto LAB_00144562;
  lVar42 = uVar22 - 1;
  piVar1 = (int *)(local_1f8 + local_390 * lVar42 + 0xc + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar43 + 3 + local_260 + local_1f0 * lVar42) != '\0') {
    piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * (uVar22 - 2) + 8);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + 8 + lVar43 * 4);
    piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + lVar43 * 4));
    piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar46 = local_400;
LAB_00147906:
    local_400 = local_400 & 0xffffffff;
    local_3e0 = (long *)local_330._24_8_;
    goto LAB_0014cf62;
  }
  piVar1 = (int *)(lVar48 + 0xc + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  uVar20 = local_400;
  local_3f0 = uVar27;
  if (*(char *)(lVar40 + 3 + lVar43) != '\0') {
    lVar43 = (long)local_3e8 * lVar42;
    lVar42 = (long)local_398 * lVar42;
    goto LAB_00146f8a;
  }
LAB_00147b57:
  piVar1 = (int *)(local_218 * (uVar22 - 1) + local_388 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  iVar49 = (int)local_400;
  if (*(char *)(uVar20 + (uVar22 - 1) * (long)local_378 + local_3d8) != '\0') {
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + (long)iVar49 * 4 + local_3f0 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                            (long)iVar49 * 4));
    local_3c0 = local_280;
    uVar27 = *local_280;
    local_3d0 = local_2b8;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar42 = *(long *)local_330._80_8_;
    local_400 = local_400 & 0xffffffff;
    local_3e0 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    local_380 = uVar27;
    local_358 = lVar42;
    local_258 = uVar27;
    local_250 = uVar27;
    local_240 = lVar42;
    local_230 = lVar42;
LAB_001481ac:
    do {
      *(uint *)(lVar42 * uVar22 + (long)local_3e0 + uVar20 * 4) = uVar16;
      lVar43 = (long)(int)local_400;
      local_400 = lVar43 + 2;
      local_390._0_4_ = (uint)local_400;
      local_3f8 = local_170;
      local_3b0 = local_1e8._24_8_;
      local_390 = local_400;
      local_208 = lVar42;
      if (local_370 <= (int)(uint)local_390) {
        local_348 = *local_138;
        lVar42 = local_348 * uVar22 + local_170;
        piVar1 = (int *)(lVar42 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        local_340 = *(long *)local_1e8._80_8_;
        lVar45 = local_340 * uVar22 + local_1e8._24_8_;
        cVar3 = *(char *)(lVar43 + 2 + lVar45);
        if (local_370 < (int)(uint)local_390) {
          if (cVar3 == '\0') {
            uVar28 = local_400 & 0xffffffff;
            goto LAB_0014be7e;
          }
          piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')
          goto LAB_001445f7;
          lVar45 = local_348 * (uVar22 - 1);
          lVar42 = (uVar22 - 1) * local_340;
        }
        else {
          uVar46 = uVar22 | 1;
          lVar48 = local_348 * uVar46;
          if (cVar3 == '\0') {
            piVar1 = (int *)(local_170 + lVar48 + 8 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = uVar46 * local_340;
            uVar28 = local_400;
            if (*(char *)(lVar43 + 2 + local_1e8._24_8_ + lVar40) == '\0') goto LAB_0014c399;
            piVar1 = (int *)(lVar42 + 0xc + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar45 + 3 + lVar43) == '\0') goto LAB_0014bf2f;
          }
          piVar1 = (int *)(lVar48 + local_170 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + uVar46 * local_340 + local_1e8._24_8_) == '\0')
          goto LAB_00144488;
          lVar45 = local_348 * (uVar22 - 1);
          piVar1 = (int *)(local_170 + lVar45 + 0xc + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = (uVar22 - 1) * local_340;
          if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
LAB_0014b97b:
            lVar42 = uVar22 - 2;
            lVar43 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * lVar42 + local_170 + -4 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + local_340 * lVar42 + local_1e8._24_8_) == '\0') {
              lVar45 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * lVar42);
              *piVar1 = *piVar1 + 1;
              lVar48 = *(long *)local_330._80_8_;
              uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + lVar43 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar48 * uVar22 + local_330._24_8_ + -8 +
                                                      lVar43 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar43 * 4) = uVar16
              ;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
              goto LAB_0014db40;
            }
            lVar43 = local_348 * (uVar22 - 1);
            lVar42 = (uVar22 - 1) * local_340;
            goto LAB_0014d377;
          }
        }
        piVar1 = (int *)(lVar45 + local_170 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar43 + 2 + lVar42 + local_1e8._24_8_) == '\0') {
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + lVar43 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + 8 + lVar43 * 4) = uVar23;
          local_3e0 = (long *)(long)local_3e0;
          local_3d0 = local_3d0;
          goto LAB_0014db40;
        }
LAB_0014bc50:
        lVar42 = uVar22 - 2;
        lVar45 = (long)(int)(uint)local_390;
        piVar1 = (int *)(local_348 * lVar42 + local_170 + -4 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(lVar45 + -1 + local_340 * lVar42 + local_1e8._24_8_);
        lVar43 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + lVar45 * 4);
        lVar43 = lVar43 * uVar22;
        if (cVar3 != '\0') {
          piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43);
          *piVar1 = *piVar1 + 1;
          goto LAB_0014d4dd;
        }
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 + -8);
        *piVar1 = *piVar1 + 1;
        lVar42 = local_330._24_8_ + lVar48 * uVar22;
LAB_0014bd88:
        uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 + -8 + lVar45 * 4));
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
        local_3e0 = (long *)local_330._24_8_;
        local_3d0 = local_2b8;
        goto LAB_0014db40;
      }
      local_350 = local_138;
      local_3e8 = (pointer)*local_138;
      lVar45 = (long)local_3e8 * uVar22 + local_170;
      piVar1 = (int *)(lVar45 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      local_3d8 = local_1e8._24_8_;
      local_368 = (long *)local_1e8._80_8_;
      local_338 = *(long *)local_1e8._80_8_;
      lVar48 = local_338 * uVar22 + local_1e8._24_8_;
      uVar28 = uVar22 | 1;
      lVar42 = local_170;
      local_378 = (pointer)local_338;
      local_388 = local_170;
      local_3a0 = (ulong)local_3e8;
      local_340 = local_338;
      local_360 = (pointer)local_338;
      local_348 = (ulong)local_3e8;
      if (*(char *)(lVar43 + 2 + lVar48) == '\0') {
        lVar36 = (long)local_3e8 * uVar28 + local_170;
        piVar1 = (int *)(lVar36 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar40 = uVar28 * local_338 + local_1e8._24_8_;
        uVar28 = (ulong)local_3e8;
        local_398 = (pointer)local_338;
        if (*(char *)(lVar43 + 2 + lVar40) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          puVar29 = local_3e8;
          lVar45 = local_170;
          lVar48 = local_338;
          lVar40 = local_1e8._24_8_;
          local_238 = (ulong)local_3e8;
          local_220 = local_338;
          local_210 = (ulong)local_3e8;
          goto LAB_00144bfb;
        }
        piVar1 = (int *)(lVar45 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + 3 + lVar43) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          local_3b0 = local_3d8;
          local_238 = (ulong)local_3e8;
          local_220 = local_338;
          local_218 = (ulong)local_3e8;
          local_210 = (ulong)local_3e8;
          goto LAB_001468b5;
        }
        piVar1 = (int *)(lVar36 + 4 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar40 + 1 + lVar43) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          local_238 = (ulong)local_3e8;
          goto LAB_00144c30;
        }
        lVar40 = (long)local_3e8 * (uVar22 - 1);
        piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_338;
        if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_0014bb17;
LAB_001485b3:
        lVar40 = lVar40 + local_170;
        piVar1 = (int *)(lVar40 + 0x10 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar42 + local_1e8._24_8_;
        if (*(char *)(lVar43 + 4 + lVar42) == '\0') {
          piVar1 = (int *)(lVar40 + 8 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar43) != '\0') goto LAB_0014c6e5;
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar42 = (long)local_3e0 + local_240 * uVar22;
          uVar23 = *(undefined4 *)(lVar42 + lVar43 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar42 + 8 + lVar43 * 4) = uVar23;
          local_248 = local_170;
          lVar43 = local_1e8._24_8_;
          lVar36 = local_338;
          lVar42 = local_240;
          lVar45 = local_1e8._24_8_;
          local_3f8 = local_248;
          local_238 = (ulong)local_3e8;
          goto LAB_00148abd;
        }
        lVar45 = uVar22 - 2;
        lVar48 = (long)local_3e8 * lVar45;
        piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = local_338 * lVar45;
        if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar36) != '\0') goto LAB_0014c0ae;
        piVar1 = (int *)(lVar40 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 2 + lVar43) != '\0') goto LAB_0014c8c6;
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * lVar45 + 0x10);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 * local_240 + (long)local_3e0 + 0x10 + lVar43 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22);
        *piVar1 = *piVar1 + 1;
        uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_240 * uVar22 + (long)local_3e0 + lVar43 * 4))
        ;
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + local_380 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        plVar30 = (long *)local_330._24_8_;
        uVar20 = local_400;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
LAB_0014947a:
        do {
          *(uint *)(lVar42 * uVar22 + (long)plVar30 + uVar20 * 4) = uVar16;
          iVar49 = (int)local_390;
          local_390._0_4_ = iVar49 + 2;
          if (local_370 <= (int)(uint)local_390) {
LAB_0014982e:
            local_400 = (ulong)(uint)local_390;
            if (local_370 < (int)(uint)local_390) {
              local_368 = (long *)local_1e8._80_8_;
              puVar21 = local_138;
              lVar43 = local_170;
              lVar48 = local_1e8._24_8_;
LAB_0014a5c6:
              iVar49 = (int)local_400;
              local_400 = (ulong)iVar49;
              piVar1 = (int *)(*puVar21 * uVar22 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_400 + *local_368 * uVar22 + lVar48) == '\0') {
                iVar49 = iVar49 + -2;
LAB_0014a640:
                piVar1 = (int *)(*local_138 * (uVar22 | 1) + local_170 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *local_280 * uVar22;
                local_3d0 = local_2b8;
                local_3e0 = (long *)local_330._24_8_;
                if (*(char *)(local_400 +
                             (uVar22 | 1) * *(long *)local_1e8._80_8_ + local_1e8._24_8_) == '\0') {
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0;
                }
                else {
                  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar43 + (long)iVar49 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
                }
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + -8 + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
              goto LAB_0014db40;
            }
            local_348 = *local_138;
            lVar43 = local_348 * uVar22 + local_170;
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(lVar43 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_340 = *(long *)local_1e8._80_8_;
            lVar45 = local_340 * uVar22 + local_1e8._24_8_;
            local_3d0 = local_2b8;
            local_3e0 = (long *)local_330._24_8_;
            if (*(char *)(lVar42 + lVar45) == '\0') {
              piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar42 + (uVar22 | 1) * local_340 + local_1e8._24_8_);
              lVar48 = (long)iVar49;
              piVar1 = (int *)(lVar43 + 0xc + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              cVar4 = *(char *)(lVar45 + 3 + lVar48);
              if (cVar3 == '\0') {
                if (cVar4 == '\0') {
                  lVar45 = (long)(int)((uint)local_390 + 1);
                  goto LAB_0014dabb;
                }
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = lVar45 * uVar22 + local_330._24_8_;
              }
              else {
                if (cVar4 != '\0') {
                  lVar48 = lVar48 + 3;
                  goto LAB_0014989d;
                }
                lVar45 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + lVar48 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar45 * uVar22);
                *piVar1 = *piVar1 + 1;
              }
              *(undefined4 *)(lVar43 + lVar42 * 4) = uVar23;
            }
            else {
              lVar48 = (long)(iVar49 + 3);
LAB_0014989d:
              piVar1 = (int *)(local_170 + local_348 * (uVar22 - 1) + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar48 + local_1e8._24_8_ + local_340 * (uVar22 - 1)) == '\0') {
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar45 + (long)iVar49 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
              }
              else {
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar23;
              }
            }
            goto LAB_0014db40;
          }
          lVar42 = uVar22 - 1;
          lVar36 = (long)iVar49;
          lVar48 = lVar36 << 0x20;
          lVar45 = lVar36 * 4;
          lVar40 = 0;
          while( true ) {
            local_350 = local_138;
            local_348 = *local_138;
            lVar32 = local_348 * uVar22;
            piVar1 = (int *)(lVar45 + local_170 + lVar32 + 8 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_368 = (long *)local_1e8._80_8_;
            local_338 = *(long *)local_1e8._80_8_;
            lVar31 = local_338 * uVar22;
            iVar24 = (int)lVar40;
            lVar41 = lVar48 >> 0x1e;
            iVar52 = (int)(lVar36 + 2);
            if (*(char *)(lVar40 + 2 + local_1e8._24_8_ + lVar31 + lVar36) == '\0') break;
            piVar1 = (int *)(lVar26 * local_348 + lVar45 + local_170 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_208 = lVar43;
            if (*(char *)(lVar40 + 3 + lVar26 * local_338 + local_1e8._24_8_ + lVar36) != '\0') {
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + local_3c8 * local_380 + 8
                              );
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(local_3c8 * lVar43 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4
                                );
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + local_380 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              uVar46 = lVar36 + lVar40 + 2;
              local_3e0 = (long *)local_330._24_8_;
              goto LAB_0014cf62;
            }
            piVar1 = (int *)(lVar45 + local_170 + lVar32 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar36 + lVar31) == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar41 + local_380 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(lVar41 + lVar43 * uVar22 + local_330._24_8_);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4) =
                   uVar23;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              local_380 = uVar27;
              local_240 = lVar43;
              goto LAB_0014b709;
            }
LAB_0014966f:
            piVar1 = (int *)(local_348 * lVar42 + local_170 + lVar45 + 0x10 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 4 + local_338 * lVar42 + local_1e8._24_8_ + lVar36) == '\0')
            goto LAB_001499ef;
            piVar1 = (int *)(local_170 + lVar45 + local_348 * local_3c8 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar36 + local_338 * local_3c8) == '\0') {
              lVar43 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_3c8 * lVar43 + lVar45 + 0x10);
              *piVar1 = *piVar1 + 1;
              lVar41 = *local_3a8;
              uVar16 = *(uint *)(local_3c8 * lVar41 + local_330._24_8_ + lVar45 + 0x10 + lVar40 * 4)
              ;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar43 * uVar22 + lVar45);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar41 * uVar22 + local_330._24_8_ + lVar45 +
                                                      lVar40 * 4));
              local_3c0 = local_280;
              local_380 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar45 + uVar22 * local_380 + 8);
              *piVar1 = *piVar1 + 1;
              local_3a8 = (long *)local_330._80_8_;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_3c0 * local_3c8 + lVar45 + 0x10
                              );
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(*local_3a8 * local_3c8 + local_330._24_8_ + lVar45 + 0x10 +
                                lVar40 * 4);
              local_380 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + uVar22 * local_380 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
            }
            lVar43 = *local_3a8;
            *(uint *)(local_330._24_8_ + lVar45 + uVar22 * lVar43 + 8 + lVar40 * 4) = uVar16;
            lVar48 = lVar48 + 0x200000000;
            lVar41 = lVar36 + lVar40;
            lVar40 = lVar40 + 2;
            if ((long)uVar51 <= lVar41 + 4) {
              iVar49 = iVar49 + (int)lVar40;
              local_390._0_4_ = iVar52 + (int)lVar40;
              goto LAB_0014982e;
            }
          }
          local_3f8 = local_170;
          lVar43 = local_170 + lVar45;
          piVar1 = (int *)((long)local_200 * local_348 + lVar43 + 8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar33 = local_1e8._24_8_ + lVar36;
          local_378 = (pointer)local_338;
          local_3a0 = local_348;
          local_340 = local_338;
          local_3e8 = (pointer)local_348;
          local_360 = (pointer)local_338;
          local_398 = (pointer)local_338;
          if (*(char *)(lVar40 + 2 + (long)local_200 * local_338 + lVar33) != '\0') {
            piVar1 = (int *)(lVar32 + lVar43 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar31 + lVar33) == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar41 + *local_3c0 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(lVar41 + *local_3a8 * uVar22 + local_330._24_8_);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              local_358 = *local_3a8;
              local_3e0 = (long *)local_330._24_8_;
              *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4) =
                   uVar23;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              local_228 = local_1e8._24_8_;
              local_248 = local_170;
              local_3b0 = local_1e8._24_8_;
              local_3d8 = local_1e8._24_8_;
              local_388 = local_170;
              uVar46 = local_348;
              local_3d0 = local_2b8;
              lVar42 = local_358;
              local_380 = uVar27;
              local_258 = uVar27;
              local_250 = uVar27;
              local_240 = local_358;
              local_230 = local_358;
              local_220 = local_338;
              local_218 = local_348;
              local_210 = local_348;
              goto LAB_001469b8;
            }
            piVar1 = (int *)(lVar43 + lVar26 * local_348 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar33 + lVar26 * local_338) != '\0') {
              lVar42 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * local_3c8 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4
                                );
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              uVar20 = lVar36 + lVar40 + 2;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              goto LAB_00149252;
            }
            goto LAB_0014966f;
          }
          piVar1 = (int *)(local_170 + lVar32 + (lVar48 + 0x300000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          uVar46 = lVar36 + 2 + lVar40;
          lVar43 = lVar48 + 0x300000000 >> 0x20;
          local_3b0 = local_1e8._24_8_;
          if (*(char *)(local_1e8._24_8_ + lVar31 + lVar43) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_3d8 = local_1e8._24_8_;
            puVar29 = (pointer)local_348;
            local_388 = local_170;
            lVar45 = local_170;
            uVar28 = local_348;
            lVar48 = local_338;
            lVar40 = local_1e8._24_8_;
            local_238 = local_348;
            local_220 = local_338;
            local_210 = local_348;
            goto LAB_00145734;
          }
          uVar20 = lVar36 + lVar40 + 2;
          lVar45 = local_348 * lVar42 + local_170;
          piVar1 = (int *)(lVar45 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar42 * local_338 + local_1e8._24_8_;
          if (*(char *)(lVar43 + lVar42) != '\0') {
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * local_3c8 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8;
            uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_400 = uVar46;
            goto LAB_00149252;
          }
          piVar1 = (int *)(lVar45 + (lVar48 + 0x400000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          local_400 = uVar46;
          if (*(char *)(lVar42 + (lVar48 + 0x400000000 >> 0x20)) == '\0') {
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + *local_3c0 * local_3c8 + 8)
            ;
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)(*local_3a8 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 +
                              lVar40 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + *local_3c0 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            lVar42 = *local_3a8;
            plVar30 = (long *)local_330._24_8_;
            goto LAB_00144dc0;
          }
LAB_00144d23:
          lVar42 = uVar22 - 2;
          uVar20 = (ulong)(int)local_400;
          piVar1 = (int *)(local_348 * lVar42 + local_3f8 + 4 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          if (*(char *)(uVar20 + 1 + local_338 * lVar42 + local_3b0) == '\0') {
            lVar43 = *local_280;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42);
            *piVar1 = *piVar1 + 1;
            lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
            uVar16 = *(uint *)(lVar45 + uVar20 * 4);
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42 + 8);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar45 + 8 + uVar20 * 4));
            goto LAB_00145110;
          }
LAB_00145060:
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
          *piVar1 = *piVar1 + 1;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
        } while( true );
      }
      piVar1 = (int *)((long)local_3e8 * uVar28 + local_170 + 4 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = local_400;
      if (*(char *)(lVar43 + 1 + uVar28 * local_338 + local_1e8._24_8_) == '\0') goto LAB_00144562;
      lVar40 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = (uVar22 - 1) * local_338;
      if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
        local_400 = local_400 & 0xffffffff;
LAB_0014b80f:
        lVar42 = uVar22 - 2;
        uVar46 = (ulong)(int)local_400;
        piVar1 = (int *)((long)local_3e8 * lVar42 + local_170 + -4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((uVar46 - 1) + local_338 * lVar42 + local_1e8._24_8_) == '\0') {
          lVar43 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * lVar42);
          *piVar1 = *piVar1 + 1;
          lVar45 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + uVar46 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar46 * 4);
          local_3f0 = local_400;
          goto LAB_0014d9f8;
        }
        lVar37 = (long)local_3e8 * (uVar22 - 1);
        lVar33 = (uVar22 - 1) * local_338;
LAB_0014b4e4:
        uVar46 = (ulong)(int)local_400;
        piVar1 = (int *)(lVar37 + local_170 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = uVar22 - 2;
        if (*(char *)(uVar46 + lVar33 + local_1e8._24_8_) != '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
          goto LAB_0014d9a4;
        }
        piVar1 = (int *)(local_170 + (long)local_3e8 * lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar46 + local_1e8._24_8_ + local_338 * lVar42);
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
        lVar45 = lVar45 * uVar22;
        if (cVar3 == '\0') {
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                  uVar46 * 4));
LAB_0014b9ea:
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
          lVar43 = *(long *)local_330._80_8_;
        }
        else {
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
        }
        goto LAB_0014cf62;
      }
      piVar1 = (int *)(lVar45 + 0xc + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar48 + 3 + lVar43) != '\0') goto LAB_001485b3;
      piVar1 = (int *)(local_170 + lVar40 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_1e8._24_8_ + lVar42 + 2 + lVar43) == '\0') {
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + lVar43 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_240 * uVar22 + (long)local_3e0 + 8 + lVar43 * 4) = uVar23;
        local_228 = local_1e8._24_8_;
        local_248 = local_170;
        local_260 = local_1e8._24_8_;
        local_238 = (ulong)local_3e8;
        local_218 = (ulong)local_3e8;
        goto LAB_0014897c;
      }
LAB_0014c5f6:
      local_400 = local_390 & 0xffffffff;
      lVar43 = uVar22 - 2;
      uVar20 = (ulong)(int)local_390;
      piVar1 = (int *)((long)local_3e8 * lVar43 + local_170 + -4 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)((uVar20 - 1) + local_338 * lVar43 + local_1e8._24_8_);
      uVar27 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar43 * lVar42 + local_330._24_8_ + uVar20 * 4);
      if (cVar3 == '\0') {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar42 * uVar22 + -8 +
                                                uVar20 * 4));
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_330._80_8_;
        local_3e0 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        local_3d0 = local_2b8;
        local_3c0 = local_280;
        local_380 = uVar27;
        local_358 = lVar42;
        local_258 = uVar27;
        local_250 = uVar27;
        local_240 = lVar42;
        local_230 = lVar42;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_3e0 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        local_3d0 = local_2b8;
        local_3c0 = local_280;
        local_380 = uVar27;
        local_358 = lVar42;
        local_258 = uVar27;
        local_250 = uVar27;
        local_240 = lVar42;
        local_230 = lVar42;
      }
    } while( true );
  }
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22 + -8);
  *piVar1 = *piVar1 + 1;
  local_3a8 = (long *)local_330._80_8_;
  local_240 = *(long *)local_330._80_8_;
  lVar42 = local_240 * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar42 + -8 + (long)iVar49 * 4);
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
  local_260 = local_3d8;
  local_3e0 = (long *)local_330._24_8_;
  local_3d0 = local_2b8;
  local_258 = local_380;
  local_230 = local_240;
LAB_0014897c:
  local_390 = local_218;
  local_358 = local_240;
  uVar27 = local_258;
  uVar20 = local_400 & 0xffffffff;
  local_208 = local_240;
  local_3e8 = (pointer)local_218;
  local_3d8 = local_260;
  local_398 = local_378;
  local_250 = local_258;
  local_220 = (long)local_378;
  local_210 = local_218;
  local_1f8 = local_388;
  local_1f0 = (long)local_378;
  goto LAB_0014631d;
LAB_001499ef:
  lVar42 = *local_3c0;
  piVar1 = (int *)((long)local_2b8 + lVar41 + lVar42 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar41 + lVar43);
  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar43 + lVar36 * 4 + 8 + lVar40 * 4) = uVar23;
  local_400 = (ulong)(uint)(iVar52 + iVar24);
LAB_0014a31c:
  iVar49 = (int)local_400;
  local_390._0_4_ = iVar49 + 2;
  local_3f8 = local_170;
  local_350 = local_138;
  local_3b0 = local_1e8._24_8_;
  local_368 = (long *)local_1e8._80_8_;
  local_3d0 = local_2b8;
  local_3e0 = (long *)local_330._24_8_;
  if ((int)(uint)local_390 < local_370) {
    local_3a0 = *local_138;
    local_360 = *(pointer *)local_1e8._80_8_;
    lVar40 = (long)iVar49;
    lVar36 = local_3a0 * (uVar22 - 1);
    lVar43 = local_170 + lVar36;
    lVar35 = (uVar22 - 1) * (long)local_360;
    lVar45 = local_1e8._24_8_ + lVar35;
    lVar32 = lVar40 << 0x20;
    lVar37 = local_170 + local_3a0 * uVar22 + lVar40 * 4;
    lVar44 = lVar37 + 0xc;
    lVar48 = local_1e8._24_8_ + (long)local_360 * uVar22 + lVar40;
    lVar54 = lVar48 + 3;
    lVar31 = (long)local_360 * lVar26 + lVar40 + local_1e8._24_8_ + 3;
    lVar33 = local_3a0 * lVar26 + lVar40 * 4 + local_170 + 0xc;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar40 + 2;
    lVar41 = 0;
    do {
      piVar1 = (int *)(lVar37 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = lVar32 >> 0x1e;
      iVar24 = (int)lVar41;
      lVar47 = lVar32 >> 0x20;
      iVar52 = (int)lVar42;
      if (*(char *)(lVar48 + 2 + lVar41) != '\0') {
        piVar1 = (int *)(lVar33 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar31 + lVar41) == '\0') {
          piVar1 = (int *)(lVar44 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar54 + lVar41) == '\0') {
            local_400 = (ulong)(uint)(iVar52 + iVar24);
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar38 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            lVar42 = lVar43 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar38 + lVar42);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + uVar27 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + lVar40 * 4 + 8 + lVar41 * 4) = uVar23;
            local_380 = uVar27;
            local_240 = lVar43;
            goto LAB_0014b709;
          }
          goto LAB_0014a4f7;
        }
        piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_400 = lVar42 + lVar41;
        uVar46 = lVar40 + 2 + lVar41;
        if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0')
        {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
          lVar43 = *(long *)local_330._80_8_;
        }
        else {
          *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
          if (*(char *)(lVar45 + lVar47) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar47 * 4
                                                    ));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)local_330._24_8_;
            lVar43 = *(long *)local_330._80_8_;
          }
          else {
            lVar42 = local_3a0 * (uVar22 - 2);
            lVar43 = (long)local_360 * (uVar22 - 2);
LAB_00144e7b:
            uVar46 = (ulong)(int)local_400;
            piVar1 = (int *)(lVar42 + local_170 + -4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)((uVar46 - 1) + lVar43 + local_1e8._24_8_);
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar46 * 4);
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                      uVar46 * 4));
              goto LAB_0014b9ea;
            }
            piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)local_330._24_8_;
          }
        }
        goto LAB_0014cf62;
      }
      piVar1 = (int *)(local_3a0 * (long)local_200 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_340 = (long)local_360;
      local_3e8 = (pointer)local_3a0;
      local_3c0 = local_280;
      local_348 = local_3a0;
      if (*(char *)((long)local_360 * (long)local_200 + lVar40 + local_1e8._24_8_ + 2 + lVar41) ==
          '\0') {
        local_400 = (ulong)(uint)(iVar52 + iVar24);
        local_238 = local_3a0;
        local_3d8 = local_1e8._24_8_;
        local_338 = (long)local_360;
        local_248 = local_170;
        goto LAB_00149187;
      }
      piVar1 = (int *)(lVar44 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar54 + lVar41) == '\0') {
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar38 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_358 = *(long *)local_330._80_8_;
        lVar42 = local_358 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar38 + lVar42);
        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + uVar27 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 + lVar40 * 4 + 8 + lVar41 * 4) = uVar23;
        local_400 = (ulong)(uint)(iVar52 + iVar24);
        local_3d8 = local_1e8._24_8_;
        local_388 = local_170;
        uVar46 = local_3a0;
        local_338 = (long)local_360;
        lVar42 = local_358;
        local_398 = local_360;
        local_380 = uVar27;
        local_378 = local_360;
        local_258 = uVar27;
        local_250 = uVar27;
        local_248 = local_170;
        local_240 = local_358;
        local_238 = local_3a0;
        local_230 = local_358;
        local_228 = local_1e8._24_8_;
        local_220 = (long)local_360;
        local_218 = local_3a0;
        local_210 = local_3a0;
        goto LAB_001469b8;
      }
      piVar1 = (int *)(lVar33 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar31 + lVar41) != '\0') goto LAB_0014adb1;
LAB_0014a4f7:
      piVar1 = (int *)(local_170 + lVar40 * 4 + lVar36 + 0x10 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 4 + lVar35 + local_1e8._24_8_ + lVar40) != '\0') {
        lVar36 = local_3a0 * (uVar22 - 2);
        piVar1 = (int *)((lVar32 + 0x300000000 >> 0x1e) + local_170 + lVar36);
        *piVar1 = *piVar1 + 1;
        local_400 = lVar42 + lVar41;
        lVar48 = (long)local_360 * (uVar22 - 2);
        uVar20 = lVar40 + 2 + lVar41;
        if (*(char *)((lVar32 + 0x300000000 >> 0x20) + local_1e8._24_8_ + lVar48) == '\0') {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + local_380 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          local_390 = local_400 & 0xffffffff;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
          goto LAB_0014947a;
        }
        piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0')
        {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_);
        }
        else {
          *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
          if (*(char *)(lVar45 + lVar47) != '\0') goto LAB_0014a95d;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar47 * 4);
        }
        uVar16 = UFPC::MemMerge(uVar16,uVar17);
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + local_380 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        local_390 = local_400;
        plVar30 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
        goto LAB_0014947a;
      }
      lVar38 = *local_280 * uVar22 + lVar40 * 4 + 8;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar38 + -8);
      *piVar1 = *piVar1 + 1;
      lVar47 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar40 * 4;
      uVar23 = *(undefined4 *)(lVar47 + -8 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar38);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar47 + lVar41 * 4) = uVar23;
      lVar32 = lVar32 + 0x200000000;
      lVar38 = lVar40 + lVar41;
      lVar41 = lVar41 + 2;
      if ((long)uVar51 <= lVar38 + 4) {
        iVar49 = iVar49 + (int)lVar41;
        local_390._0_4_ = iVar52 + (int)lVar41;
        break;
      }
    } while( true );
  }
  local_400 = (ulong)(uint)local_390;
  puVar21 = local_138;
  lVar43 = local_170;
  lVar48 = local_1e8._24_8_;
  if (local_370 < (int)(uint)local_390) goto LAB_0014a5c6;
  local_348 = *local_138;
  lVar42 = local_348 * uVar22;
  lVar45 = (long)(int)(uint)local_390;
  piVar1 = (int *)(lVar42 + local_170 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = *(long *)local_1e8._80_8_;
  lVar43 = local_340 * uVar22;
  if (*(char *)(lVar45 + local_1e8._24_8_ + lVar43) == '\0') {
    piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar45 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar45 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
LAB_0014ad03:
      lVar45 = (long)(int)(uint)local_390;
      piVar1 = (int *)(lVar42 + local_3f8 + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + 1 + lVar43 + local_3b0) == '\0') {
        lVar45 = lVar45 + 1;
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_0014dabb;
      }
      piVar1 = (int *)(local_3f8 + local_348 * (uVar22 - 1) + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = UFPC::length_;
      local_3d0 = local_2b8;
      local_3e0 = (long *)local_330._24_8_;
      if (*(char *)(lVar45 + 1 + local_3b0 + local_340 * (uVar22 - 1)) == '\0') {
        lVar42 = (long)(int)UFPC::length_;
        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar16;
        uVar16 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
      }
      else {
        lVar42 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * (uVar22 - 2));
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + lVar45 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar23;
      }
      goto LAB_0014db40;
    }
    lVar48 = (long)iVar49;
    piVar1 = (int *)(lVar42 + local_170 + 0xc + lVar48 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_1e8._24_8_ + lVar43 + 3 + lVar48) == '\0') {
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
      goto LAB_0014db40;
    }
    lVar48 = lVar48 + 3;
  }
  else {
    lVar48 = (long)(iVar49 + 3);
  }
  lVar43 = local_348 * (uVar22 - 1);
  piVar1 = (int *)(local_170 + lVar43 + lVar48 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = (uVar22 - 1) * local_340;
  if (*(char *)(lVar48 + local_1e8._24_8_ + lVar42) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar43 + (long)iVar49 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
    goto LAB_0014db40;
  }
  lVar48 = uVar22 - 2;
  piVar1 = (int *)(local_348 * lVar48 + local_170 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  local_390 = local_400;
  if (*(char *)(lVar45 + local_340 * lVar48 + local_1e8._24_8_) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar48);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar45 * 4);
    piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + (long)iVar49 * 4))
    ;
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
    local_3e0 = (long *)local_330._24_8_;
    local_3d0 = local_2b8;
    goto LAB_0014db40;
  }
LAB_0014bc28:
  lVar45 = (long)(int)(uint)local_390;
  piVar1 = (int *)(lVar43 + local_170 + -8 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar45 + -2 + lVar42 + local_1e8._24_8_) != '\0') goto LAB_0014bc50;
  lVar42 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * (uVar22 - 2));
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + lVar45 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
  *piVar1 = *piVar1 + 1;
  lVar42 = lVar43 * uVar22 + local_330._24_8_;
  goto LAB_0014bd88;
LAB_0014adb1:
  piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  local_400 = lVar42 + lVar41;
  uVar20 = lVar40 + 2 + lVar41;
  if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
  else {
    *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
    if (*(char *)(lVar45 + lVar47) != '\0') {
      lVar42 = local_3a0 * (uVar22 - 2);
      lVar43 = (long)local_360 * (uVar22 - 2);
      goto LAB_0014ae53;
    }
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar47 * 4));
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
LAB_00149252:
  *(uint *)(lVar43 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
  lVar42 = (long)(int)local_400;
  local_390._0_4_ = (int)local_400 + 2;
  local_400 = (ulong)(uint)local_390;
  local_3d0 = local_2b8;
  local_3e0 = (long *)local_330._24_8_;
  if ((int)(uint)local_390 < local_370) {
    local_3f8 = local_170;
    local_350 = local_138;
    local_3a0 = *local_138;
    lVar43 = local_3a0 * uVar22 + local_170;
    piVar1 = (int *)(lVar43 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3d8 = local_1e8._24_8_;
    local_368 = (long *)local_1e8._80_8_;
    local_338 = *(long *)local_1e8._80_8_;
    lVar45 = local_338 * uVar22 + local_1e8._24_8_;
    local_3e8 = (pointer)local_3a0;
    if (*(char *)(lVar42 + 2 + lVar45) == '\0') {
      piVar1 = (int *)(local_3a0 * (uVar22 | 1) + local_170 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_378 = (pointer)local_338;
      local_340 = local_338;
      local_360 = (pointer)local_338;
      local_348 = local_3a0;
      local_398 = (pointer)local_338;
      if (*(char *)(lVar42 + 2 + (uVar22 | 1) * local_338 + local_1e8._24_8_) == '\0') {
        local_228 = local_1e8._24_8_;
        local_248 = local_170;
        puVar29 = (pointer)local_3a0;
        local_388 = local_170;
        lVar45 = local_170;
        local_3b0 = local_1e8._24_8_;
        uVar28 = local_3a0;
        lVar48 = local_338;
        lVar40 = local_1e8._24_8_;
        local_238 = local_3a0;
        local_220 = local_338;
        local_210 = local_3a0;
        goto LAB_00144bfb;
      }
      piVar1 = (int *)(lVar43 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + 3 + lVar42) == '\0') {
        local_3c0 = local_280;
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_3a8 = (long *)local_330._80_8_;
        local_240 = *(long *)local_330._80_8_;
        lVar43 = local_240 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar43 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 + 8 + lVar42 * 4) = uVar23;
        uVar46 = local_3a0;
        local_358 = local_240;
        lVar42 = local_240;
        local_3b0 = local_3d8;
        local_388 = local_3f8;
        local_380 = uVar27;
        local_258 = uVar27;
        local_250 = uVar27;
        local_248 = local_3f8;
        local_230 = local_240;
        local_228 = local_3d8;
        local_220 = local_338;
        local_218 = local_3a0;
        local_210 = local_3a0;
        goto LAB_001469b8;
      }
LAB_0014d76d:
      lVar37 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_170 + lVar37 + 4 + (long)(int)local_400 * 4);
      *piVar1 = *piVar1 + 1;
      lVar33 = (uVar22 - 1) * local_338;
      local_348 = (ulong)local_3e8;
      if (*(char *)((long)(int)local_400 + 1 + local_1e8._24_8_ + lVar33) == '\0')
      goto LAB_0014b56b;
LAB_0014d795:
      uVar20 = (ulong)(int)local_400;
      piVar1 = (int *)(lVar37 + local_170 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = uVar22 - 2;
      if (*(char *)(uVar20 + lVar33 + local_1e8._24_8_) == '\0') {
        piVar1 = (int *)(local_170 + (long)local_3e8 * lVar42 + uVar20 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar20 + local_1e8._24_8_ + local_338 * lVar42);
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar20 * 4);
        lVar45 = lVar45 * uVar22;
        if (cVar3 != '\0') goto code_r0x0014d824;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 + -8);
        *piVar1 = *piVar1 + 1;
        goto LAB_0014e25a;
      }
LAB_00144c79:
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
      puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
      goto LAB_00144cbf;
    }
LAB_0014b4b9:
    lVar42 = (long)(int)local_400;
    lVar37 = (long)local_3e8 * (uVar22 - 1);
    piVar1 = (int *)(local_170 + lVar37 + 4 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar33 = (uVar22 - 1) * local_338;
    if (*(char *)(lVar42 + 1 + local_1e8._24_8_ + lVar33) != '\0') goto LAB_0014b4e4;
    piVar1 = (int *)((long)local_3e8 * uVar22 + local_170 + 4 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_348 = (ulong)local_3e8;
    if (*(char *)(lVar42 + 1 + local_338 * uVar22 + local_1e8._24_8_) == '\0') {
      uVar27 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22 + -8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      lVar45 = lVar43 * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
      local_3a8 = (long *)local_330._80_8_;
      local_3c0 = local_280;
      local_380 = uVar27;
      local_240 = lVar43;
LAB_0014b709:
      lVar41 = (long)(int)local_400;
      local_390 = lVar41 + 2;
      local_3d0 = local_2b8;
      local_3f8 = local_170;
      local_3b0 = local_1e8._24_8_;
      local_400 = local_390;
      local_3e0 = (long *)local_330._24_8_;
      if ((int)(uint)local_390 < local_370) {
        local_350 = local_138;
        local_3e8 = (pointer)*local_138;
        lVar45 = (long)local_3e8 * uVar22 + local_170;
        piVar1 = (int *)(lVar45 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_3d8 = local_1e8._24_8_;
        local_368 = (long *)local_1e8._80_8_;
        local_338 = *(long *)local_1e8._80_8_;
        lVar48 = local_338 * uVar22 + local_1e8._24_8_;
        uVar28 = uVar22 | 1;
        lVar42 = local_170;
        local_378 = (pointer)local_338;
        local_388 = local_170;
        local_3a0 = (ulong)local_3e8;
        local_340 = local_338;
        uVar20 = local_390;
        local_360 = (pointer)local_338;
        local_348 = (ulong)local_3e8;
        local_398 = (pointer)local_338;
        local_230 = lVar43;
        if (*(char *)(lVar41 + 2 + lVar48) == '\0') {
          lVar40 = (long)local_3e8 * uVar28 + local_170;
          piVar1 = (int *)(lVar40 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = uVar28 * local_338 + local_1e8._24_8_;
          uVar28 = (ulong)local_3e8;
          if (*(char *)(lVar41 + 2 + lVar43) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_400 = local_390 & 0xffffffff;
            puVar29 = local_3e8;
            lVar45 = local_170;
            lVar48 = local_338;
            lVar40 = local_1e8._24_8_;
            local_238 = (ulong)local_3e8;
            local_220 = local_338;
            local_210 = (ulong)local_3e8;
            goto LAB_00144bfb;
          }
          piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
            local_400 = local_390 & 0xffffffff;
            local_250 = uVar27;
            local_358 = local_240;
            local_3b0 = local_3d8;
            local_258 = uVar27;
            local_248 = local_3f8;
            local_238 = (ulong)local_3e8;
            local_228 = local_3d8;
            local_220 = local_338;
            local_218 = (ulong)local_3e8;
            local_210 = (ulong)local_3e8;
            local_208 = local_240;
            goto LAB_001468b5;
          }
          piVar1 = (int *)(lVar40 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + lVar41) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_400 = local_390 & 0xffffffff;
            local_238 = (ulong)local_3e8;
            goto LAB_00144c30;
          }
          lVar43 = (long)local_3e8 * (uVar22 - 1);
          piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = (uVar22 - 1) * local_338;
          if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0014c040;
          piVar1 = (int *)(local_170 + lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1e8._24_8_ + lVar42 + lVar41) != '\0') {
            local_400 = local_390 & 0xffffffff;
LAB_0014bb17:
            lVar42 = uVar22 - 2;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)((long)local_3e8 * lVar42 + local_170 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((uVar20 - 1) + local_338 * lVar42 + local_1e8._24_8_) != '\0') {
              lVar37 = (long)local_3e8 * (uVar22 - 1);
              lVar33 = (uVar22 - 1) * local_338;
              goto LAB_0014d795;
            }
            lVar43 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42);
            *piVar1 = *piVar1 + 1;
            lVar45 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + uVar20 * 4);
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar20 * 4);
            goto LAB_0014e268;
          }
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar43 * uVar22 + local_330._24_8_;
LAB_0014ca48:
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 + lVar41 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
LAB_0014ca84:
          local_400 = uVar20 & 0xffffffff;
          goto LAB_00149252;
        }
        piVar1 = (int *)((long)local_3e8 * uVar28 + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_3f0 = local_390;
        if (*(char *)(lVar41 + 1 + uVar28 * local_338 + local_1e8._24_8_) == '\0')
        goto LAB_00144562;
        lVar43 = (long)local_3e8 * (uVar22 - 1);
        lVar36 = local_170 + lVar43;
        piVar1 = (int *)(lVar36 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_338;
        lVar40 = local_1e8._24_8_ + lVar42;
        if (*(char *)(lVar41 + 3 + lVar40) != '\0') {
          piVar1 = (int *)(lVar36 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + lVar41) != '\0') goto LAB_0014b80f;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
LAB_0014c232:
          puVar29[lVar41] = puVar29[lVar41] + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4))
          ;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar46 = local_390;
LAB_0014c27d:
          local_400 = uVar46 & 0xffffffff;
          local_3e0 = (long *)local_330._24_8_;
          goto LAB_0014cf62;
        }
        piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
          piVar1 = (int *)(lVar36 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + 2 + lVar41) == '\0') {
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            local_358 = *(long *)local_330._80_8_;
            lVar42 = local_358 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_390 = (ulong)local_3e8;
            local_208 = local_358;
            local_3a0 = (ulong)local_3e8;
            local_380 = uVar27;
            local_348 = (ulong)local_3e8;
            local_260 = local_3d8;
            local_258 = uVar27;
            local_250 = uVar27;
            local_240 = local_358;
            local_238 = (ulong)local_3e8;
            local_230 = local_358;
            local_220 = local_338;
            local_218 = (ulong)local_3e8;
            local_210 = (ulong)local_3e8;
            local_1f8 = local_170;
            local_1f0 = local_338;
            goto LAB_0014631d;
          }
          piVar1 = (int *)(lVar36 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + lVar41) != '\0') goto LAB_0014c5f6;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4))
          ;
          local_3d0 = local_2b8;
          local_3c0 = local_280;
          uVar27 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_330._80_8_;
          local_400 = local_390 & 0xffffffff;
          local_3e0 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          local_380 = uVar27;
          local_358 = lVar42;
          local_258 = uVar27;
          local_250 = uVar27;
          local_240 = lVar42;
          local_230 = lVar42;
          goto LAB_001481ac;
        }
LAB_0014c040:
        lVar43 = lVar43 + local_170;
        piVar1 = (int *)(lVar43 + 0x10 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar42 + local_1e8._24_8_;
        if (*(char *)(lVar41 + 4 + lVar42) == '\0') {
          piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar41) == '\0') {
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            local_230 = *(long *)local_330._80_8_;
            lVar42 = local_230 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
            local_248 = local_170;
            lVar43 = local_1e8._24_8_;
            lVar36 = local_338;
            lVar42 = local_230;
            lVar45 = local_1e8._24_8_;
            local_3f8 = local_248;
            local_258 = local_380;
            local_238 = (ulong)local_3e8;
            goto LAB_00148abd;
          }
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4
                                                    ));
            local_3c0 = local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = *(long *)local_330._80_8_;
            uVar46 = local_390 & 0xffffffff;
            plVar30 = (long *)local_330._24_8_;
          }
          else {
            local_400 = local_390 & 0xffffffff;
LAB_0014c6e5:
            lVar43 = uVar22 - 2;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)(local_3a0 * lVar43 + local_170 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)((uVar20 - 1) + local_338 * lVar43 + local_1e8._24_8_);
            local_3c0 = local_280;
            lVar45 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * lVar42 + local_330._24_8_ + uVar20 * 4);
            uVar46 = local_400;
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar42 * uVar22 + -8 +
                                                      uVar20 * 4));
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              plVar30 = (long *)local_330._24_8_;
              lVar42 = *(long *)local_330._80_8_;
              local_3c0 = local_280;
              local_3a8 = (long *)local_330._80_8_;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * uVar22);
              *piVar1 = *piVar1 + 1;
              plVar30 = (long *)local_330._24_8_;
            }
          }
LAB_00144dc0:
          *(uint *)(lVar42 * uVar22 + (long)plVar30 + uVar20 * 4) = uVar16;
          lVar41 = (long)(int)uVar46;
          local_400 = lVar41 + 2;
          local_3d0 = local_2b8;
          local_3b0 = local_1e8._24_8_;
          local_390 = local_400;
          if ((int)local_400 < local_370) {
            local_3a0 = *local_138;
            lVar42 = local_3a0 * uVar22 + local_170;
            piVar1 = (int *)(lVar42 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            local_360 = *(pointer *)local_1e8._80_8_;
            lVar43 = (long)local_360 * uVar22 + local_1e8._24_8_;
            if (*(char *)(lVar41 + 2 + lVar43) == '\0') goto LAB_00145156;
            lVar48 = local_3a0 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = (uVar22 - 1) * (long)local_360;
            if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar45) == '\0') {
              piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar43 + 3 + lVar41) != '\0') goto LAB_001452b7;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_3c0 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(*local_3a8 * uVar22 + local_330._24_8_ + lVar41 * 4);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar23;
              local_400 = local_400 & 0xffffffff;
              local_380 = uVar27;
              local_240 = lVar43;
              goto LAB_0014b709;
            }
            lVar45 = uVar22 - 2;
            lVar42 = local_3a0 * lVar45;
            piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar43 = (long)local_360 * lVar45;
            if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) != '\0') goto LAB_00144e7b;
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8;
            uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
            puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
            goto LAB_0014c232;
          }
          if (local_370 < (int)local_400) {
            local_368 = (long *)local_1e8._80_8_;
            puVar21 = local_138;
            lVar43 = local_170;
            lVar48 = local_1e8._24_8_;
            goto LAB_0014a5c6;
          }
          local_348 = *local_138;
          lVar42 = local_348 * uVar22;
          piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          local_340 = *(long *)local_1e8._80_8_;
          lVar43 = local_340 * uVar22;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) == '\0') {
            piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 2 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
              local_3f8 = local_170;
LAB_00149137:
              goto LAB_0014ad03;
            }
            piVar1 = (int *)(local_170 + lVar42 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + lVar43 + 3 + lVar41) == '\0') {
              lVar42 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
              uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
              goto LAB_0014db40;
            }
            lVar42 = lVar41 + 3;
          }
          else {
            lVar42 = (long)((int)uVar46 + 3);
          }
          piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + (uVar22 - 1) * local_340 + local_1e8._24_8_) == '\0') {
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
          }
          else {
            lVar42 = uVar22 - 2;
            piVar1 = (int *)(local_348 * lVar42 + local_170 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 2 + local_340 * lVar42 + local_1e8._24_8_) != '\0')
            goto LAB_0014bc50;
            lVar43 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * lVar42 + 8);
            *piVar1 = *piVar1 + 1;
            lVar45 = *local_3a8;
            uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar45 * uVar22 + local_330._24_8_ + lVar41 * 4
                                                    ));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) =
                 uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          goto LAB_0014db40;
        }
        lVar45 = uVar22 - 2;
        lVar48 = (long)local_3e8 * lVar45;
        piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = local_338 * lVar45;
        if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar36) == '\0') {
          piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar41) == '\0') goto LAB_0014c948;
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
            uVar16 = *(uint *)(lVar43 + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + 0x10 + lVar41 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar41 * 4);
LAB_0014c99c:
            uVar16 = UFPC::MemMerge(uVar16,uVar17);
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
          }
          else {
LAB_0014c8c6:
            lVar42 = uVar22 - 2;
            local_390 = local_400 & 0xffffffff;
            iVar49 = (int)local_400;
            lVar43 = (long)iVar49;
            piVar1 = (int *)(lVar48 + local_170 + -4 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + lVar36 + local_1e8._24_8_) == '\0') {
              lVar43 = *local_280;
              lVar48 = (long)iVar49;
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar43 * lVar42);
              *piVar1 = *piVar1 + 1;
              lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
              uVar16 = *(uint *)(lVar45 + lVar48 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar43 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar45 + 8 + lVar48 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                lVar48 * 4);
            }
            else {
              lVar45 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              lVar48 = *(long *)local_330._80_8_;
              uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + 8 + lVar43 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(lVar48 * uVar22 + local_330._24_8_ + -8 + lVar43 * 4);
            }
            uVar20 = (ulong)iVar49;
            uVar16 = UFPC::MemMerge(uVar16,uVar17);
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
          }
        }
        else {
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
LAB_0014c948:
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 0x10);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 0x10 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4);
            goto LAB_0014c99c;
          }
          local_400 = local_390 & 0xffffffff;
LAB_0014c0ae:
          uVar20 = (ulong)(int)local_400;
          piVar1 = (int *)(lVar48 + local_170 + -4 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          local_348 = local_3a0;
          if (*(char *)((uVar20 - 1) + lVar36 + local_1e8._24_8_) != '\0') goto LAB_0014b5b0;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + -8 +
                                                  uVar20 * 4));
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
        }
        goto LAB_0014947a;
      }
      local_348 = *local_138;
      lVar42 = local_348 * uVar22 + local_170;
      piVar1 = (int *)(lVar42 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_340 = *(long *)local_1e8._80_8_;
      lVar43 = local_340 * uVar22 + local_1e8._24_8_;
      cVar3 = *(char *)(lVar41 + 2 + lVar43);
      if (local_370 < (int)(uint)local_390) {
        if (cVar3 == '\0') {
          uVar28 = local_390 & 0xffffffff;
          goto LAB_0014be7e;
        }
        piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')
        goto LAB_001445f7;
        lVar43 = local_348 * (uVar22 - 1);
        lVar42 = (uVar22 - 1) * local_340;
      }
      else {
        uVar46 = uVar22 | 1;
        lVar48 = local_348 * uVar46;
        if (cVar3 == '\0') {
          piVar1 = (int *)(local_170 + lVar48 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = uVar46 * local_340;
          uVar28 = local_390;
          if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar40) == '\0') goto LAB_0014c399;
          piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 3 + lVar41) == '\0') goto LAB_0014bf2f;
        }
        piVar1 = (int *)(lVar48 + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + uVar46 * local_340 + local_1e8._24_8_) == '\0')
        goto LAB_00144488;
        lVar43 = local_348 * (uVar22 - 1);
        piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_340;
        if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
          piVar1 = (int *)(local_170 + lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1e8._24_8_ + lVar42 + lVar41) != '\0') goto LAB_0014b97b;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4))
          ;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar16
          ;
          local_3e0 = (long *)local_330._24_8_;
          local_3d0 = local_2b8;
          goto LAB_0014db40;
        }
      }
      piVar1 = (int *)(local_170 + lVar43 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_0014bc28;
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
      goto LAB_0014db40;
    }
LAB_0014b56b:
    lVar42 = (long)(int)local_400;
    piVar1 = (int *)(lVar37 + local_170 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 2 + lVar33 + local_1e8._24_8_) != '\0') goto LAB_0014b588;
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
    goto LAB_0014a31c;
  }
  if (local_370 < (int)(uint)local_390) {
    local_368 = (long *)local_1e8._80_8_;
    local_400 = (ulong)(uint)local_390;
    puVar21 = local_138;
    lVar43 = local_170;
    lVar48 = local_1e8._24_8_;
    goto LAB_0014a5c6;
  }
  local_348 = *local_138;
  lVar43 = local_348 * uVar22 + local_170;
  piVar1 = (int *)(lVar43 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = *(long *)local_1e8._80_8_;
  lVar45 = local_340 * uVar22 + local_1e8._24_8_;
  if (*(char *)(lVar42 + 2 + lVar45) != '\0') goto LAB_0014d348;
  piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar42 + 2 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
    uVar28 = (ulong)(uint)local_390;
    goto LAB_0014c399;
  }
  piVar1 = (int *)(lVar43 + 0xc + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar45 + 3 + lVar42) != '\0') goto LAB_0014d348;
  lVar43 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar45 + lVar42 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar45 + 8 + lVar42 * 4) = uVar23;
  goto LAB_0014db40;
LAB_0014b588:
  lVar42 = uVar22 - 2;
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(local_348 * lVar42 + local_170 + 4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  local_390 = local_400;
  if (*(char *)(uVar20 + 1 + local_338 * lVar42 + local_1e8._24_8_) == '\0') {
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42 + 8);
    *piVar1 = *piVar1 + 1;
    lVar45 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 8 + uVar20 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar20 * 4));
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
    local_3c0 = local_280;
  }
  else {
LAB_0014b5b0:
    uVar20 = (ulong)(int)local_390;
    piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = uVar22 - 2;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    local_3c0 = local_280;
    if (*(char *)(uVar20 + (uVar22 - 1) * local_338 + local_1e8._24_8_) == '\0') {
      piVar1 = (int *)(local_170 + local_348 * lVar42 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)(uVar20 + local_1e8._24_8_ + local_338 * lVar42);
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
      if (cVar3 == '\0') {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                uVar20 * 4));
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        plVar30 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar43;
      }
    }
    else {
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar42 = lVar43;
    }
  }
  goto LAB_0014947a;
code_r0x0014d824:
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45);
  *piVar1 = *piVar1 + 1;
  goto LAB_00149252;
LAB_00145156:
  local_368 = (long *)local_1e8._80_8_;
  local_350 = local_138;
  piVar1 = (int *)(local_3a0 * (uVar22 | 1) + local_170 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = (long)local_360;
  local_3e8 = (pointer)local_3a0;
  local_348 = local_3a0;
  if (*(char *)(lVar41 + 2 + (uVar22 | 1) * (long)local_360 + local_1e8._24_8_) == '\0') {
    local_400 = local_400 & 0xffffffff;
    local_238 = local_3a0;
    local_3d8 = local_1e8._24_8_;
    local_338 = (long)local_360;
    local_248 = local_170;
    local_3f8 = local_170;
    goto LAB_00149187;
  }
  piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar43 + 3 + lVar41) == '\0') {
    local_3c0 = local_280;
    uVar27 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3a8 = (long *)local_330._80_8_;
    local_358 = *(long *)local_330._80_8_;
    local_3e0 = (long *)local_330._24_8_;
    lVar42 = local_358 * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
    local_400 = local_400 & 0xffffffff;
    local_228 = local_1e8._24_8_;
    local_248 = local_170;
    local_3d8 = local_1e8._24_8_;
    local_3f8 = local_170;
    local_388 = local_170;
    uVar46 = local_3a0;
    local_338 = (long)local_360;
    lVar42 = local_358;
    local_398 = local_360;
    local_380 = uVar27;
    local_378 = local_360;
    local_258 = uVar27;
    local_250 = uVar27;
    local_240 = local_358;
    local_230 = local_358;
    local_220 = (long)local_360;
    local_218 = local_3a0;
    local_210 = local_3a0;
LAB_001469b8:
    do {
      lVar43 = (long)(int)local_400;
      local_400 = lVar43 + 2;
      local_390._0_4_ = (uint)local_400;
      local_3f0 = uVar27;
      if (local_370 <= (int)(uint)local_390) {
        piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(lVar43 + 2 + (long)local_398 * uVar22 + local_3d8);
        if (local_370 < (int)(uint)local_390) {
          uVar28 = local_400;
          if (cVar3 == '\0') goto LAB_0014be7e;
          piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
LAB_00147621:
            local_388 = (long)local_3e8 * (uVar22 - 1) + local_388;
            piVar1 = (int *)(local_388 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            local_3d8 = (long)local_398 * (uVar22 - 1) + local_3d8;
            if (*(char *)(local_400 + local_3d8) != '\0') {
LAB_00147644:
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * (uVar22 - 2));
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)((long)local_3e0 + (uVar22 - 2) * local_358 + local_400 * 4);
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar42 = local_358 * uVar22 + (long)local_3e0;
              goto LAB_0014767f;
            }
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_388 + -4 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::length_;
            if (*(char *)(local_3d8 + -1 + lVar42) == '\0') {
              lVar42 = (long)(int)UFPC::length_;
              UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar42] =
                   UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar42] + 1;
              UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar42] = uVar16;
              uVar16 = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar16;
              local_3e0 = local_3e0;
            }
            else {
              piVar1 = (int *)((long)local_3d0 + lVar42 * 4 + uVar27 * (uVar22 - 2) + -8);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * (uVar22 - 2) + -8 + lVar42 * 4)
              ;
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar23;
              local_3e0 = local_3e0;
            }
            goto LAB_0014db40;
          }
LAB_0014727d:
          lVar45 = (long)(int)local_400;
          lVar42 = (long)local_3e8 * (uVar22 - 1);
          piVar1 = (int *)(local_388 + lVar42 + -4 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = (long)local_398 * (uVar22 - 1);
          if (*(char *)(lVar45 + -1 + local_3d8 + lVar43) == '\0') {
            uVar28 = local_400 & 0xffffffff;
            goto LAB_001472f7;
          }
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2) + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + lVar45 * 4);
        }
        else {
          if (cVar3 == '\0') goto LAB_001470b8;
          piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
LAB_00146edc:
            local_390._0_4_ = (uint)local_400;
            local_400 = (ulong)(int)(uint)local_390;
            lVar43 = (long)local_3e8 * (uVar22 - 1) + local_388;
            piVar1 = (int *)(lVar43 + 4 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * (long)local_398 + local_3d8;
            if (*(char *)(local_400 + 1 + lVar42) == '\0') goto LAB_00147621;
            piVar1 = (int *)(lVar43 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + local_400) == '\0') {
              piVar1 = (int *)(lVar43 + -4 + (long)(int)(uint)local_390 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + -1 + (long)(int)(uint)local_390) == '\0') goto LAB_00147644;
              goto LAB_0014e791;
            }
            piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            uVar23 = *(undefined4 *)((uVar22 - 2) * local_358 + (long)local_3e0 + local_400 * 4);
            piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar23;
            local_3e0 = local_3e0;
            goto LAB_0014db40;
          }
LAB_00146d34:
          lVar45 = (long)(int)local_400;
          lVar42 = (long)local_3e8 * (uVar22 - 1) + local_388;
          piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = (uVar22 - 1) * (long)local_398 + local_3d8;
          if (*(char *)(lVar45 + 1 + lVar43) == '\0') goto LAB_0014727d;
          piVar1 = (int *)(lVar42 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + lVar45) == '\0') {
            piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar22 - 2;
            if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
              goto LAB_00147345;
            }
            piVar1 = (int *)(local_388 + (long)local_3e8 * lVar42 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar45 + local_3d8 + (long)local_398 * lVar42) == '\0') {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42 + -8);
              *piVar1 = *piVar1 + 1;
              lVar43 = (long)local_3e0 + local_358 * lVar42;
              uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + lVar45 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                lVar45 * 4);
            }
            else {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
            }
            uVar16 = UFPC::MemMerge(uVar16,uVar17);
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
            goto LAB_0014db40;
          }
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + lVar45 * 4);
        }
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
        goto LAB_00147345;
      }
      piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      lVar45 = local_358;
      local_238 = uVar46;
      local_208 = lVar42;
      if (*(char *)(lVar43 + 2 + (long)local_398 * uVar22 + local_3d8) != '\0') {
        local_3e8 = (pointer)local_210;
        piVar1 = (int *)(local_210 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = (pointer)local_220;
        local_1f0 = local_220;
        local_260 = local_3d8;
        local_1f8 = local_388;
        lVar36 = local_338;
        lVar41 = local_340;
        local_390 = (ulong)local_3e8;
        local_260 = local_3d8;
        if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_220 + local_3d8) == '\0') goto LAB_00145dee;
LAB_00146b08:
        iVar49 = (int)local_400;
        uVar46 = (ulong)iVar49;
        lVar48 = local_210 * (uVar22 - 1);
        lVar42 = local_388 + lVar48;
        piVar1 = (int *)(lVar42 + 4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_220 * (uVar22 - 1);
        lVar43 = local_3d8 + lVar45;
        if (*(char *)(uVar46 + 1 + lVar43) == '\0') {
          piVar1 = (int *)(local_210 * uVar22 + local_388 + 4 + uVar46 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar46 + 1 + local_220 * uVar22 + local_3d8) == '\0') {
            uVar20 = (ulong)iVar49;
            piVar1 = (int *)(lVar42 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + uVar20) == '\0') goto LAB_00147b57;
            piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2) + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + uVar20 * 4);
            piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                    uVar20 * 4));
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            *(uint *)(lVar43 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
            local_3a8 = (long *)local_330._80_8_;
            local_3c0 = local_280;
            local_380 = uVar27;
            local_240 = lVar43;
            goto LAB_0014b709;
          }
          uVar20 = (ulong)iVar49;
          piVar1 = (int *)(lVar42 + 8 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 2 + uVar20) == '\0') {
            lVar40 = (long)iVar49;
            piVar1 = (int *)(lVar42 + -4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + lVar40) == '\0') {
LAB_001473f4:
              uVar20 = (ulong)(int)local_400;
              piVar1 = (int *)(lVar48 + local_388 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar20 + lVar45 + local_3d8) == '\0') {
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                lVar42 = (long)local_3e0 + local_358 * uVar22;
                uVar23 = *(undefined4 *)(lVar42 + -8 + uVar20 * 4);
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
                lVar43 = local_228;
                lVar36 = local_338;
                local_388 = local_388;
                lVar42 = local_240;
                lVar45 = local_3d8;
                local_3e8 = (pointer)local_218;
                local_378 = local_378;
LAB_00148abd:
                do {
                  local_3d8 = lVar43;
                  iVar49 = (int)local_400;
                  lVar41 = (long)iVar49;
                  local_400 = lVar41 + 2;
                  local_3d0 = local_2b8;
                  local_390 = local_400;
                  if (local_370 <= (int)local_400) {
                    puVar21 = local_350;
                    lVar43 = local_3f8;
                    lVar48 = local_3b0;
                    if (local_370 < (int)local_400) goto LAB_0014a5c6;
                    lVar43 = (long)local_3e8 * uVar22 + local_388;
                    piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar48 = (long)local_378 * uVar22 + lVar45;
                    if (*(char *)(lVar41 + 2 + lVar48) == '\0') {
                      piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 8 + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar41 + 2 + (uVar22 | 1) * (long)local_378 + lVar45) == '\0') {
                        local_348 = *local_350;
                        local_340 = *local_368;
                        lVar42 = local_348 * uVar22;
                        lVar43 = local_340 * uVar22;
                        goto LAB_00149137;
                      }
                      piVar1 = (int *)(lVar43 + 0xc + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
                        lVar43 = lVar41 + 3;
                        goto LAB_00148c05;
                      }
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    else {
                      lVar43 = (long)(iVar49 + 3);
LAB_00148c05:
                      piVar1 = (int *)(local_388 + (long)local_3e8 * (uVar22 - 1) + lVar43 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar43 + lVar45 + (long)local_378 * (uVar22 - 1)) != '\0') {
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8
                                        );
                        *piVar1 = *piVar1 + 1;
                        uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4
                                          );
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                        *piVar1 = *piVar1 + 1;
                        uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_
                                                                + lVar41 * 4));
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 +
                                 lVar41 * 4) = uVar16;
                        local_3e0 = (long *)local_330._24_8_;
                        local_3d0 = local_2b8;
                        goto LAB_0014db40;
                      }
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
                    local_3e0 = (long *)local_330._24_8_;
                    goto LAB_0014db40;
                  }
                  lVar43 = (long)local_3e8 * uVar22 + local_388;
                  piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar48 = (long)local_378 * uVar22 + lVar45;
                  if (*(char *)(lVar41 + 2 + lVar48) != '\0') {
                    lVar36 = (long)local_3e8 * (uVar22 - 1);
                    piVar1 = (int *)(local_388 + lVar36 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = (long)local_378 * (uVar22 - 1);
                    if (*(char *)(lVar41 + 3 + lVar45 + lVar40) != '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_ +
                                                              lVar41 * 4));
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      lVar43 = *(long *)local_330._80_8_;
                      uVar46 = local_400;
                      goto LAB_0014c27d;
                    }
                    piVar1 = (int *)(lVar43 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar23 = *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar23;
                      uVar27 = local_258;
                      lVar43 = local_230;
                      local_240 = lVar42;
                      goto LAB_0014b709;
                    }
LAB_00148dfe:
                    piVar1 = (int *)(local_248 + lVar36 + 0x10 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar41 + 4 + local_3d8 + lVar40) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
                      goto LAB_0014a31c;
                    }
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 0x10)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 0x10 + lVar41 * 4)
                    ;
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    uVar17 = *(uint *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                    goto LAB_00148e5e;
                  }
                  piVar1 = (int *)(local_388 + (long)local_3e8 * (uVar22 | 1) + 8 + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_338 = lVar36;
                  local_3e8 = (pointer)local_3a0;
                  if (*(char *)(lVar41 + 2 + lVar45 + (long)local_378 * (uVar22 | 1)) != '\0') {
                    piVar1 = (int *)(local_238 * uVar22 + local_248 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar41 + 3 + (long)local_360 * uVar22 + local_3d8) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar23 = *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      local_3e0 = (long *)local_330._24_8_;
                      *(undefined4 *)(local_230 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) =
                           uVar23;
                      local_378 = local_360;
                      local_218 = local_238;
                      local_220 = (long)local_360;
                      local_210 = local_238;
                      local_398 = local_360;
                      local_3e8 = (pointer)local_238;
                      local_240 = local_230;
                      local_258 = local_380;
                      local_388 = local_248;
                      local_250 = local_380;
                      uVar46 = local_238;
                      local_358 = local_230;
                      uVar27 = local_380;
                      lVar42 = local_230;
                      local_228 = local_3d8;
                      goto LAB_001469b8;
                    }
                    lVar36 = local_238 * (uVar22 - 1);
                    piVar1 = (int *)(local_248 + lVar36 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = (long)local_360 * (uVar22 - 1);
                    if (*(char *)(lVar41 + 3 + local_3d8 + lVar40) == '\0') goto LAB_00148dfe;
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4);
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_ +
                                                            lVar41 * 4));
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *(long *)local_330._80_8_;
                    uVar20 = local_400;
                    goto LAB_0014ca84;
                  }
LAB_00149187:
                  iVar49 = (int)local_400;
                  uVar20 = (ulong)iVar49;
                  piVar1 = (int *)(local_238 * uVar22 + local_248 + 4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_3a0 = (ulong)local_3e8;
                  local_228 = local_3d8;
                  if (*(char *)(uVar20 + 1 + (long)local_360 * uVar22 + local_3d8) == '\0') {
                    uVar46 = local_400 & 0xffffffff;
                    puVar29 = (pointer)local_238;
                    local_388 = local_248;
                    lVar45 = local_248;
                    uVar28 = local_238;
                    lVar48 = (long)local_360;
                    lVar40 = local_3d8;
                    local_3e8 = (pointer)local_238;
                    local_398 = local_360;
                    local_378 = local_360;
                    local_220 = (long)local_360;
                    local_210 = local_238;
LAB_00145734:
                    local_218 = uVar28;
                    iVar49 = (int)uVar46;
                    lVar32 = (long)iVar49;
                    lVar42 = (long)puVar29 * (uVar22 | 1) + lVar45;
                    piVar1 = (int *)(lVar42 + 4 + lVar32 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = UFPC::length_;
                    lVar43 = lVar48 * (uVar22 | 1) + lVar40;
                    uVar46 = local_238;
                    local_3d0 = local_2b8;
                    uVar28 = local_218;
                    if (*(char *)(lVar32 + 1 + lVar43) == '\0') {
                      local_3c0 = local_280;
                      uVar27 = *local_280;
                      piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + uVar27 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      local_3a8 = (long *)local_330._80_8_;
                      local_358 = *(long *)local_330._80_8_;
                      local_3e0 = (long *)local_330._24_8_;
                      *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar32 * 4) = 0;
                      local_400 = lVar32 + 2;
                      local_390._0_4_ = (uint)local_400;
                      local_230 = local_358;
                      if (local_370 <= (int)(uint)local_390) {
                        piVar1 = (int *)(lVar45 + (long)puVar29 * uVar22 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar3 = *(char *)(lVar32 + 2 + lVar40 + lVar48 * uVar22);
                        if ((int)(uint)local_390 <= local_370) {
                          if (cVar3 != '\0') goto LAB_00146edc;
                          local_348 = *local_138;
                          local_340 = *(long *)local_1e8._80_8_;
                          goto LAB_00144683;
                        }
                        if (cVar3 != '\0') goto LAB_00147621;
                        local_348 = *local_138;
                        local_340 = *(long *)local_1e8._80_8_;
                        lVar42 = (long)(int)(uint)local_390;
                        goto LAB_001446e2;
                      }
                      piVar1 = (int *)((long)puVar29 * uVar22 + lVar45 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = local_248;
                      lVar43 = local_228;
                      lVar36 = local_338;
                      lVar41 = local_340;
                      local_3f0 = uVar27;
                      local_390 = (ulong)puVar29;
                      local_380 = uVar27;
                      local_260 = lVar40;
                      local_258 = uVar27;
                      local_250 = uVar27;
                      local_240 = local_358;
                      local_208 = local_358;
                      local_1f8 = lVar45;
                      local_1f0 = lVar48;
                      if (*(char *)(lVar32 + 2 + lVar48 * uVar22 + lVar40) != '\0')
                      goto LAB_00145dee;
LAB_00144a5f:
                      lVar36 = (long)(int)local_400;
                      piVar1 = (int *)(local_390 * (uVar22 | 1) + local_1f8 + lVar36 * 4);
                      *piVar1 = *piVar1 + 1;
                      puVar29 = (pointer)local_390;
                      lVar45 = local_1f8;
                      lVar48 = local_1f0;
                      lVar40 = local_260;
                      local_248 = lVar42;
                      local_238 = uVar46;
                      local_228 = lVar43;
                      local_218 = uVar28;
                      if (*(char *)(lVar36 + (uVar22 | 1) * local_1f0 + local_260) != '\0') {
                        piVar1 = (int *)(local_1f8 + local_390 * uVar22 + 4 + lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar16 = UFPC::length_;
                        lVar42 = local_388;
                        if (*(char *)(lVar36 + 1 + local_260 + local_1f0 * uVar22) == '\0') {
                          lVar42 = (long)(int)UFPC::length_;
                          UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar42] =
                               UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                          UFPC::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar42] = uVar16;
                          uVar16 = UFPC::length_;
                          UFPC::length_ = UFPC::length_ + 1;
                          uVar27 = *local_280;
                          piVar1 = (int *)((long)local_3d0 + lVar36 * 4 + uVar27 * uVar22);
                          *piVar1 = *piVar1 + 1;
                          local_358 = *(long *)local_330._80_8_;
                          *(uint *)(local_358 * uVar22 + (long)local_3e0 + lVar36 * 4) = uVar16;
                          lVar42 = local_358;
                          local_3c0 = local_280;
                          local_3a8 = (long *)local_330._80_8_;
                          local_380 = uVar27;
                          local_258 = uVar27;
                          local_250 = uVar27;
                          local_240 = local_358;
                          local_230 = local_358;
                          goto LAB_001469b8;
                        }
                        goto LAB_00144c30;
                      }
                    }
                    else {
                      lVar36 = (long)(int)UFPC::length_;
                      UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar36] =
                           UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar36] + 1;
                      UFPC::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar36] = uVar16;
                      uVar16 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                      local_3c0 = local_280;
                      uVar27 = *local_280;
                      lVar41 = uVar27 * uVar22;
                      piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
                      *piVar1 = *piVar1 + 1;
                      local_3e0 = (long *)local_330._24_8_;
                      local_3a8 = (long *)local_330._80_8_;
                      local_358 = *(long *)local_330._80_8_;
                      lVar36 = local_358 * uVar22 + local_330._24_8_;
                      *(uint *)(lVar36 + lVar32 * 4) = uVar16;
                      local_400 = lVar32 + 2;
                      local_390._0_4_ = (uint)local_400;
                      if (local_370 <= (int)(uint)local_390) {
                        lVar45 = lVar45 + (long)puVar29 * uVar22;
                        piVar1 = (int *)(lVar45 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar48 = lVar40 + lVar48 * uVar22;
                        cVar3 = *(char *)(lVar32 + 2 + lVar48);
                        if (local_370 < (int)(uint)local_390) {
                          local_260 = lVar40;
                          if (cVar3 == '\0') goto LAB_0014a640;
                          goto LAB_0014727d;
                        }
                        local_260 = lVar40;
                        if (cVar3 != '\0') goto LAB_00146d34;
                        piVar1 = (int *)(lVar42 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar43 + 2 + lVar32) == '\0') goto LAB_0014da68;
                        piVar1 = (int *)(lVar45 + 0xc + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar48 + 3 + lVar32) == '\0') {
                          piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
                          *piVar1 = *piVar1 + 1;
                          uVar23 = *(undefined4 *)(lVar36 + lVar32 * 4);
                          piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)(lVar36 + 8 + lVar32 * 4) = uVar23;
                          goto LAB_0014db40;
                        }
                        uVar28 = local_400 & 0xffffffff;
                        goto LAB_00147152;
                      }
                      lVar31 = (long)puVar29 * uVar22 + lVar45;
                      piVar1 = (int *)(lVar31 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar33 = lVar48 * uVar22 + lVar40;
                      local_380 = uVar27;
                      if (*(char *)(lVar32 + 2 + lVar33) != '\0') {
                        local_220 = (long)local_398;
                        local_210 = (ulong)local_3e8;
                        local_3f0 = uVar27;
                        local_260 = lVar40;
                        local_258 = uVar27;
                        local_240 = local_358;
                        local_230 = local_358;
                        goto LAB_00146b08;
                      }
                      piVar1 = (int *)(lVar42 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      local_260 = lVar40;
                      if (*(char *)(lVar43 + 2 + lVar32) != '\0') goto code_r0x00145b94;
                    }
LAB_00144bfb:
                    piVar1 = (int *)((long)puVar29 * uVar22 + lVar45 + 4 + (long)(int)local_400 * 4)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar46 = local_400 & 0xffffffff;
                    lVar42 = local_388;
                    if (*(char *)((long)(int)local_400 + 1 + lVar48 * uVar22 + lVar40) != '\0')
                    goto LAB_00144c30;
                    goto LAB_00145734;
                  }
                  lVar42 = uVar22 - 1;
                  piVar1 = (int *)(local_248 + local_238 * lVar42 + 4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + 1 + local_3d8 + (long)local_360 * lVar42) != '\0') {
                    lVar42 = *local_3c0;
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *local_3a8;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00149252;
                  }
                  uVar20 = (ulong)iVar49;
                  piVar1 = (int *)((long)local_3e8 * lVar42 + local_3f8 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = UFPC::length_;
                  if (*(char *)(uVar20 + 2 + lVar42 * local_338 + local_3b0) != '\0') {
                    local_380 = *local_3c0;
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *local_3a8;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    local_390 = local_400;
                    plVar30 = (long *)local_330._24_8_;
                    local_3a8 = local_3a8;
                    lVar42 = lVar43;
                    goto LAB_0014947a;
                  }
                  lVar42 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar42] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar42] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar42] = uVar16;
                  uVar16 = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  local_3c0 = local_280;
                  local_380 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  local_230 = *(long *)local_330._80_8_;
                  *(uint *)(local_230 * uVar22 + local_330._24_8_ + (long)iVar49 * 4) = uVar16;
                  lVar43 = local_3b0;
                  lVar36 = local_338;
                  local_388 = local_3f8;
                  lVar42 = local_230;
                  lVar45 = local_3b0;
                  local_378 = (pointer)local_338;
                  local_360 = (pointer)local_338;
                  local_348 = (ulong)local_3e8;
                  local_340 = local_338;
                  local_258 = local_380;
                  local_248 = local_3f8;
                  local_238 = (ulong)local_3e8;
                } while( true );
              }
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2));
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                      uVar20 * 4));
              local_3c0 = local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              local_3a8 = (long *)local_330._80_8_;
              uVar46 = local_400;
              plVar30 = (long *)local_330._24_8_;
              lVar42 = *(long *)local_330._80_8_;
              goto LAB_00144dc0;
            }
            piVar1 = (int *)((long)local_3d0 + lVar40 * 4 + local_3f0 * (uVar22 - 2) + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + lVar40 * 4);
            piVar1 = (int *)((long)local_3d0 + lVar40 * 4 + local_3f0 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                    lVar40 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar40 * 4) = uVar16;
            goto LAB_0014a31c;
          }
          piVar1 = (int *)(lVar42 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          if (*(char *)(lVar43 + uVar20) == '\0') {
            lVar45 = (long)iVar49;
            piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar22 - 2;
            if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + 8 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                      lVar45 * 4));
              local_380 = *local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)local_330._80_8_;
              plVar30 = (long *)local_330._24_8_;
              local_3a8 = (long *)local_330._80_8_;
              lVar42 = lVar43;
              local_3c0 = local_280;
            }
            else {
              local_388 = local_388 + local_210 * lVar42;
              piVar1 = (int *)(local_388 + 4 + uVar46 * 4);
              *piVar1 = *piVar1 + 1;
              local_3d8 = local_3d8 + local_220 * lVar42;
              if (*(char *)(uVar46 + 1 + local_3d8) == '\0') {
                piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
                *piVar1 = *piVar1 + 1;
                lVar43 = (long)local_3e0 + local_358 * lVar42;
                uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                *piVar1 = *piVar1 + 1;
                uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
                piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                uVar16 = UFPC::MemMerge(uVar16,*(uint *)(*(long *)local_330._80_8_ * uVar22 +
                                                         local_330._24_8_ + -8 + lVar45 * 4));
                local_380 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                plVar30 = (long *)local_330._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                lVar42 = lVar43;
                local_3c0 = local_280;
              }
              else {
                piVar1 = (int *)(local_388 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_3d8 + uVar20) == '\0') {
                  piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = (long)local_3e0 + local_358 * lVar42;
                  uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
                  piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
                  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                    lVar45 * 4);
                }
                else {
                  piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + 8 + uVar20 * 4);
                  piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
                }
                uVar16 = UFPC::MemMerge(uVar16,uVar17);
                local_380 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                plVar30 = (long *)local_330._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                lVar42 = lVar43;
                local_3c0 = local_280;
              }
            }
          }
          else {
            lVar42 = uVar22 - 2;
            piVar1 = (int *)(local_388 + local_210 * lVar42 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = local_3f0 * lVar42;
            lVar43 = lVar42 * local_358 + (long)local_3e0;
            if (*(char *)(uVar46 + 1 + local_3d8 + local_220 * lVar42) == '\0') {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar43 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
            }
            else {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar43 + 8 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar42 = (long)local_3e0 + local_358 * uVar22;
            }
            uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar42 + -8 + uVar20 * 4));
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
            local_3c0 = local_280;
          }
          goto LAB_0014947a;
        }
        piVar1 = (int *)(lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar43 + uVar46) != '\0') {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                  uVar46 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          goto LAB_00147906;
        }
        lVar45 = (long)iVar49;
        piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = uVar22 - 2;
        if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                  lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          goto LAB_00147906;
        }
        piVar1 = (int *)(local_388 + local_210 * lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(uVar46 + local_3d8 + local_220 * lVar42) == '\0') {
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
          *piVar1 = *piVar1 + 1;
          lVar43 = (long)local_3e0 + local_358 * lVar42;
          uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + uVar46 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(*(long *)local_330._80_8_ * uVar22 +
                                                   local_330._24_8_ + -8 + lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                  lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
        }
        local_3e0 = (long *)local_330._24_8_;
        lVar43 = *(long *)local_330._80_8_;
        goto LAB_0014cf62;
      }
LAB_001466ac:
      local_260 = lVar45;
      lVar42 = (long)local_3e8 * (uVar22 | 1) + local_388;
      lVar36 = (long)(int)local_400;
      piVar1 = (int *)(lVar42 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar43 = (uVar22 | 1) * (long)local_398 + local_3d8;
      puVar29 = local_3e8;
      lVar45 = local_388;
      uVar28 = local_218;
      lVar48 = (long)local_398;
      lVar40 = local_3d8;
      if (*(char *)(lVar36 + lVar43) == '\0') goto LAB_00144bfb;
      piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 4 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      local_358 = local_260;
      if (*(char *)(lVar36 + 1 + (long)local_398 * uVar22 + local_3d8) != '\0') {
        piVar1 = (int *)(lVar42 + -4 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = local_388;
        if (*(char *)(lVar43 + -1 + lVar36) == '\0') goto LAB_00144c30;
        lVar36 = lVar36 + 1;
        local_358 = local_230;
        goto LAB_00146763;
      }
LAB_001468b5:
      lVar42 = (long)(int)local_400;
      piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + -4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = UFPC::length_;
      if (*(char *)(lVar42 + -1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
        lVar43 = (long)(int)UFPC::length_;
        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43] =
             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar43] + 1;
        UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43] = uVar16;
        uVar16 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_358 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
        lVar42 = local_358;
        local_250 = uVar27;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + local_250 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        lVar43 = local_208 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar43 + -8 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + local_250 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 + lVar42 * 4) = uVar23;
        lVar42 = local_208;
      }
      local_3e0 = (long *)local_330._24_8_;
      uVar46 = local_238;
      local_3d0 = local_2b8;
    } while( true );
  }
  lVar48 = local_3a0 * (uVar22 - 1);
  piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar45 = (uVar22 - 1) * (long)local_360;
  if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar45) == '\0') {
LAB_001452b7:
    piVar1 = (int *)(lVar48 + local_170 + 0x10 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 4 + lVar45 + local_1e8._24_8_) == '\0') {
      lVar42 = *local_3c0;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
      goto LAB_0014a31c;
    }
    lVar42 = uVar22 - 2;
    lVar36 = local_3a0 * lVar42;
    piVar1 = (int *)(local_170 + lVar36 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    lVar48 = (long)local_360 * lVar42;
    if ((*(char *)(lVar41 + 3 + lVar48 + local_1e8._24_8_) != '\0') &&
       (piVar1 = (int *)(local_170 + lVar36 + 8 + lVar41 * 4), *piVar1 = *piVar1 + 1,
       *(char *)(lVar48 + local_1e8._24_8_ + 2 + lVar41) != '\0')) goto LAB_0014a95d;
    lVar43 = *local_3c0;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * lVar42 + 0x10);
    *piVar1 = *piVar1 + 1;
    lVar45 = *local_3a8;
    uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 0x10 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + lVar41 * 4);
LAB_00148e5e:
    uVar16 = UFPC::MemMerge(uVar16,uVar17);
    local_3c0 = local_280;
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    uVar20 = local_390;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = *(long *)local_330._80_8_;
    goto LAB_0014947a;
  }
  lVar45 = uVar22 - 2;
  lVar42 = local_3a0 * lVar45;
  piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar43 = (long)local_360 * lVar45;
  if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) == '\0') {
    lVar42 = *local_3c0;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *local_3a8;
    uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar42 = lVar43 * uVar22 + local_330._24_8_;
    uVar20 = local_400;
    goto LAB_0014ca48;
  }
  local_400 = local_400 & 0xffffffff;
LAB_0014ae53:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar42 + local_170 + -4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)((uVar20 - 1) + lVar43 + local_1e8._24_8_);
  lVar42 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
  if (cVar3 == '\0') {
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
LAB_0014e25a:
    uVar17 = *(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 + uVar20 * 4);
LAB_0014e268:
    uVar16 = UFPC::MemMerge(uVar16,uVar17);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
  else {
    puVar29 = (pointer)((long)local_2b8 + lVar42 * uVar22);
LAB_00144cbf:
    puVar29[uVar20] = puVar29[uVar20] + 1;
  }
  goto LAB_00149252;
LAB_00145dee:
  local_338 = lVar41;
  uVar46 = (ulong)(int)local_400;
  lVar42 = local_390 * (uVar22 - 1) + local_1f8;
  piVar1 = (int *)(lVar42 + 4 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  lVar48 = (uVar22 - 1) * local_1f0 + local_260;
  if (*(char *)(uVar46 + 1 + lVar48) != '\0') {
    piVar1 = (int *)(lVar42 + uVar46 * 4);
    *piVar1 = *piVar1 + 1;
    lVar43 = local_208;
    if (*(char *)(lVar48 + uVar46) == '\0') {
      piVar1 = (int *)(lVar42 + -4 + (long)(int)local_400 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar48 + -1 + (long)(int)local_400) != '\0') goto LAB_0014d948;
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar46 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar46 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      local_400 = local_400 & 0xffffffff;
      local_3e0 = local_3e0;
    }
    goto LAB_0014cf62;
  }
  piVar1 = (int *)(local_390 * uVar22 + local_1f8 + 4 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = local_338;
  if (*(char *)(uVar46 + 1 + local_1f0 * uVar22 + local_260) == '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)(lVar42 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    uVar27 = local_3f0;
    if (*(char *)(lVar48 + uVar20) != '\0') {
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar42 = local_208;
      goto LAB_001481ac;
    }
    lVar43 = (long)(int)local_400;
    piVar1 = (int *)(lVar42 + -4 + lVar43 * 4);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::length_;
    lVar42 = local_208 * uVar22 + (long)local_3e0;
    if (*(char *)(lVar48 + -1 + lVar43) == '\0') {
      lVar43 = (long)(int)UFPC::length_;
      UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43] =
           UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar43] + 1;
      UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43] = uVar16;
      uVar16 = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(uint *)(lVar42 + uVar20 * 4) = uVar16;
      uVar20 = local_400;
      local_338 = lVar36;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * (uVar22 - 2) + -8);
      *piVar1 = *piVar1 + 1;
      uVar23 = *(undefined4 *)((uVar22 - 2) * local_208 + (long)local_3e0 + -8 + lVar43 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
      uVar20 = local_400;
      local_338 = lVar36;
    }
    goto LAB_0014631d;
  }
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar42 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)(lVar48 + 2 + uVar20);
  piVar1 = (int *)(lVar42 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  if (cVar3 != '\0') {
    if (*(char *)(lVar48 + uVar20) != '\0') goto LAB_00144d23;
    piVar1 = (int *)(lVar42 + -4 + (long)(int)local_400 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = uVar46 + 1;
    if (*(char *)(lVar48 + -1 + (long)(int)local_400) != '\0') goto LAB_0014e2d2;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2) + 8);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + 8 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = local_230;
    local_390 = local_400;
    plVar30 = local_3e0;
    local_3a8 = local_3a8;
    lVar42 = local_208;
    goto LAB_0014947a;
  }
  if (*(char *)(lVar48 + uVar20) != '\0') {
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar46 = local_400;
    plVar30 = local_3e0;
    lVar42 = local_208;
    goto LAB_00144dc0;
  }
  lVar41 = (long)(int)local_400;
  piVar1 = (int *)(lVar42 + -4 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  uVar16 = UFPC::length_;
  lVar40 = local_208 * uVar22 + (long)local_3e0;
  lVar43 = local_228;
  local_3e8 = (pointer)local_218;
  lVar42 = local_240;
  lVar45 = local_3d8;
  if (*(char *)(lVar48 + -1 + lVar41) == '\0') {
    lVar48 = (long)(int)UFPC::length_;
    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar48] =
         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar48] + 1;
    UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar48] = uVar16;
    uVar16 = UFPC::length_;
    UFPC::length_ = UFPC::length_ + 1;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(uint *)(lVar40 + uVar20 * 4) = uVar16;
  }
  else {
    piVar1 = (int *)((long)local_3d0 + lVar41 * 4 + local_250 * (uVar22 - 2) + -8);
    *piVar1 = *piVar1 + 1;
    uVar23 = *(undefined4 *)((long)local_3e0 + local_208 * (uVar22 - 2) + -8 + lVar41 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar40 + uVar20 * 4) = uVar23;
  }
  goto LAB_00148abd;
LAB_0014e2d2:
  lVar45 = uVar22 - 2;
  local_3f8 = local_348 * lVar45 + local_3f8;
  piVar1 = (int *)(local_3f8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  local_3b0 = local_338 * lVar45 + local_3b0;
  iVar49 = (int)local_400;
  if (*(char *)(lVar42 + local_3b0) == '\0') {
    lVar42 = *local_280;
    lVar48 = (long)iVar49;
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * lVar45 + -8);
    *piVar1 = *piVar1 + 1;
    lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar43 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * lVar45 + 8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar43 + 8 + lVar48 * 4);
  }
  else {
    lVar48 = (long)iVar49;
    piVar1 = (int *)(local_3f8 + lVar48 * 4);
    *piVar1 = *piVar1 + 1;
    local_380 = *local_280;
    lVar42 = local_380 * lVar45;
    if (*(char *)(local_3b0 + lVar48) != '\0') {
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      goto LAB_0014e554;
    }
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + -8);
    *piVar1 = *piVar1 + 1;
    lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar43 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + 8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar43 + 8 + lVar48 * 4);
  }
  uVar16 = UFPC::MemMerge(uVar16,uVar17);
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
LAB_0014e554:
  local_390 = local_400;
  plVar30 = (long *)local_330._24_8_;
  uVar20 = (long)iVar49;
  local_3a8 = (long *)local_330._80_8_;
  lVar42 = lVar43;
  local_3c0 = local_280;
  goto LAB_0014947a;
LAB_00144c30:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(uVar28 * (uVar22 - 1) + lVar42 + 4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  lVar45 = local_248;
  uVar27 = local_238;
  lVar48 = local_228;
  if (*(char *)(uVar20 + 1 + (uVar22 - 1) * (long)local_378 + local_3d8) != '\0') goto LAB_00144c79;
LAB_00144cd0:
  local_228 = lVar48;
  local_238 = uVar27;
  local_248 = lVar45;
  uVar20 = (ulong)(int)local_400;
  lVar45 = uVar28 * (uVar22 - 1) + lVar42;
  piVar1 = (int *)(lVar45 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  lVar43 = (uVar22 - 1) * (long)local_378 + local_3d8;
  cVar3 = *(char *)(uVar20 + 2 + lVar43);
  piVar1 = (int *)(lVar45 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  uVar16 = UFPC::length_;
  cVar4 = *(char *)(uVar20 + lVar43);
  if (cVar3 != '\0') {
    local_390 = local_400;
    local_338 = local_340;
    if (cVar4 == '\0') goto LAB_00145060;
    goto LAB_00144d23;
  }
  if (cVar4 != '\0') {
    local_3c0 = local_280;
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + uVar20 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar46 = local_400;
    plVar30 = (long *)local_330._24_8_;
    goto LAB_00144dc0;
  }
  lVar43 = (long)(int)UFPC::length_;
  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar43] =
       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar43] + 1;
  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar43] = uVar16;
  uVar16 = UFPC::length_;
  UFPC::length_ = UFPC::length_ + 1;
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  local_3a8 = (long *)local_330._80_8_;
  local_230 = *(long *)local_330._80_8_;
  *(uint *)(local_230 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
  lVar43 = local_228;
  lVar36 = local_338;
  local_388 = lVar42;
  lVar42 = local_230;
  lVar45 = local_3d8;
  local_3e8 = (pointer)uVar28;
  local_258 = local_380;
  goto LAB_00148abd;
code_r0x00145b94:
  piVar1 = (int *)(lVar31 + 0xc + lVar32 * 4);
  *piVar1 = *piVar1 + 1;
  local_250 = uVar27;
  if (*(char *)(lVar33 + 3 + lVar32) == '\0') {
    piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
    *piVar1 = *piVar1 + 1;
    uVar23 = *(undefined4 *)(lVar36 + lVar32 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar36 + 8 + lVar32 * 4) = uVar23;
    lVar42 = local_358;
    local_258 = uVar27;
    local_240 = local_358;
    local_230 = local_358;
    goto LAB_001469b8;
  }
  lVar36 = (long)(iVar49 + 3);
  local_260 = local_358;
  local_258 = uVar27;
  local_240 = local_358;
  local_208 = local_358;
LAB_00146763:
  lVar43 = (long)local_3e8 * (uVar22 - 1);
  piVar1 = (int *)(local_388 + lVar43 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = (long)local_398 * (uVar22 - 1);
  if (*(char *)(lVar36 + local_3d8 + lVar42) != '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + -8 + uVar20 * 4)
                           );
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    goto LAB_00149252;
  }
  local_230 = local_358;
  local_358 = local_260;
  local_3f0 = uVar27;
LAB_00146f8a:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar43 + local_388 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar20 + 2 + lVar42 + local_3d8) != '\0') {
    lVar45 = uVar22 - 2;
    piVar1 = (int *)(local_388 + (long)local_3e8 * lVar45 + 4 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    local_390 = local_400;
    if (*(char *)(uVar20 + 1 + local_3d8 + (long)local_398 * lVar45) == '\0') {
      uVar28 = (ulong)(int)local_400;
      piVar1 = (int *)(lVar43 + local_388 + uVar28 * 4);
      *piVar1 = *piVar1 + 1;
      lVar48 = local_250 * lVar45;
      lVar43 = lVar45 * local_208 + (long)local_3e0;
      if (*(char *)(lVar42 + local_3d8 + uVar28) == '\0') {
        piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(lVar43 + 8 + uVar20 * 4);
        piVar1 = (int *)((long)local_3d0 + uVar28 * 4 + local_250 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)((long)local_3e0 + local_208 * uVar22 + -8 + uVar28 * 4);
      }
      else {
        piVar1 = (int *)((long)local_3d0 + uVar28 * 4 + lVar48);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar43 + uVar28 * 4);
        piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar17 = UFPC::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
        piVar1 = (int *)((long)local_2b8 + uVar28 * 4 + *local_280 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 + uVar28 * 4);
      }
      uVar16 = UFPC::MemMerge(uVar17,uVar16);
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar28 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      plVar30 = (long *)local_330._24_8_;
      uVar20 = uVar28;
      local_3a8 = (long *)local_330._80_8_;
      lVar42 = lVar43;
      local_3c0 = local_280;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * lVar45 + 8);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)(lVar45 * local_208 + (long)local_3e0 + 8 + uVar20 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22 + -8);
      *piVar1 = *piVar1 + 1;
      uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + -8 +
                                              uVar20 * 4));
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      plVar30 = (long *)local_330._24_8_;
      local_3a8 = (long *)local_330._80_8_;
      lVar42 = lVar43;
      local_3c0 = local_280;
    }
    goto LAB_0014947a;
  }
  lVar48 = (long)local_3e8 * (uVar22 - 1);
  lVar45 = (long)local_398 * (uVar22 - 1);
  goto LAB_001473f4;
LAB_0014a95d:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar36 + local_170 + -4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)((uVar20 - 1) + lVar48 + local_1e8._24_8_);
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
  local_390 = local_400;
  if (cVar3 == '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = UFPC::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 + uVar20 * 4));
LAB_00145110:
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
    local_3c0 = local_280;
  }
  else {
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
  }
  goto LAB_0014947a;
LAB_0014d8f5:
  uVar46 = lVar50 + 0x200000000 >> 0x20;
  local_400 = (ulong)(uint)(iVar49 + (int)lVar54);
LAB_0014d948:
  lVar42 = uVar22 - 2;
  piVar1 = (int *)(local_348 * lVar42 + local_3f8 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar46 + local_338 * lVar42 + local_3b0) == '\0') {
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + (long)(int)local_400 * 4 + lVar43 * lVar42 + -8);
    *piVar1 = *piVar1 + 1;
    lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar45 + -8 + (long)(int)local_400 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * lVar42);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar45 + uVar46 * 4);
    local_3f0 = local_400;
LAB_0014d9f8:
    uVar16 = UFPC::MemMerge(uVar16,uVar17);
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3e0 = (long *)local_330._24_8_;
    lVar43 = *(long *)local_330._80_8_;
    local_400 = local_3f0;
  }
  else {
    lVar45 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
LAB_0014d9a4:
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3e0 = (long *)local_330._24_8_;
  }
  goto LAB_0014cf62;
LAB_001506c8:
  local_368 = (long *)local_1e8._24_8_;
  piVar1 = (int *)((long)puVar29 + lVar45 + local_400 * lVar26);
  *piVar1 = *piVar1 + 1;
  local_388 = local_388 + local_3d8 * lVar26;
  uVar23 = *(undefined4 *)(lVar45 + local_388);
  piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_388 + lVar40 * 4 + 8 + lVar36 * 4) = uVar23;
  uVar51 = (ulong)(uint)(iVar24 + iVar52);
  local_3a0 = local_260;
LAB_00150838:
  do {
    this = local_268;
    iVar24 = (int)uVar51;
    uVar18 = iVar24 + 2;
    local_3f8 = local_3a0;
    if (local_370 <= (int)uVar18) {
LAB_0015216d:
      local_3a0 = local_3f8;
      if (local_370 < (int)uVar18) goto LAB_00152938;
      lVar48 = (long)(int)uVar18;
      piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar48 * 4);
      *piVar1 = *piVar1 + 1;
      local_3e8 = local_378;
      if (*(char *)(lVar48 + local_3f0 * lVar26 + (long)local_368) == '\0') goto LAB_0015256e;
      lVar45 = (long)iVar24;
      piVar1 = (int *)(*local_138 * lVar42 + local_170 + 0xc + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      lVar40 = local_3f0 * lVar42 + (long)local_368;
      if (*(char *)(lVar45 + 3 + lVar40) == '\0') {
        lVar42 = *local_3e0;
        piVar1 = (int *)((long)local_378 + lVar45 * 4 + lVar42 * lVar26);
        *piVar1 = *piVar1 + 1;
        local_3f8 = local_3f8 + lVar26 * *(long *)local_3d0;
        uVar23 = *(undefined4 *)(local_3f8 + lVar45 * 4);
        piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar26);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_3f8 + lVar48 * 4) = uVar23;
        goto LAB_0015316e;
      }
      piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar48 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = local_3f0 * lVar43;
      if ((*(char *)(lVar48 + (long)local_368 + lVar36) != '\0') &&
         (piVar1 = (int *)(lVar42 * *local_138 + local_170 + lVar45 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar40 + lVar45) != '\0')) goto LAB_001522ff;
      lVar42 = *local_3e0;
      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar40 = *(long *)local_3d0;
      uVar18 = *(uint *)(lVar43 * lVar40 + local_3f8 + lVar48 * 4);
      piVar1 = (int *)((long)local_378 + lVar45 * 4 + lVar42 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)(lVar40 * lVar26 + local_3f8 + lVar45 * 4);
      goto LAB_0015312f;
    }
    lVar41 = (long)local_3c0 * lVar26;
    lVar31 = local_3f0 * lVar26;
    local_350 = (ulong *)local_1e8._24_8_;
    local_398 = local_2b8;
    local_3e0 = local_280;
    local_3f8 = local_330._24_8_;
    local_3d0 = (pointer)local_330._80_8_;
    lVar33 = (long)iVar24;
    lVar45 = lVar33 + 2;
    local_3c0 = (long *)*local_138;
    lVar36 = lVar33 << 0x20;
    lVar48 = local_170 + (long)local_3c0 * lVar42 + lVar33 * 4;
    lVar40 = local_1e8._24_8_ + lVar33;
    lVar32 = lVar33 * 4 + local_330._24_8_;
    lVar35 = 0;
    while( true ) {
      piVar1 = (int *)(lVar41 + lVar33 * 4 + (long)local_3a8 + 8 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      local_378 = local_2b8;
      if (*(char *)((long)local_368 + lVar31 + lVar33 + 2 + lVar35) == '\0') {
        uVar51 = (ulong)(uint)((int)lVar45 + (int)lVar35);
        local_3f0 = *(ulong *)local_1e8._80_8_;
        local_3a0 = local_330._24_8_;
        local_368 = (long *)local_1e8._24_8_;
        local_3b0 = local_170;
        plVar30 = (long *)local_170;
        local_3a8 = (long *)local_170;
        puVar29 = local_2b8;
        local_380 = local_1e8._24_8_;
        local_388 = local_3a0;
        local_360 = local_378;
        local_260 = local_3a0;
        goto LAB_0014ff96;
      }
      piVar1 = (int *)(lVar48 + 0xc + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      lVar37 = lVar40 + local_3f0 * lVar42;
      lVar54 = lVar36 >> 0x1e;
      lVar44 = lVar36 >> 0x20;
      if (*(char *)(lVar35 + 3 + lVar37) != '\0') break;
      piVar1 = (int *)(local_170 + 0xc + (long)local_3c0 * lVar26 + lVar33 * 4 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar35 + 3 + local_3f0 * lVar26 + lVar40) == '\0') {
        lVar48 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar54 + lVar48 * lVar26);
        *piVar1 = *piVar1 + 1;
        lVar40 = local_330._24_8_ + *(long *)local_330._80_8_ * lVar26;
        uVar23 = *(undefined4 *)(lVar54 + lVar40);
        piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar48 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar40 + lVar33 * 4 + 8 + lVar35 * 4) = uVar23;
        uVar16 = (int)lVar45 + (int)lVar35;
        goto LAB_00151da3;
      }
      piVar1 = (int *)(lVar48 + 0x10 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar35 + 4 + lVar37) != '\0') {
        uVar51 = lVar45 + lVar35;
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 0xc + lVar35 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = local_3f0 * lVar43;
        uVar22 = lVar33 + 2 + lVar35;
        if (*(char *)(lVar35 + 3 + lVar40 + lVar41) == '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar54 + local_330._24_8_ + lVar48 * lVar26));
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          local_388 = local_330._24_8_;
          local_378 = local_2b8;
          puVar29 = local_2b8;
          this = local_268;
          lVar45 = local_330._24_8_;
          local_3f8 = local_330._24_8_;
          local_3e8 = local_2b8;
          local_3e0 = local_280;
          local_3d0 = (pointer)local_330._80_8_;
          local_3a0 = local_330._24_8_;
          local_398 = local_2b8;
          goto LAB_0015025c;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 8 + lVar35 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar35 + 2 + lVar40 + lVar41) == '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar54 + local_330._24_8_ + lVar48 * lVar26);
        }
        else {
          piVar1 = (int *)(lVar54 + *local_138 * lVar42 + local_170);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_3f0 * lVar42 + local_1e8._24_8_ + lVar44) != '\0') {
            local_3a0 = local_330._24_8_;
            local_380 = local_330._24_8_;
            local_3e8 = local_2b8;
            local_368 = (long *)local_1e8._24_8_;
            lVar45 = local_330._24_8_;
            local_360 = local_2b8;
            goto LAB_00150d50;
          }
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar44 * 4 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_330._24_8_ + lVar48 * lVar26 + lVar44 * 4);
        }
        uVar18 = UFPC::MemMerge(uVar18,uVar16);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_388 = local_330._24_8_;
        local_378 = local_2b8;
        puVar29 = local_2b8;
        this = local_268;
        lVar45 = local_330._24_8_;
        local_3f8 = local_330._24_8_;
        local_3e8 = local_2b8;
        local_3e0 = local_280;
        local_3d0 = (pointer)local_330._80_8_;
        local_3a0 = local_330._24_8_;
        local_398 = local_2b8;
        goto LAB_0015025c;
      }
      lVar37 = *local_280 * lVar26 + lVar33 * 4;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar37);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)local_330._80_8_ * lVar26 + lVar32;
      uVar23 = *(undefined4 *)(lVar44 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar37 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 + 8 + lVar35 * 4) = uVar23;
      lVar36 = lVar36 + 0x200000000;
      lVar37 = lVar33 + lVar35;
      lVar35 = lVar35 + 2;
      if ((long)local_200 <= lVar37 + 4) {
        uVar18 = iVar24 + (int)lVar35 + 2;
        iVar24 = iVar24 + (int)lVar35;
        local_368 = (long *)local_1e8._24_8_;
        goto LAB_0015216d;
      }
    }
    piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 8 + lVar35 * 4);
    *piVar1 = *piVar1 + 1;
    uVar51 = lVar45 + lVar35;
    lVar45 = *(long *)local_1e8._80_8_;
    local_410 = lVar33 + 2 + lVar35;
    if (*(char *)(lVar33 + lVar35 + 2 + lVar45 * lVar43 + local_1e8._24_8_) == '\0') {
      lVar45 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar45 * lVar43 + 8);
      *piVar1 = *piVar1 + 1;
      lVar48 = *(long *)local_330._80_8_;
      uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar33 * 4 + 8 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar54 + lVar48 * lVar26 + local_330._24_8_));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_3e8 = local_2b8;
      local_380 = local_330._24_8_;
      this = local_268;
      local_3a0 = local_330._24_8_;
    }
    else {
      piVar1 = (int *)(lVar54 + *local_138 * lVar42 + local_170);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + local_1e8._24_8_ + lVar45 * lVar42) != '\0') goto LAB_00150b50;
      lVar45 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar45 * lVar43 + 8);
      *piVar1 = *piVar1 + 1;
      lVar48 = *(long *)local_330._80_8_;
      uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar33 * 4 + 8 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar44 * 4 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar48 * lVar26 + local_330._24_8_ + lVar44 * 4));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_3e8 = local_2b8;
      local_380 = local_330._24_8_;
      local_3a0 = local_330._24_8_;
    }
LAB_00151234:
    *(uint *)(local_3d8 * lVar26 + local_3a0 + local_410 * 4) = uVar18;
    iVar24 = (int)uVar51;
    uVar18 = iVar24 + 2;
    local_3a8 = (long *)local_170;
    if (local_370 <= (int)uVar18) {
LAB_00152078:
      local_3c0 = (long *)*local_138;
      local_410 = (ulong)(int)uVar18;
      piVar1 = (int *)((long)local_3c0 * lVar26 + local_170 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      local_368 = (long *)local_1e8._24_8_;
      lVar45 = local_3f0 * lVar26 + local_1e8._24_8_;
      local_3a0 = local_380;
      if (local_370 < (int)uVar18) {
        if (*(char *)(local_410 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_380 + local_3d8 * lVar26 + local_410 * 4) = 0;
          goto LAB_0015316e;
        }
        lVar48 = (long)iVar24;
        piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar45 + 1 + lVar48) != '\0') {
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          lVar42 = local_380 + local_3d8 * lVar26;
          uVar23 = *(undefined4 *)(lVar42 + lVar48 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar42 + local_410 * 4) = uVar23;
          goto LAB_0015316e;
        }
        lVar45 = *(long *)local_1e8._80_8_ * lVar42;
LAB_00152b3f:
        piVar1 = (int *)(lVar42 * *local_138 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + lVar45 + local_1e8._24_8_) != '\0') {
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + local_410 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_3d8 * lVar26 + local_380 + local_410 * 4) = uVar23;
          goto LAB_0015316e;
        }
        piVar1 = (int *)((long)local_3e8 + (long)iVar24 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + (long)iVar24 * 4);
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      else {
        if (*(char *)(local_410 + lVar45) == '\0') goto LAB_0015265f;
        lVar48 = (long)iVar24;
        piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar45 + 1 + lVar48) != '\0') {
LAB_001523bb:
          lVar48 = (long)(int)uVar18;
          piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          lVar45 = *(long *)local_1e8._80_8_ * lVar42 + local_1e8._24_8_;
          if (*(char *)(lVar48 + 1 + lVar45) == '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + -8);
            *piVar1 = *piVar1 + 1;
            lVar42 = local_380 + local_3d8 * lVar26;
            uVar18 = *(uint *)(lVar42 + -8 + lVar48 * 4);
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            goto LAB_00153165;
          }
          piVar1 = (int *)(lVar42 * *local_138 + local_170 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar45 + lVar48) != '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + lVar48 * 4);
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_3d8 * lVar26 + local_380 + lVar48 * 4) = uVar23;
            goto LAB_0015316e;
          }
          piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(lVar48 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_);
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar18 = *(uint *)(lVar43 * local_3d8 + local_380 + lVar48 * 4);
          if (cVar3 != '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_380 + local_3d8 * lVar26 + lVar48 * 4) = uVar18;
            goto LAB_0015316e;
          }
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_380 + local_3d8 * lVar26 + -8 + lVar48 * 4);
          goto LAB_0015312f;
        }
        piVar1 = (int *)(*local_138 * lVar42 + local_170 + 0xc + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = *(long *)local_1e8._80_8_ * lVar42;
        if (*(char *)(lVar48 + 3 + local_1e8._24_8_ + lVar45) == '\0') goto LAB_00152b3f;
        piVar1 = (int *)(lVar42 * *local_138 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1e8._24_8_ + lVar45 + local_410) == '\0') {
LAB_00152abb:
          piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_410 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_) == '\0')
          {
            piVar1 = (int *)((long)local_3e8 + (long)(int)uVar18 * 4 + local_400 * lVar43 + -8);
            *piVar1 = *piVar1 + 1;
            lVar42 = local_3a0 + local_3d8 * lVar43;
            uVar18 = *(uint *)(lVar42 + -8 + (long)(int)uVar18 * 4);
            piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar42 + local_410 * 4));
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + *local_280 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + local_410 * 4) =
                 uVar18;
            goto LAB_0015316e;
          }
        }
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_3a0 + local_410 * 4);
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      *(undefined4 *)(local_3d8 * lVar26 + local_3a0 + local_410 * 4) = uVar23;
      goto LAB_0015316e;
    }
    local_3c0 = (long *)*local_138;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    local_3e0 = local_280;
    local_3d0 = (pointer)local_330._80_8_;
    lVar37 = (long)iVar24;
    lVar44 = lVar37 << 0x20;
    lVar48 = (long)local_3c0 * lVar26 + lVar37 * 4 + local_170;
    lVar54 = local_3f0 * lVar26 + lVar37;
    lVar40 = (long)local_3c0 * lVar42 + lVar37 * 4 + local_170;
    lVar35 = local_3f0 * lVar42 + lVar37;
    lVar45 = lVar37 + 2;
    lVar36 = local_1e8._24_8_ + lVar54;
    local_350 = (ulong *)local_1e8._24_8_;
    lVar41 = local_1e8._24_8_ + 2 + lVar35;
    lVar32 = local_330._24_8_ + 8 + lVar37 * 4;
    local_3e8 = local_2b8;
    lVar31 = lVar37 * 4 + 8;
    lVar33 = 0;
LAB_00151342:
    piVar1 = (int *)(lVar48 + 8 + lVar33 * 4);
    *piVar1 = *piVar1 + 1;
    iVar52 = (int)lVar45;
    iVar25 = (int)lVar33;
    local_3b0 = local_170;
    if (*(char *)(lVar36 + 2 + lVar33) == '\0') {
      uVar51 = (ulong)(uint)(iVar52 + iVar25);
      plVar30 = (long *)local_170;
      local_368 = (long *)local_1e8._24_8_;
      local_380 = local_1e8._24_8_;
      goto LAB_0014ee63;
    }
    piVar1 = (int *)(lVar48 + 4 + lVar33 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar36 + 1 + lVar33) == '\0') {
      piVar1 = (int *)(lVar40 + 0xc + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      this = local_268;
      local_3a0 = local_330._24_8_;
      if (*(char *)(lVar41 + 1 + lVar33) != '\0') {
        piVar1 = (int *)(lVar40 + 8 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + lVar33) != '\0') goto code_r0x00151380;
        uVar51 = (ulong)(uint)(iVar52 + iVar25);
        local_410 = lVar44 + 0x200000000 >> 0x20;
LAB_001517c8:
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + local_3f0 * lVar43 + (long)local_350) == '\0') {
          lVar45 = *local_3e0;
          piVar1 = (int *)((long)local_3e8 + (long)(int)uVar51 * 4 + lVar45 * lVar43 + -8);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3a0 + *(long *)local_3d0 * lVar43;
          uVar18 = *(uint *)(lVar48 + -8 + (long)(int)uVar51 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + lVar45 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar48 + local_410 * 4);
LAB_00151a97:
          uVar18 = UFPC::MemMerge(uVar18,uVar16);
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          local_3e8 = local_2b8;
          local_380 = local_330._24_8_;
          local_3a0 = local_330._24_8_;
        }
        else {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
LAB_00151824:
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + local_410 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_380 = local_3a0;
        }
        goto LAB_00151234;
      }
      local_410 = lVar45 + lVar33;
      piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar37 * 4 + 0xc + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      lVar45 = *local_138 * lVar42 + local_170;
      lVar48 = lVar44 >> 0x1e;
      if (*(char *)(lVar33 + 3 + lVar54 + local_1e8._24_8_) == '\0') {
        piVar1 = (int *)(lVar45 + lVar37 * 4 + 8 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = *local_280;
        if (*(char *)(lVar33 + 2 + lVar35 + local_1e8._24_8_) == '\0') {
          piVar1 = (int *)((long)local_2b8 + lVar48 + lVar45 * lVar43);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)local_330._80_8_;
          uVar23 = *(undefined4 *)(lVar48 + lVar40 * lVar43 + local_330._24_8_);
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar26 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar40 * lVar26 + 8 + lVar33 * 4) = uVar23
          ;
        }
        else {
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar43 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)local_330._80_8_;
          lVar48 = local_330._24_8_ + lVar37 * 4;
          uVar23 = *(undefined4 *)(lVar40 * lVar43 + lVar48 + 8 + lVar33 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar26 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar40 * lVar26 + lVar48 + 8 + lVar33 * 4) = uVar23;
        }
LAB_00151d9e:
        uVar16 = (uint)local_410;
        goto LAB_00151da3;
      }
      piVar1 = (int *)(lVar45 + (lVar44 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)(local_1e8._24_8_ + local_3f0 * lVar42 + (lVar44 + 0x400000000 >> 0x20));
      local_3c0 = (long *)*local_138;
      piVar1 = (int *)((long)local_3c0 * lVar42 + local_170 + lVar37 * 4 + 8 + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      cVar4 = *(char *)(lVar33 + 2 + lVar35 + local_1e8._24_8_);
      local_3f8 = local_330._24_8_;
      if (cVar3 != '\0') {
        local_368 = (long *)local_1e8._24_8_;
        if (cVar4 != '\0') {
          uVar51 = local_410 & 0xffffffff;
          goto LAB_0014f036;
        }
        local_398 = local_2b8;
LAB_00151c73:
        uVar51 = local_410 & 0xffffffff;
        uVar22 = (ulong)(int)local_410;
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_3f0 * lVar43 + (long)local_368;
        if (*(char *)(uVar22 + 1 + lVar45) == '\0') {
          lVar45 = *local_3e0;
          uVar22 = (ulong)(int)local_410;
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar45 * lVar43 + -8);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3a0 + *(long *)local_3d0 * lVar43;
          uVar18 = *(uint *)(lVar48 + -8 + uVar22 * 4);
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar45 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          goto LAB_0014f444;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        local_400 = *local_3e0;
        lVar48 = local_400 * lVar43;
        if (*(char *)(lVar45 + uVar22) != '\0') {
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + uVar22 * 4);
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_388 = local_3a0;
          local_378 = local_3e8;
          puVar29 = local_3e8;
          lVar45 = local_3a0;
          goto LAB_0015025c;
        }
        piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + -8);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_3a0 + *(long *)local_3d0 * lVar43;
        uVar18 = *(uint *)(lVar45 + -8 + uVar22 * 4);
        piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 + 8 + uVar22 * 4);
        goto LAB_0014f448;
      }
      local_400 = *local_280;
      local_398 = local_2b8;
      if (cVar4 != '\0') {
        piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar43 + lVar37 * 4 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_360 = local_2b8;
        local_260 = local_330._24_8_;
        local_378 = local_2b8;
        local_368 = (long *)local_1e8._24_8_;
        uVar18 = (uint)local_410;
        lVar45 = local_330._24_8_;
        puVar29 = local_2b8;
        local_388 = local_330._24_8_;
        goto LAB_0014f16a;
      }
      piVar1 = (int *)((long)local_2b8 + lVar48 + local_400 * lVar43);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar48 + local_3d8 * lVar43 + local_330._24_8_);
      piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar26 + lVar37 * 4 + 8);
      *piVar1 = *piVar1 + 1;
      local_368 = (long *)local_1e8._24_8_;
      local_380 = local_1e8._24_8_;
      local_220 = local_170;
LAB_00151f36:
      uVar18 = (uint)local_410;
LAB_0014fcd5:
      lVar45 = local_3d8 * lVar26 + local_3a0;
      *(uint *)(lVar45 + local_410 * 4) = uVar16;
      lVar40 = (long)(int)uVar18;
      uVar51 = lVar40 + 2;
      uVar18 = (uint)uVar51;
      local_378 = local_3e8;
      if (local_370 <= (int)uVar18) {
        if (local_370 < (int)uVar18) goto LAB_00152938;
        piVar1 = (int *)((long)local_3c0 * lVar26 + local_220 + 8 + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_3f8 = local_3a0;
        if (*(char *)(lVar40 + 2 + local_3f0 * lVar26 + local_380) == '\0') goto LAB_0015256e;
        piVar1 = (int *)(local_220 + (long)local_3c0 * lVar42 + 0xc + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar40 + 3 + local_380 + local_3f0 * lVar42) == '\0') {
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        }
        else {
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar40 * 4);
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar45 + lVar40 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + 8 + lVar40 * 4) = uVar18
          ;
        }
        goto LAB_0015316e;
      }
      lVar48 = (long)local_3c0 * lVar26 + local_220;
      piVar1 = (int *)(lVar48 + 8 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = local_3f0 * lVar26 + local_380;
      if (*(char *)(lVar40 + 2 + lVar36) == '\0') {
        local_360 = local_3e8;
        plVar30 = (long *)local_220;
        puVar29 = local_3e8;
        local_388 = local_3a0;
        local_260 = local_3a0;
LAB_0014ff96:
        uVar18 = (uint)uVar51;
        local_410 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 4 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        local_3e8 = local_398;
        if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_380) == '\0') {
          local_400 = *local_3e0;
          local_410 = (ulong)(int)uVar18;
          piVar1 = (int *)((long)local_398 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3a0 = local_3f8;
          goto LAB_0014f73a;
        }
        piVar1 = (int *)((long)plVar30 + (long)local_3c0 * lVar42 + 4 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + 1 + local_380 + local_3f0 * lVar42) != '\0') {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)puVar29 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          local_380 = local_388;
          local_3e8 = puVar29;
LAB_0015002e:
          while( true ) {
            uVar23 = *(undefined4 *)(local_3d8 * lVar43 + local_388 + local_410 * 4);
            piVar1 = (int *)((long)puVar29 + local_410 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_3d8 * lVar26 + local_388 + local_410 * 4) = uVar23;
            lVar45 = (long)(int)uVar51;
            uVar18 = (int)uVar51 + 2;
            uVar51 = (ulong)uVar18;
            if (local_370 <= (int)uVar18) break;
            piVar1 = (int *)((long)local_3c0 * lVar26 + local_3b0 + 8 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            plVar30 = (long *)local_3b0;
            local_380 = (long)local_368;
            if (*(char *)(lVar45 + 2 + local_3f0 * lVar26 + (long)local_368) != '\0')
            goto LAB_0015144f;
LAB_0014ee63:
            while( true ) {
              uVar18 = (uint)uVar51;
              local_410 = (ulong)(int)uVar18;
              piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 4 + local_410 * 4);
              *piVar1 = *piVar1 + 1;
              this = local_268;
              if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_380) != '\0') break;
              local_3e0 = local_280;
              local_400 = *local_280;
              local_410 = (ulong)(int)uVar18;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3f8 = local_330._24_8_;
              local_398 = local_2b8;
              local_3e8 = local_2b8;
              local_3d0 = (pointer)local_330._80_8_;
              local_3a0 = local_330._24_8_;
LAB_0014f73a:
              local_3d8 = *(long *)local_3d0;
              lVar45 = local_3d8 * lVar26 + local_3a0;
              *(undefined4 *)(lVar45 + local_410 * 4) = 0;
              lVar48 = (long)(int)uVar18;
              local_410 = lVar48 + 2;
              uVar18 = (uint)local_410;
              if (local_370 <= (int)uVar18) {
                piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 8 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar48 + 2 + local_3f0 * lVar26 + local_380);
                if (local_370 < (int)uVar18) {
                  if (cVar3 == '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = 0;
                    goto LAB_0015316e;
                  }
LAB_00152ea3:
                  lVar40 = (long)plVar30 + (long)local_3c0 * lVar42;
                  piVar1 = (int *)(lVar40 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = local_380 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 2 + lVar42) != '\0') goto LAB_00152eba;
                  piVar1 = (int *)(lVar40 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::length_;
                  if (*(char *)(lVar42 + 1 + lVar48) == '\0') {
                    lVar42 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar45 + 8 + lVar48 * 4) = uVar18;
                    goto LAB_0015316e;
                  }
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + lVar48 * 4);
                }
                else {
                  if (cVar3 == '\0') goto LAB_0015265f;
                  lVar40 = (long)plVar30 + (long)local_3c0 * lVar42;
                  piVar1 = (int *)(lVar40 + 0xc + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = local_380 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 3 + lVar36) == '\0') goto LAB_00152ea3;
                  piVar1 = (int *)(lVar40 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar36 + 2 + lVar48) == '\0') {
                    piVar1 = (int *)(lVar40 + 4 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar36 + 1 + lVar48) != '\0') goto LAB_00152abb;
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + lVar26 * local_400 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = uVar23;
                    goto LAB_0015316e;
                  }
LAB_00152eba:
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar48 * 4);
                }
                piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + lVar26 * local_400 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = uVar23;
                goto LAB_0015316e;
              }
              lVar45 = (long)local_3c0 * lVar26 + (long)plVar30;
              piVar1 = (int *)(lVar45 + 8 + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              lVar40 = local_3f0 * lVar26 + local_380;
              if (*(char *)(lVar48 + 2 + lVar40) != '\0') {
                lVar36 = (long)local_3c0 * lVar42 + (long)plVar30;
                piVar1 = (int *)(lVar36 + 0xc + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = local_3f0 * lVar42 + local_380;
                if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
                  piVar1 = (int *)(lVar36 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 2 + lVar48) != '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_0014fdf5;
                  }
                  piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 1 + lVar48) == '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar51 = local_410 & 0xffffffff;
                    local_380 = local_3a0;
                    goto LAB_00151234;
                  }
                  local_350 = (ulong *)local_368;
                  uVar51 = local_410 & 0xffffffff;
                  goto LAB_001517c8;
                }
                piVar1 = (int *)(lVar45 + 0xc + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                local_220 = (long)plVar30;
                if (*(char *)(lVar40 + 3 + lVar48) == '\0') {
                  piVar1 = (int *)(*local_138 * lVar42 + local_170 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = (long)local_368 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 2 + lVar45) != '\0') {
                    lVar45 = *local_3e0;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar40 * lVar43 + local_3f8 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar40 * lVar26 + local_3f8 + 8 + lVar48 * 4) = uVar23;
                    goto LAB_0014f9cc;
                  }
                  piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = UFPC::length_;
                  if (*(char *)(lVar45 + 1 + lVar48) == '\0') {
                    lVar45 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar45] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar45] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar45] = uVar18;
                    uVar18 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + *local_3e0 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_3f8 + *(long *)local_3d0 * lVar26 + 8 + lVar48 * 4) = uVar18;
                  }
                  else {
                    lVar45 = *local_3e0;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar43);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar40 * lVar43 + local_3f8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar40 * lVar26 + local_3f8 + 8 + lVar48 * 4) = uVar23;
                  }
                  goto LAB_00151d9e;
                }
                piVar1 = (int *)(lVar36 + 0x10 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar41 + 4 + lVar48);
                piVar1 = (int *)(lVar36 + 8 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar41 + 2 + lVar48);
                local_378 = local_3e8;
                local_388 = local_3a0;
                if (cVar3 != '\0') {
                  if (cVar4 != '\0') {
                    uVar51 = local_410 & 0xffffffff;
                    local_368 = local_368;
                    goto LAB_0014f036;
                  }
                  piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 1 + lVar48) != '\0') goto LAB_00151c73;
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 0x10 + lVar48 * 4);
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar22 = local_410;
                  puVar29 = local_3e8;
                  lVar45 = local_3a0;
                  uVar51 = local_410 & 0xffffffff;
                  goto LAB_0015025c;
                }
                if (cVar4 != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = local_3a0;
                  puVar29 = local_3e8;
                  local_360 = local_378;
                  local_260 = local_3a0;
                  goto LAB_0014f16a;
                }
                piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = UFPC::length_;
                if (*(char *)(lVar41 + 1 + lVar48) != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(local_3d8 * lVar43 + local_3a0 + lVar48 * 4);
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_00151f36;
                }
                lVar45 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar45] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar45] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar16;
                uVar16 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                *piVar1 = *piVar1 + 1;
                goto LAB_0014fcd5;
              }
              uVar51 = local_410 & 0xffffffff;
            }
            lVar40 = (long)local_3c0 * lVar42;
            piVar1 = (int *)((long)plVar30 + lVar40 + 4 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            lVar36 = local_3f0 * lVar42;
            if (*(char *)(local_410 + 1 + local_380 + lVar36) == '\0') goto LAB_0014efca;
            local_3e0 = local_280;
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d0 = (pointer)local_330._80_8_;
            local_3d8 = *(long *)local_330._80_8_;
            local_260 = local_330._24_8_;
            local_378 = local_2b8;
            local_380 = local_330._24_8_;
            local_3e8 = local_2b8;
            local_388 = local_330._24_8_;
            puVar29 = local_2b8;
          }
          local_3a0 = local_260;
          if (local_370 < (int)uVar18) goto LAB_00152938;
          piVar1 = (int *)(local_3b0 + (long)local_3c0 * lVar26 + 8 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar45 + 2 + (long)local_368 + local_3f0 * lVar26) == '\0')
          goto LAB_0015265f;
          goto LAB_001523bb;
        }
        uVar22 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_3c0 * lVar42 + local_3b0 + 8 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = UFPC::length_;
        if (*(char *)(uVar22 + 2 + local_3f0 * lVar42 + (long)local_368) != '\0') {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)puVar29 + uVar22 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + 8 + uVar22 * 4);
          piVar1 = (int *)((long)puVar29 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3e8 = local_360;
          local_388 = local_388;
          lVar45 = local_260;
          goto LAB_0015025c;
        }
        lVar45 = (long)(int)UFPC::length_;
        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar45] =
             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar45] + 1;
        UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar45] = uVar16;
        uVar16 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        local_400 = *local_3e0;
        local_410 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_398 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_3d0;
        local_380 = (long)local_368;
        local_220 = local_3b0;
        local_3a0 = local_3f8;
        goto LAB_0014fcd5;
      }
      lVar41 = local_220 + (long)local_3c0 * lVar42;
      piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar32 = local_380 + local_3f0 * lVar42;
      local_410 = uVar51;
      if (*(char *)(lVar40 + 3 + lVar32) != '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 + lVar40 * 4);
LAB_0014fdb7:
        uVar18 = UFPC::MemMerge(uVar18,uVar16);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_3e8 = local_2b8;
        local_3a0 = local_330._24_8_;
LAB_0014fdf5:
        uVar51 = local_410 & 0xffffffff;
        local_380 = local_3a0;
        goto LAB_00151234;
      }
      piVar1 = (int *)(lVar48 + 0xc + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar36 + 3 + lVar40) == '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        uVar16 = uVar18;
        goto LAB_00151da3;
      }
      piVar1 = (int *)(lVar41 + 0x10 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar32 + 4 + lVar40) == '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        goto LAB_00150838;
      }
      piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 0x10);
      *piVar1 = *piVar1 + 1;
      uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 0x10 + lVar40 * 4);
      piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = UFPC::MemMerge(uVar18,*(uint *)(lVar45 + lVar40 * 4));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
LAB_0014ff25:
      local_388 = local_330._24_8_;
      uVar22 = local_410;
      local_378 = local_2b8;
      puVar29 = local_2b8;
      lVar45 = local_330._24_8_;
      uVar51 = local_410 & 0xffffffff;
      local_3f8 = local_330._24_8_;
      local_3e8 = local_2b8;
      local_3e0 = local_280;
      local_3d0 = (pointer)local_330._80_8_;
      local_3a0 = local_330._24_8_;
      local_398 = local_2b8;
      goto LAB_0015025c;
    }
    uVar51 = (ulong)(uint)(iVar52 + iVar25);
LAB_0015144f:
    this = local_268;
    uVar16 = (uint)uVar51;
    local_410 = (ulong)(int)uVar16;
    piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + local_410 * 4);
    *piVar1 = *piVar1 + 1;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    lVar45 = local_3f0 * lVar42 + local_1e8._24_8_;
    local_3a0 = local_330._24_8_;
    local_3e8 = local_2b8;
    if (*(char *)(local_410 + 1 + lVar45) != '\0') {
      piVar1 = (int *)(local_170 + *local_138 * lVar42 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      local_380 = local_330._24_8_;
      if (*(char *)(lVar45 + local_410) == '\0') {
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(local_410 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
        if (cVar3 == '\0') {
          piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_330._24_8_ + local_3d8 * lVar26 + -8 + local_410 * 4);
          goto LAB_00151a97;
        }
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      goto LAB_00151234;
    }
    piVar1 = (int *)(local_170 + *local_138 * lVar26 + 4 + local_410 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_1e8._24_8_) == '\0') {
      lVar45 = *local_280;
      lVar48 = (long)(int)uVar16;
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26 + -8);
      *piVar1 = *piVar1 + 1;
      lVar40 = *(long *)local_330._80_8_ * lVar26 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar40 + -8 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar40 + lVar48 * 4) = uVar23;
      local_350 = (ulong *)local_1e8._24_8_;
      goto LAB_00151da3;
    }
    uVar22 = (ulong)(int)uVar16;
    local_3a8 = (long *)local_170;
    local_3c0 = (long *)*local_138;
    piVar1 = (int *)((long)local_3c0 * lVar42 + local_170 + 8 + uVar22 * 4);
    *piVar1 = *piVar1 + 1;
    local_368 = (long *)local_1e8._24_8_;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    local_3d0 = (pointer)local_330._80_8_;
    local_378 = local_2b8;
    local_3e0 = local_280;
    if (*(char *)(uVar22 + 2 + local_3f0 * lVar42 + local_1e8._24_8_) != '\0') {
      piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_410 + 1 + local_1e8._24_8_ + local_3f0 * lVar43) == '\0') {
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar26 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar48 * lVar26 + local_330._24_8_ + -8 + uVar22 * 4);
      }
      else {
        piVar1 = (int *)(*local_138 * lVar42 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_1e8._80_8_;
        local_3f8 = local_330._24_8_;
        puVar29 = local_2b8;
        local_388 = local_330._24_8_;
        lVar45 = local_330._24_8_;
        local_398 = local_2b8;
        if (*(char *)(uVar22 + lVar48 * lVar42 + local_1e8._24_8_) != '\0') {
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          goto LAB_0015025c;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar22 + local_1e8._24_8_ + lVar48 * lVar43);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
        if (cVar3 != '\0') {
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          goto LAB_0015025c;
        }
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(local_330._24_8_ + local_3d8 * lVar26 + -8 + uVar22 * 4);
      }
      uVar18 = UFPC::MemMerge(uVar18,uVar16);
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_388 = local_330._24_8_;
      local_378 = local_2b8;
      puVar29 = local_2b8;
      lVar45 = local_330._24_8_;
      local_3f8 = local_330._24_8_;
      local_3e8 = local_2b8;
      local_3e0 = local_280;
      local_3d0 = (pointer)local_330._80_8_;
      local_3a0 = local_330._24_8_;
      local_398 = local_2b8;
      goto LAB_0015025c;
    }
    lVar45 = *local_280;
    lVar48 = (long)(int)uVar16;
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26 + -8);
    *piVar1 = *piVar1 + 1;
    lVar40 = *(long *)local_330._80_8_ * lVar26 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar40 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar40 + lVar48 * 4) = uVar23;
  } while( true );
LAB_0014f401:
  lVar45 = *local_280;
  uVar22 = (ulong)(int)uVar51;
  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43);
  *piVar1 = *piVar1 + 1;
  lVar48 = *(long *)local_330._80_8_ * lVar43 + local_330._24_8_;
  uVar18 = *(uint *)(lVar48 + uVar22 * 4);
  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43 + 8);
  *piVar1 = *piVar1 + 1;
LAB_0014f444:
  uVar16 = *(uint *)(lVar48 + 8 + uVar22 * 4);
  goto LAB_0014f448;
code_r0x00151380:
  local_400 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar43 + lVar31);
  *piVar1 = *piVar1 + 1;
  local_3d8 = *(long *)local_330._80_8_;
  uVar23 = *(undefined4 *)(local_3d8 * lVar43 + lVar32 + lVar33 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar26 + lVar31);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_3d8 * lVar26 + lVar32 + lVar33 * 4) = uVar23;
  lVar44 = lVar44 + 0x200000000;
  lVar38 = lVar45 + lVar33;
  lVar33 = lVar33 + 2;
  if ((long)local_200 <= lVar38 + 2) {
    uVar18 = iVar24 + (int)lVar33 + 2;
    iVar24 = iVar24 + (int)lVar33;
    local_380 = local_330._24_8_;
    goto LAB_00152078;
  }
  goto LAB_00151342;
LAB_00143996:
  uVar23 = 0;
LAB_001439ed:
  local_2b8[lVar26] = local_2b8[lVar26] + 1;
  *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
  iVar24 = iVar49;
LAB_001439fb:
  iVar49 = iVar24 + 2;
  if (local_370 <= iVar49) goto code_r0x00143a0a;
  goto LAB_0014386d;
code_r0x00143a0a:
  lVar42 = (long)(iVar24 + 3);
LAB_00143faa:
  lVar26 = (long)iVar49;
  piVar1 = (int *)(local_170 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  if (local_370 < iVar49) {
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_00144271:
      *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      goto LAB_0015316e;
    }
  }
  else {
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
LAB_001441be:
      lVar26 = (long)iVar49;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar18 = UFPC::length_;
      if (*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      }
      else {
        lVar42 = (long)(int)UFPC::length_;
        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar18;
        uVar18 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      }
      goto LAB_0015316e;
    }
    piVar1 = (int *)(local_170 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
  }
  uVar18 = UFPC::length_;
  lVar42 = (long)(int)UFPC::length_;
  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar42] =
       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar42] + 1;
  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar42] = uVar18;
  uVar18 = UFPC::length_;
  UFPC::length_ = UFPC::length_ + 1;
  local_2b8[lVar26] = local_2b8[lVar26] + 1;
  *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
LAB_0015316e:
  uVar18 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar18;
  if (0 < iVar5) {
    local_200 = local_2b8;
    local_3a8 = (long *)0x1;
    uVar51 = 0;
    do {
      piVar12 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar29 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar6) {
        uVar22 = uVar51 | 1;
        lVar42 = *local_280 * (long)local_3a8;
        lVar48 = *(long *)local_330._80_8_ * (long)local_3a8 + local_330._24_8_;
        lVar45 = *(long *)local_330._80_8_ * uVar51 + local_330._24_8_;
        lVar43 = *local_280 * uVar51;
        lVar26 = 1;
        do {
          iVar5 = *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4);
          *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4) = iVar5 + 1;
          lVar40 = (long)*(int *)(lVar45 + -4 + lVar26 * 4);
          if (lVar40 < 1) {
            *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4) = iVar5 + 2;
            *(undefined4 *)(lVar45 + -4 + lVar26 * 4) = 0;
            if (lVar26 < lVar53) {
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar45 + lVar26 * 4) = 0;
              if (uVar22 < uVar34) {
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar48 + lVar26 * 4) = 0;
              }
            }
            else if (uVar22 < uVar34) {
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
            }
          }
          else {
            piVar12[lVar40] = piVar12[lVar40] + 1;
            uVar18 = puVar29[lVar40];
            uVar28 = *local_138;
            lVar41 = uVar51 * uVar28 + local_170;
            piVar1 = (int *)(lVar41 + -4 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)local_1e8._80_8_;
            lVar36 = uVar51 * lVar40 + local_1e8._24_8_;
            uVar16 = uVar18;
            if (*(char *)(lVar26 + -1 + lVar36) == '\0') {
              uVar16 = 0;
            }
            piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar45 + -4 + lVar26 * 4) = uVar16;
            if (lVar26 < lVar53) {
              piVar1 = (int *)(lVar41 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = uVar18;
              if (*(char *)(lVar26 + lVar36) == '\0') {
                uVar16 = 0;
              }
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar45 + lVar26 * 4) = uVar16;
              if (uVar22 < uVar34) {
                lVar36 = uVar28 * (long)local_3a8 + local_170;
                piVar1 = (int *)(lVar36 + -4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                lVar40 = lVar40 * (long)local_3a8 + local_1e8._24_8_;
                uVar16 = uVar18;
                if (*(char *)(lVar26 + -1 + lVar40) == '\0') {
                  uVar16 = 0;
                }
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar48 + -4 + lVar26 * 4) = uVar16;
                piVar1 = (int *)(lVar36 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar26 + lVar40);
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42);
                *piVar1 = *piVar1 + 1;
                if (cVar3 == '\0') {
                  *(undefined4 *)(lVar48 + lVar26 * 4) = 0;
                }
                else {
                  *(uint *)(lVar48 + lVar26 * 4) = uVar18;
                }
              }
            }
            else if (uVar22 < uVar34) {
              piVar1 = (int *)(uVar28 * (long)local_3a8 + local_170 + -4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar26 + -1 + lVar40 * (long)local_3a8 + local_1e8._24_8_);
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
              *piVar1 = *piVar1 + 1;
              if (cVar3 == '\0') {
                *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
              }
              else {
                *(uint *)(lVar48 + -4 + lVar26 * 4) = uVar18;
              }
            }
          }
          lVar40 = lVar26 + 1;
          lVar26 = lVar26 + 2;
        } while (lVar40 < lVar53);
      }
      uVar51 = uVar51 + 2;
      local_3a8 = (long *)((long)local_3a8 + 2);
    } while (uVar51 < uVar34);
  }
  pauVar19 = (undefined1 (*) [16])operator_new(0x20);
  pvVar15 = local_118;
  pauVar19[1] = (undefined1  [16])0x0;
  *pauVar19 = (undefined1  [16])0x0;
  puVar9 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar19;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar19 + 2);
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar19 + 2);
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar10 - (long)puVar9);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_180;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar15->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_2c8;
  cv::sum((_InputArray *)&local_f0);
  pSVar14 = local_268;
  puVar9 = (pvVar15->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9[1] = (long)((double)local_f0._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_f0._0_8_ >> 0x3f | (long)(double)local_f0._0_8_;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar51 = 0;
  }
  else {
    lVar53 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar56 = 0.0;
    lVar26 = 0;
    do {
      dVar56 = dVar56 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar26];
      lVar26 = lVar26 + 1;
    } while (lVar53 + (ulong)(lVar53 == 0) != lVar26);
    uVar51 = (long)(dVar56 - 9.223372036854776e+18) & (long)dVar56 >> 0x3f | (long)dVar56;
  }
  puVar9[2] = uVar51;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_330);
  cv::Mat::operator=(&((pSVar14->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_2c8);
  cv::Mat::~Mat((Mat *)(local_330 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}